

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

vbool<16> __thiscall
embree::avx512::InstanceArrayIntersectorKMB<16>::occluded
          (InstanceArrayIntersectorKMB<16> *this,vbool<16> *valid_i,Precalculations *pre,
          RayK<16> *ray,RayQueryContext *context,Primitive_conflict4 *prim)

{
  long *plVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCRayQueryContext *pRVar11;
  long lVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  ulong uVar28;
  undefined8 uVar29;
  ulong uVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  ulong uVar65;
  ulong uVar66;
  ushort uVar67;
  uint uVar68;
  ulong uVar69;
  uint uVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  ulong uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar127 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 in_ZMM6 [64];
  float fVar197;
  undefined1 in_ZMM7 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar208 [16];
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar209 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar210 [16];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar224 [16];
  undefined1 in_ZMM31 [64];
  vint<16> itime_k;
  RayQueryContext newcontext;
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [64];
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  uint local_280;
  uint uStack_27c;
  uint uStack_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint uStack_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint uStack_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint uStack_248;
  uint uStack_244;
  uint local_240;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint uStack_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint uStack_208;
  uint uStack_204;
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  _func_int *local_90;
  RTCRayQueryContext *local_88;
  RTCIntersectArguments *local_80;
  undefined1 auVar88 [64];
  undefined1 auVar126 [64];
  undefined1 auVar128 [64];
  
  uVar70 = prim->primID_;
  uVar8 = prim->instID_;
  pGVar10 = (context->scene->geometries).items[uVar8].ptr;
  local_90 = *(_func_int **)&pGVar10->field_0x58;
  if (local_90 == (_func_int *)0x0) {
    uVar65 = (ulong)*(uint *)(*(long *)&pGVar10[1].time_range.upper +
                             (long)pGVar10[1].intersectionFilterN * (ulong)uVar70);
    if (uVar65 == 0xffffffff) {
      local_90 = (_func_int *)0x0;
    }
    else {
      local_90 = pGVar10[1].super_RefCount._vptr_RefCount[uVar65];
    }
  }
  if (local_90 != (_func_int *)0x0) {
    auVar81 = vpbroadcastd_avx512f(ZEXT416(pGVar10->mask));
    uVar29 = vptestmd_avx512f(auVar81,*(undefined1 (*) [64])(ray + 0x240));
    uVar67 = (ushort)uVar29 & valid_i->v;
    uVar65 = (ulong)uVar67;
    if (uVar67 != 0) {
      pRVar11 = context->user;
      *(undefined2 *)this = 0;
      if (pRVar11->instID[0] == 0xffffffff) {
        pRVar11->instID[0] = uVar8;
        pRVar11->instPrimID[0] = uVar70;
        uVar66 = (ulong)prim->primID_;
        uVar70 = (uint)uVar67;
        if ((pGVar10->field_8).field_0x1 == '\x01') {
          auVar81 = vbroadcastss_avx512f(ZEXT416((uint)(pGVar10->time_range).lower));
          auVar83 = vbroadcastss_avx512f(ZEXT416((uint)pGVar10->fnumTimeSegments));
          auVar82 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar81);
          auVar81 = vbroadcastss_avx512f
                              (ZEXT416((uint)((pGVar10->time_range).upper - auVar81._0_4_)));
          auVar81 = vdivps_avx512f(auVar82,auVar81);
          auVar81 = vmulps_avx512f(auVar83,auVar81);
          auVar82 = vrndscaleps_avx512f(auVar81,1);
          auVar83 = vbroadcastss_avx512f(ZEXT416((uint)(auVar83._0_4_ + -1.0)));
          auVar83 = vminps_avx512f(auVar82,auVar83);
          auVar83 = vmaxps_avx512f(auVar83,ZEXT1664(ZEXT816(0) << 0x40));
          auVar82 = vcvtps2dq_avx512f(auVar83);
          local_300 = vmovdqa64_avx512f(auVar82);
          auVar81 = vsubps_avx512f(auVar81,auVar83);
          uVar8 = 0;
          for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
            uVar8 = uVar8 + 1;
          }
          auVar83 = vpbroadcastd_avx512f();
          uVar29 = vpcmpd_avx512f(auVar82,auVar83,4);
          if (((ushort)uVar29 & uVar67) == 0) {
            lVar12 = *(long *)&pGVar10[1].fnumTimeSegments;
            lVar71 = (long)*(int *)(local_300 + (ulong)uVar8 * 4) * 0x38;
            plVar1 = (long *)(lVar12 + lVar71);
            iVar9 = *(int *)(lVar12 + 0x20 + lVar71);
            if (iVar9 == 0x9134) {
              lVar72 = *plVar1;
              lVar73 = plVar1[2] * uVar66;
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 0x10 + lVar73)),0x1c);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x20 + lVar73)),0x28);
              auVar83 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 4 + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 0x14 + lVar73)),0x1c);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x24 + lVar73)),0x28);
              auVar82 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 8 + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)),0x1c);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x28 + lVar73)),0x28);
              in_ZMM6 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 0x1c + lVar73)),0x1c);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x2c + lVar73)),0x28);
              in_ZMM10 = ZEXT1664(auVar75);
            }
            else if (iVar9 == 0x9234) {
              lVar72 = *plVar1;
              lVar73 = plVar1[2] * uVar66;
              auVar177._8_8_ = 0;
              auVar177._0_8_ = *(ulong *)(lVar72 + 4 + lVar73);
              auVar191._8_8_ = 0;
              auVar191._0_8_ = *(ulong *)(lVar72 + 0x10 + lVar73);
              auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + lVar73)),_DAT_02060e80,
                                           auVar177);
              auVar83 = ZEXT1664(auVar75);
              auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),_DAT_02060e80,
                                           auVar191);
              auVar82 = ZEXT1664(auVar75);
              auVar178._8_8_ = 0;
              auVar178._0_8_ = *(ulong *)(lVar72 + 0x1c + lVar73);
              auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)),_DAT_02060e80,
                                           auVar178);
              in_ZMM6 = ZEXT1664(auVar75);
              auVar179._8_8_ = 0;
              auVar179._0_8_ = *(ulong *)(lVar72 + 0x28 + lVar73);
              auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0x24 + lVar73)),_DAT_02060e80,
                                           auVar179);
              in_ZMM10 = ZEXT1664(auVar75);
            }
            else if (iVar9 == 0xb001) {
              lVar72 = *plVar1;
              lVar73 = plVar1[2] * uVar66;
              auVar174._8_8_ = 0;
              auVar174._0_8_ = *(ulong *)(lVar72 + 0x10 + lVar73);
              auVar75 = vinsertps_avx(auVar174,ZEXT416(*(uint *)(lVar72 + 8 + lVar73)),0x20);
              auVar175._8_8_ = 0;
              auVar175._0_8_ = *(ulong *)(lVar72 + 0x34 + lVar73);
              auVar76 = vpermt2ps_avx512vl(auVar175,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar72 + lVar73)));
              auVar195._8_8_ = 0;
              auVar195._0_8_ = *(ulong *)(lVar72 + 0x1c + lVar73);
              fVar2 = *(float *)(lVar72 + 0x24 + lVar73);
              fVar3 = *(float *)(lVar72 + 0x28 + lVar73);
              fVar4 = *(float *)(lVar72 + 0x2c + lVar73);
              auVar77 = vpermt2ps_avx512vl(auVar195,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)));
              fVar5 = *(float *)(lVar72 + 0x30 + lVar73);
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                        ZEXT416((uint)fVar2));
              auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
              auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
              auVar78 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar80._0_4_));
              fVar197 = auVar78._0_4_;
              fVar197 = fVar197 * 1.5 + fVar197 * fVar197 * fVar197 * auVar80._0_4_ * -0.5;
              auVar80 = vinsertps_avx(auVar77,ZEXT416((uint)(fVar2 * fVar197)),0x30);
              in_ZMM10 = ZEXT1664(auVar80);
              auVar80 = vinsertps_avx(auVar76,ZEXT416((uint)(fVar3 * fVar197)),0x30);
              auVar83 = ZEXT1664(auVar80);
              auVar75 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar5 * fVar197)),0x30);
              in_ZMM6 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 4 + lVar73)),0x10);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x3c + lVar73)),0x20);
              auVar75 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar4 * fVar197)),0x30);
              auVar82 = ZEXT1664(auVar75);
            }
            else if (iVar9 == 0x9244) {
              lVar72 = *plVar1;
              lVar73 = plVar1[2] * uVar66;
              auVar83 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + lVar73));
              auVar82 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + 0x10 + lVar73));
              in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + 0x20 + lVar73));
              in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + 0x30 + lVar73));
            }
            auVar84 = vbroadcastss_avx512f(auVar83._0_16_);
            auVar85 = vbroadcastss_avx512f(ZEXT416(1));
            auVar86 = vpermps_avx512f(auVar85,auVar83);
            auVar114 = vbroadcastss_avx512f(ZEXT416(2));
            auVar116 = vpermps_avx512f(auVar114,auVar83);
            auVar113 = vbroadcastss_avx512f(ZEXT416(3));
            auVar83 = vpermps_avx512f(auVar113,auVar83);
            auVar115 = vbroadcastss_avx512f(auVar82._0_16_);
            auVar117 = vpermps_avx512f(auVar85,auVar82);
            auVar118 = vpermps_avx512f(auVar114,auVar82);
            auVar82 = vpermps_avx512f(auVar113,auVar82);
            auVar119 = vbroadcastss_avx512f(in_ZMM6._0_16_);
            auVar120 = vpermps_avx512f(auVar85,in_ZMM6);
            auVar121 = vpermps_avx512f(auVar114,in_ZMM6);
            auVar122 = vpermps_avx512f(auVar113,in_ZMM6);
            auVar123 = vbroadcastss_avx512f(in_ZMM10._0_16_);
            auVar124 = vpermps_avx512f(auVar85,in_ZMM10);
            auVar129 = vpermps_avx512f(auVar114,in_ZMM10);
            auVar130 = vpermps_avx512f(auVar113,in_ZMM10);
            iVar9 = *(int *)(lVar12 + 0x58 + lVar71);
            if (iVar9 == 0x9134) {
              lVar12 = plVar1[7];
              lVar71 = uVar66 * plVar1[9];
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar71)),
                                      ZEXT416(*(uint *)(lVar12 + 0x10 + lVar71)),0x1c);
              auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar71)),0x28);
              in_ZMM20 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar71)),
                                      ZEXT416(*(uint *)(lVar12 + 0x14 + lVar71)),0x1c);
              auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar71)),0x28);
              in_ZMM23 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar71)),
                                      ZEXT416(*(uint *)(lVar12 + 0x18 + lVar71)),0x1c);
              auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar71)),0x28);
              in_ZMM21 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar71)),
                                      ZEXT416(*(uint *)(lVar12 + 0x1c + lVar71)),0x1c);
              auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar71)),0x28);
              in_ZMM22 = ZEXT1664(auVar75);
            }
            else {
              auVar176._16_48_ = auVar118._16_48_;
              if (iVar9 == 0x9234) {
                lVar12 = plVar1[7];
                lVar71 = uVar66 * plVar1[9];
                auVar200._8_8_ = 0;
                auVar200._0_8_ = *(ulong *)(lVar12 + 4 + lVar71);
                auVar208._8_8_ = 0;
                auVar208._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar71);
                auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar71)),_DAT_02060e80,
                                             auVar200);
                in_ZMM20 = ZEXT1664(auVar75);
                auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar71)),_DAT_02060e80
                                             ,auVar208);
                in_ZMM23 = ZEXT1664(auVar75);
                auVar201._8_8_ = 0;
                auVar201._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar71);
                auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar71)),
                                             _DAT_02060e80,auVar201);
                in_ZMM21 = ZEXT1664(auVar75);
                auVar202._8_8_ = 0;
                auVar202._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar71);
                auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar71)),
                                             _DAT_02060e80,auVar202);
                in_ZMM22 = ZEXT1664(auVar75);
              }
              else if (iVar9 == 0xb001) {
                lVar12 = plVar1[7];
                lVar71 = uVar66 * plVar1[9];
                auVar203._8_8_ = 0;
                auVar203._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar71);
                auVar75 = vinsertps_avx(auVar203,ZEXT416(*(uint *)(lVar12 + 8 + lVar71)),0x20);
                auVar206._8_8_ = 0;
                auVar206._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar71);
                auVar76 = vpermt2ps_avx512vl(auVar206,_DAT_02060e90,
                                             ZEXT416(*(uint *)(lVar12 + lVar71)));
                uVar70 = *(uint *)(lVar12 + 0x24 + lVar71);
                uVar8 = *(uint *)(lVar12 + 0x28 + lVar71);
                uVar68 = *(uint *)(lVar12 + 0x2c + lVar71);
                auVar210._8_8_ = 0;
                auVar210._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar71);
                auVar77 = vpermt2ps_avx512vl(auVar210,_DAT_02060e90,
                                             ZEXT416(*(uint *)(lVar12 + 0x18 + lVar71)));
                fVar2 = *(float *)(lVar12 + 0x30 + lVar71);
                auVar80 = vmulss_avx512f(ZEXT416(uVar8),ZEXT416(uVar8));
                auVar80 = vfmadd231ss_avx512f(auVar80,ZEXT416(uVar70),ZEXT416(uVar70));
                auVar80 = vfmadd231ss_avx512f(auVar80,ZEXT416(uVar68),ZEXT416(uVar68));
                auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
                auVar176._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
                auVar131._4_60_ = auVar176._4_60_;
                auVar131._0_4_ = auVar80._0_4_;
                auVar78 = vrsqrt14ss_avx512f(auVar176._0_16_,auVar131._0_16_);
                auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                auVar80 = vmulss_avx512f(auVar78,ZEXT416((uint)(auVar80._0_4_ * -0.5)));
                auVar78 = vmulss_avx512f(auVar78,auVar78);
                auVar80 = vmulss_avx512f(auVar78,auVar80);
                auVar78 = vaddss_avx512f(auVar79,auVar80);
                auVar80 = vmulss_avx512f(ZEXT416(uVar70),auVar78);
                auVar80 = vinsertps_avx512f(auVar77,auVar80,0x30);
                in_ZMM22 = ZEXT1664(auVar80);
                auVar80 = vmulss_avx512f(ZEXT416(uVar8),auVar78);
                auVar80 = vinsertps_avx512f(auVar76,auVar80,0x30);
                in_ZMM20 = ZEXT1664(auVar80);
                auVar80 = vmulss_avx512f(ZEXT416(uVar68),auVar78);
                auVar75 = vinsertps_avx512f(auVar75,ZEXT416((uint)(fVar2 * auVar78._0_4_)),0x30);
                in_ZMM21 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar12 + 0xc + lVar71)),
                                            ZEXT416(*(uint *)(lVar12 + 4 + lVar71)),0x10);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar71)),0x20);
                auVar75 = vinsertps_avx512f(auVar75,auVar80,0x30);
                in_ZMM23 = ZEXT1664(auVar75);
              }
              else if (iVar9 == 0x9244) {
                lVar12 = plVar1[7];
                lVar71 = uVar66 * plVar1[9];
                in_ZMM20 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + lVar71));
                in_ZMM23 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x10 + lVar71));
                in_ZMM21 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x20 + lVar71));
                in_ZMM22 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar71));
              }
            }
            auVar132 = vpermps_avx512f(auVar113,in_ZMM20);
            auVar133 = vpermps_avx512f(auVar113,in_ZMM23);
            auVar134 = vpermps_avx512f(auVar113,in_ZMM21);
            auVar135 = vpermps_avx512f(auVar113,in_ZMM22);
            auVar136 = vmulps_avx512f(auVar130,auVar135);
            auVar137 = vmulps_avx512f(auVar83,auVar132);
            auVar136 = vaddps_avx512f(auVar137,auVar136);
            auVar137 = vmulps_avx512f(auVar82,auVar133);
            auVar136 = vaddps_avx512f(auVar137,auVar136);
            auVar137 = vmulps_avx512f(auVar122,auVar134);
            auVar136 = vaddps_avx512f(auVar137,auVar136);
            auVar137 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            auVar138 = vxorps_avx512dq(auVar136,auVar137);
            auVar139 = vmaxps_avx512f(auVar138,auVar136);
            auVar31._8_4_ = 0x7fffffff;
            auVar31._0_8_ = 0x7fffffff7fffffff;
            auVar31._12_4_ = 0x7fffffff;
            auVar31._16_4_ = 0x7fffffff;
            auVar31._20_4_ = 0x7fffffff;
            auVar31._24_4_ = 0x7fffffff;
            auVar31._28_4_ = 0x7fffffff;
            auVar31._32_4_ = 0x7fffffff;
            auVar31._36_4_ = 0x7fffffff;
            auVar31._40_4_ = 0x7fffffff;
            auVar31._44_4_ = 0x7fffffff;
            auVar31._48_4_ = 0x7fffffff;
            auVar31._52_4_ = 0x7fffffff;
            auVar31._56_4_ = 0x7fffffff;
            auVar31._60_4_ = 0x7fffffff;
            auVar140 = vandpd_avx512dq(auVar139,auVar31);
            auVar141 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            uVar66 = vcmpps_avx512f(auVar136,auVar138,1);
            uVar69 = vcmpps_avx512f(auVar140,auVar141,6);
            auVar32._8_4_ = 0xbb8d3753;
            auVar32._0_8_ = 0xbb8d3753bb8d3753;
            auVar32._12_4_ = 0xbb8d3753;
            auVar32._16_4_ = 0xbb8d3753;
            auVar32._20_4_ = 0xbb8d3753;
            auVar32._24_4_ = 0xbb8d3753;
            auVar32._28_4_ = 0xbb8d3753;
            auVar32._32_4_ = 0xbb8d3753;
            auVar32._36_4_ = 0xbb8d3753;
            auVar32._40_4_ = 0xbb8d3753;
            auVar32._44_4_ = 0xbb8d3753;
            auVar32._48_4_ = 0xbb8d3753;
            auVar32._52_4_ = 0xbb8d3753;
            auVar32._56_4_ = 0xbb8d3753;
            auVar32._60_4_ = 0xbb8d3753;
            auVar136 = vmulps_avx512f(auVar140,auVar32);
            auVar33._8_4_ = 0x3c9df1b8;
            auVar33._0_8_ = 0x3c9df1b83c9df1b8;
            auVar33._12_4_ = 0x3c9df1b8;
            auVar33._16_4_ = 0x3c9df1b8;
            auVar33._20_4_ = 0x3c9df1b8;
            auVar33._24_4_ = 0x3c9df1b8;
            auVar33._28_4_ = 0x3c9df1b8;
            auVar33._32_4_ = 0x3c9df1b8;
            auVar33._36_4_ = 0x3c9df1b8;
            auVar33._40_4_ = 0x3c9df1b8;
            auVar33._44_4_ = 0x3c9df1b8;
            auVar33._48_4_ = 0x3c9df1b8;
            auVar33._52_4_ = 0x3c9df1b8;
            auVar33._56_4_ = 0x3c9df1b8;
            auVar33._60_4_ = 0x3c9df1b8;
            auVar136 = vaddps_avx512f(auVar136,auVar33);
            auVar136 = vmulps_avx512f(auVar136,auVar140);
            auVar34._8_4_ = 0xbd37e81c;
            auVar34._0_8_ = 0xbd37e81cbd37e81c;
            auVar34._12_4_ = 0xbd37e81c;
            auVar34._16_4_ = 0xbd37e81c;
            auVar34._20_4_ = 0xbd37e81c;
            auVar34._24_4_ = 0xbd37e81c;
            auVar34._28_4_ = 0xbd37e81c;
            auVar34._32_4_ = 0xbd37e81c;
            auVar34._36_4_ = 0xbd37e81c;
            auVar34._40_4_ = 0xbd37e81c;
            auVar34._44_4_ = 0xbd37e81c;
            auVar34._48_4_ = 0xbd37e81c;
            auVar34._52_4_ = 0xbd37e81c;
            auVar34._56_4_ = 0xbd37e81c;
            auVar34._60_4_ = 0xbd37e81c;
            auVar136 = vaddps_avx512f(auVar136,auVar34);
            auVar136 = vmulps_avx512f(auVar136,auVar140);
            auVar35._8_4_ = 0x3db3edac;
            auVar35._0_8_ = 0x3db3edac3db3edac;
            auVar35._12_4_ = 0x3db3edac;
            auVar35._16_4_ = 0x3db3edac;
            auVar35._20_4_ = 0x3db3edac;
            auVar35._24_4_ = 0x3db3edac;
            auVar35._28_4_ = 0x3db3edac;
            auVar35._32_4_ = 0x3db3edac;
            auVar35._36_4_ = 0x3db3edac;
            auVar35._40_4_ = 0x3db3edac;
            auVar35._44_4_ = 0x3db3edac;
            auVar35._48_4_ = 0x3db3edac;
            auVar35._52_4_ = 0x3db3edac;
            auVar35._56_4_ = 0x3db3edac;
            auVar35._60_4_ = 0x3db3edac;
            auVar136 = vaddps_avx512f(auVar136,auVar35);
            auVar136 = vmulps_avx512f(auVar136,auVar140);
            auVar36._8_4_ = 0xbe5ba881;
            auVar36._0_8_ = 0xbe5ba881be5ba881;
            auVar36._12_4_ = 0xbe5ba881;
            auVar36._16_4_ = 0xbe5ba881;
            auVar36._20_4_ = 0xbe5ba881;
            auVar36._24_4_ = 0xbe5ba881;
            auVar36._28_4_ = 0xbe5ba881;
            auVar36._32_4_ = 0xbe5ba881;
            auVar36._36_4_ = 0xbe5ba881;
            auVar36._40_4_ = 0xbe5ba881;
            auVar36._44_4_ = 0xbe5ba881;
            auVar36._48_4_ = 0xbe5ba881;
            auVar36._52_4_ = 0xbe5ba881;
            auVar36._56_4_ = 0xbe5ba881;
            auVar36._60_4_ = 0xbe5ba881;
            auVar136 = vaddps_avx512f(auVar136,auVar36);
            auVar136 = vmulps_avx512f(auVar136,auVar140);
            auVar37._8_4_ = 0x3fc90fd1;
            auVar37._0_8_ = 0x3fc90fd13fc90fd1;
            auVar37._12_4_ = 0x3fc90fd1;
            auVar37._16_4_ = 0x3fc90fd1;
            auVar37._20_4_ = 0x3fc90fd1;
            auVar37._24_4_ = 0x3fc90fd1;
            auVar37._28_4_ = 0x3fc90fd1;
            auVar37._32_4_ = 0x3fc90fd1;
            auVar37._36_4_ = 0x3fc90fd1;
            auVar37._40_4_ = 0x3fc90fd1;
            auVar37._44_4_ = 0x3fc90fd1;
            auVar37._48_4_ = 0x3fc90fd1;
            auVar37._52_4_ = 0x3fc90fd1;
            auVar37._56_4_ = 0x3fc90fd1;
            auVar37._60_4_ = 0x3fc90fd1;
            auVar136 = vaddps_avx512f(auVar136,auVar37);
            auVar138 = vsubps_avx512f(auVar141,auVar140);
            auVar138 = vsqrtps_avx512f(auVar138);
            auVar136 = vmulps_avx512f(auVar138,auVar136);
            auVar209 = ZEXT1664(ZEXT816(0) << 0x40);
            uVar28 = vcmpps_avx512f(auVar139,auVar209,1);
            auVar138 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar136 = vsubps_avx512f(auVar138,auVar136);
            auVar136 = vmaxps_avx512f(auVar209,auVar136);
            auVar140 = vxorps_avx512dq(auVar136,auVar137);
            bVar14 = (bool)((byte)uVar28 & 1);
            auVar142._0_4_ = (uint)bVar14 * auVar140._0_4_ | (uint)!bVar14 * auVar136._0_4_;
            bVar14 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar142._4_4_ = (uint)bVar14 * auVar140._4_4_ | (uint)!bVar14 * auVar136._4_4_;
            bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar142._8_4_ = (uint)bVar14 * auVar140._8_4_ | (uint)!bVar14 * auVar136._8_4_;
            bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar142._12_4_ = (uint)bVar14 * auVar140._12_4_ | (uint)!bVar14 * auVar136._12_4_;
            bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar142._16_4_ = (uint)bVar14 * auVar140._16_4_ | (uint)!bVar14 * auVar136._16_4_;
            bVar14 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar142._20_4_ = (uint)bVar14 * auVar140._20_4_ | (uint)!bVar14 * auVar136._20_4_;
            bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar142._24_4_ = (uint)bVar14 * auVar140._24_4_ | (uint)!bVar14 * auVar136._24_4_;
            bVar14 = (bool)((byte)(uVar28 >> 7) & 1);
            auVar142._28_4_ = (uint)bVar14 * auVar140._28_4_ | (uint)!bVar14 * auVar136._28_4_;
            bVar14 = (bool)((byte)(uVar28 >> 8) & 1);
            auVar142._32_4_ = (uint)bVar14 * auVar140._32_4_ | (uint)!bVar14 * auVar136._32_4_;
            bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
            auVar142._36_4_ = (uint)bVar14 * auVar140._36_4_ | (uint)!bVar14 * auVar136._36_4_;
            bVar14 = (bool)((byte)(uVar28 >> 10) & 1);
            auVar142._40_4_ = (uint)bVar14 * auVar140._40_4_ | (uint)!bVar14 * auVar136._40_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xb) & 1);
            auVar142._44_4_ = (uint)bVar14 * auVar140._44_4_ | (uint)!bVar14 * auVar136._44_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xc) & 1);
            auVar142._48_4_ = (uint)bVar14 * auVar140._48_4_ | (uint)!bVar14 * auVar136._48_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xd) & 1);
            auVar142._52_4_ = (uint)bVar14 * auVar140._52_4_ | (uint)!bVar14 * auVar136._52_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xe) & 1);
            auVar142._56_4_ = (uint)bVar14 * auVar140._56_4_ | (uint)!bVar14 * auVar136._56_4_;
            bVar14 = SUB81(uVar28 >> 0xf,0);
            auVar142._60_4_ = (uint)bVar14 * auVar140._60_4_ | (uint)!bVar14 * auVar136._60_4_;
            auVar136 = vsubps_avx512f(auVar138,auVar142);
            auVar140 = vbroadcastss_avx512f(ZEXT416(0x7fc00000));
            bVar14 = (bool)((byte)uVar69 & 1);
            auVar143._0_4_ = (uint)bVar14 * auVar140._0_4_ | (uint)!bVar14 * auVar136._0_4_;
            bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar14 * auVar140._4_4_ | (uint)!bVar14 * auVar136._4_4_;
            bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar14 * auVar140._8_4_ | (uint)!bVar14 * auVar136._8_4_;
            bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar14 * auVar140._12_4_ | (uint)!bVar14 * auVar136._12_4_;
            bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar143._16_4_ = (uint)bVar14 * auVar140._16_4_ | (uint)!bVar14 * auVar136._16_4_;
            bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar143._20_4_ = (uint)bVar14 * auVar140._20_4_ | (uint)!bVar14 * auVar136._20_4_;
            bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar143._24_4_ = (uint)bVar14 * auVar140._24_4_ | (uint)!bVar14 * auVar136._24_4_;
            bVar14 = (bool)((byte)(uVar69 >> 7) & 1);
            auVar143._28_4_ = (uint)bVar14 * auVar140._28_4_ | (uint)!bVar14 * auVar136._28_4_;
            bVar14 = (bool)((byte)(uVar69 >> 8) & 1);
            auVar143._32_4_ = (uint)bVar14 * auVar140._32_4_ | (uint)!bVar14 * auVar136._32_4_;
            bVar14 = (bool)((byte)(uVar69 >> 9) & 1);
            auVar143._36_4_ = (uint)bVar14 * auVar140._36_4_ | (uint)!bVar14 * auVar136._36_4_;
            bVar14 = (bool)((byte)(uVar69 >> 10) & 1);
            auVar143._40_4_ = (uint)bVar14 * auVar140._40_4_ | (uint)!bVar14 * auVar136._40_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xb) & 1);
            auVar143._44_4_ = (uint)bVar14 * auVar140._44_4_ | (uint)!bVar14 * auVar136._44_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xc) & 1);
            auVar143._48_4_ = (uint)bVar14 * auVar140._48_4_ | (uint)!bVar14 * auVar136._48_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xd) & 1);
            auVar143._52_4_ = (uint)bVar14 * auVar140._52_4_ | (uint)!bVar14 * auVar136._52_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xe) & 1);
            auVar143._56_4_ = (uint)bVar14 * auVar140._56_4_ | (uint)!bVar14 * auVar136._56_4_;
            bVar14 = SUB81(uVar69 >> 0xf,0);
            auVar143._60_4_ = (uint)bVar14 * auVar140._60_4_ | (uint)!bVar14 * auVar136._60_4_;
            auVar136 = vmulps_avx512f(auVar81,auVar143);
            auVar38._8_4_ = 0x3f22f983;
            auVar38._0_8_ = 0x3f22f9833f22f983;
            auVar38._12_4_ = 0x3f22f983;
            auVar38._16_4_ = 0x3f22f983;
            auVar38._20_4_ = 0x3f22f983;
            auVar38._24_4_ = 0x3f22f983;
            auVar38._28_4_ = 0x3f22f983;
            auVar38._32_4_ = 0x3f22f983;
            auVar38._36_4_ = 0x3f22f983;
            auVar38._40_4_ = 0x3f22f983;
            auVar38._44_4_ = 0x3f22f983;
            auVar38._48_4_ = 0x3f22f983;
            auVar38._52_4_ = 0x3f22f983;
            auVar38._56_4_ = 0x3f22f983;
            auVar38._60_4_ = 0x3f22f983;
            auVar140 = vmulps_avx512f(auVar136,auVar38);
            auVar140 = vrndscaleps_avx512f(auVar140,1);
            auVar138 = vmulps_avx512f(auVar140,auVar138);
            auVar136 = vsubps_avx512f(auVar136,auVar138);
            auVar138 = vcvtps2dq_avx512f(auVar140);
            auVar113 = vandps_avx512dq(auVar138,auVar113);
            uVar30 = vptestnmd_avx512f(auVar138,auVar85);
            auVar138 = vpslld_avx512f(auVar138,0x1f);
            uVar74 = vpmovd2m_avx512dq(auVar138);
            auVar138 = vmulps_avx512f(auVar136,auVar136);
            auVar39._8_4_ = 0xb2d70013;
            auVar39._0_8_ = 0xb2d70013b2d70013;
            auVar39._12_4_ = 0xb2d70013;
            auVar39._16_4_ = 0xb2d70013;
            auVar39._20_4_ = 0xb2d70013;
            auVar39._24_4_ = 0xb2d70013;
            auVar39._28_4_ = 0xb2d70013;
            auVar39._32_4_ = 0xb2d70013;
            auVar39._36_4_ = 0xb2d70013;
            auVar39._40_4_ = 0xb2d70013;
            auVar39._44_4_ = 0xb2d70013;
            auVar39._48_4_ = 0xb2d70013;
            auVar39._52_4_ = 0xb2d70013;
            auVar39._56_4_ = 0xb2d70013;
            auVar39._60_4_ = 0xb2d70013;
            auVar140 = vmulps_avx512f(auVar138,auVar39);
            uVar69 = vpcmpgtd_avx512f(auVar113,auVar85);
            auVar40._8_4_ = 0x363938a8;
            auVar40._0_8_ = 0x363938a8363938a8;
            auVar40._12_4_ = 0x363938a8;
            auVar40._16_4_ = 0x363938a8;
            auVar40._20_4_ = 0x363938a8;
            auVar40._24_4_ = 0x363938a8;
            auVar40._28_4_ = 0x363938a8;
            auVar40._32_4_ = 0x363938a8;
            auVar40._36_4_ = 0x363938a8;
            auVar40._40_4_ = 0x363938a8;
            auVar40._44_4_ = 0x363938a8;
            auVar40._48_4_ = 0x363938a8;
            auVar40._52_4_ = 0x363938a8;
            auVar40._56_4_ = 0x363938a8;
            auVar40._60_4_ = 0x363938a8;
            auVar140 = vaddps_avx512f(auVar140,auVar40);
            auVar144 = vpternlogd_avx512f(auVar84,auVar84,auVar84,0xff);
            auVar41._8_4_ = 0xb48b634d;
            auVar41._0_8_ = 0xb48b634db48b634d;
            auVar41._12_4_ = 0xb48b634d;
            auVar41._16_4_ = 0xb48b634d;
            auVar41._20_4_ = 0xb48b634d;
            auVar41._24_4_ = 0xb48b634d;
            auVar41._28_4_ = 0xb48b634d;
            auVar41._32_4_ = 0xb48b634d;
            auVar41._36_4_ = 0xb48b634d;
            auVar41._40_4_ = 0xb48b634d;
            auVar41._44_4_ = 0xb48b634d;
            auVar41._48_4_ = 0xb48b634d;
            auVar41._52_4_ = 0xb48b634d;
            auVar41._56_4_ = 0xb48b634d;
            auVar41._60_4_ = 0xb48b634d;
            auVar145 = vmulps_avx512f(auVar138,auVar41);
            auVar113 = vpaddd_avx512f(auVar113,auVar144);
            auVar42._8_4_ = 0x37cfab9c;
            auVar42._0_8_ = 0x37cfab9c37cfab9c;
            auVar42._12_4_ = 0x37cfab9c;
            auVar42._16_4_ = 0x37cfab9c;
            auVar42._20_4_ = 0x37cfab9c;
            auVar42._24_4_ = 0x37cfab9c;
            auVar42._28_4_ = 0x37cfab9c;
            auVar42._32_4_ = 0x37cfab9c;
            auVar42._36_4_ = 0x37cfab9c;
            auVar42._40_4_ = 0x37cfab9c;
            auVar42._44_4_ = 0x37cfab9c;
            auVar42._48_4_ = 0x37cfab9c;
            auVar42._52_4_ = 0x37cfab9c;
            auVar42._56_4_ = 0x37cfab9c;
            auVar42._60_4_ = 0x37cfab9c;
            auVar144 = vaddps_avx512f(auVar145,auVar42);
            auVar140 = vmulps_avx512f(auVar138,auVar140);
            auVar43._8_4_ = 0xb9501096;
            auVar43._0_8_ = 0xb9501096b9501096;
            auVar43._12_4_ = 0xb9501096;
            auVar43._16_4_ = 0xb9501096;
            auVar43._20_4_ = 0xb9501096;
            auVar43._24_4_ = 0xb9501096;
            auVar43._28_4_ = 0xb9501096;
            auVar43._32_4_ = 0xb9501096;
            auVar43._36_4_ = 0xb9501096;
            auVar43._40_4_ = 0xb9501096;
            auVar43._44_4_ = 0xb9501096;
            auVar43._48_4_ = 0xb9501096;
            auVar43._52_4_ = 0xb9501096;
            auVar43._56_4_ = 0xb9501096;
            auVar43._60_4_ = 0xb9501096;
            auVar140 = vaddps_avx512f(auVar140,auVar43);
            auVar144 = vmulps_avx512f(auVar138,auVar144);
            auVar44._8_4_ = 0xbab60981;
            auVar44._0_8_ = 0xbab60981bab60981;
            auVar44._12_4_ = 0xbab60981;
            auVar44._16_4_ = 0xbab60981;
            auVar44._20_4_ = 0xbab60981;
            auVar44._24_4_ = 0xbab60981;
            auVar44._28_4_ = 0xbab60981;
            auVar44._32_4_ = 0xbab60981;
            auVar44._36_4_ = 0xbab60981;
            auVar44._40_4_ = 0xbab60981;
            auVar44._44_4_ = 0xbab60981;
            auVar44._48_4_ = 0xbab60981;
            auVar44._52_4_ = 0xbab60981;
            auVar44._56_4_ = 0xbab60981;
            auVar44._60_4_ = 0xbab60981;
            auVar144 = vaddps_avx512f(auVar144,auVar44);
            auVar140 = vmulps_avx512f(auVar138,auVar140);
            auVar45._8_4_ = 0x3c088898;
            auVar45._0_8_ = 0x3c0888983c088898;
            auVar45._12_4_ = 0x3c088898;
            auVar45._16_4_ = 0x3c088898;
            auVar45._20_4_ = 0x3c088898;
            auVar45._24_4_ = 0x3c088898;
            auVar45._28_4_ = 0x3c088898;
            auVar45._32_4_ = 0x3c088898;
            auVar45._36_4_ = 0x3c088898;
            auVar45._40_4_ = 0x3c088898;
            auVar45._44_4_ = 0x3c088898;
            auVar45._48_4_ = 0x3c088898;
            auVar45._52_4_ = 0x3c088898;
            auVar45._56_4_ = 0x3c088898;
            auVar45._60_4_ = 0x3c088898;
            auVar140 = vaddps_avx512f(auVar140,auVar45);
            auVar144 = vmulps_avx512f(auVar138,auVar144);
            auVar46._8_4_ = 0x3d2aaaa4;
            auVar46._0_8_ = 0x3d2aaaa43d2aaaa4;
            auVar46._12_4_ = 0x3d2aaaa4;
            auVar46._16_4_ = 0x3d2aaaa4;
            auVar46._20_4_ = 0x3d2aaaa4;
            auVar46._24_4_ = 0x3d2aaaa4;
            auVar46._28_4_ = 0x3d2aaaa4;
            auVar46._32_4_ = 0x3d2aaaa4;
            auVar46._36_4_ = 0x3d2aaaa4;
            auVar46._40_4_ = 0x3d2aaaa4;
            auVar46._44_4_ = 0x3d2aaaa4;
            auVar46._48_4_ = 0x3d2aaaa4;
            auVar46._52_4_ = 0x3d2aaaa4;
            auVar46._56_4_ = 0x3d2aaaa4;
            auVar46._60_4_ = 0x3d2aaaa4;
            auVar144 = vaddps_avx512f(auVar144,auVar46);
            auVar140 = vmulps_avx512f(auVar138,auVar140);
            auVar47._8_4_ = 0xbe2aaaab;
            auVar47._0_8_ = 0xbe2aaaabbe2aaaab;
            auVar47._12_4_ = 0xbe2aaaab;
            auVar47._16_4_ = 0xbe2aaaab;
            auVar47._20_4_ = 0xbe2aaaab;
            auVar47._24_4_ = 0xbe2aaaab;
            auVar47._28_4_ = 0xbe2aaaab;
            auVar47._32_4_ = 0xbe2aaaab;
            auVar47._36_4_ = 0xbe2aaaab;
            auVar47._40_4_ = 0xbe2aaaab;
            auVar47._44_4_ = 0xbe2aaaab;
            auVar47._48_4_ = 0xbe2aaaab;
            auVar47._52_4_ = 0xbe2aaaab;
            auVar47._56_4_ = 0xbe2aaaab;
            auVar47._60_4_ = 0xbe2aaaab;
            auVar140 = vaddps_avx512f(auVar140,auVar47);
            uVar28 = vpcmpud_avx512f(auVar113,auVar114,1);
            auVar113 = vmulps_avx512f(auVar138,auVar144);
            auVar144 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
            auVar113 = vaddps_avx512f(auVar113,auVar144);
            auVar140 = vmulps_avx512f(auVar138,auVar140);
            auVar113 = vmulps_avx512f(auVar138,auVar113);
            auVar138 = vaddps_avx512f(auVar140,auVar141);
            auVar138 = vmulps_avx512f(auVar136,auVar138);
            auVar113 = vaddps_avx512f(auVar113,auVar141);
            auVar140 = vblendmps_avx512f(auVar138,auVar113);
            bVar14 = (bool)((byte)uVar74 & 1);
            auVar146._0_4_ = (uint)bVar14 * auVar140._0_4_ | (uint)!bVar14 * auVar136._0_4_;
            bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar146._4_4_ = (uint)bVar14 * auVar140._4_4_ | (uint)!bVar14 * auVar136._4_4_;
            bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar146._8_4_ = (uint)bVar14 * auVar140._8_4_ | (uint)!bVar14 * auVar136._8_4_;
            bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar146._12_4_ = (uint)bVar14 * auVar140._12_4_ | (uint)!bVar14 * auVar136._12_4_;
            bVar14 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar146._16_4_ = (uint)bVar14 * auVar140._16_4_ | (uint)!bVar14 * auVar136._16_4_;
            bVar14 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar146._20_4_ = (uint)bVar14 * auVar140._20_4_ | (uint)!bVar14 * auVar136._20_4_;
            bVar14 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar146._24_4_ = (uint)bVar14 * auVar140._24_4_ | (uint)!bVar14 * auVar136._24_4_;
            bVar14 = (bool)((byte)(uVar74 >> 7) & 1);
            auVar146._28_4_ = (uint)bVar14 * auVar140._28_4_ | (uint)!bVar14 * auVar136._28_4_;
            bVar14 = (bool)((byte)(uVar74 >> 8) & 1);
            auVar146._32_4_ = (uint)bVar14 * auVar140._32_4_ | (uint)!bVar14 * auVar136._32_4_;
            bVar14 = (bool)((byte)(uVar74 >> 9) & 1);
            auVar146._36_4_ = (uint)bVar14 * auVar140._36_4_ | (uint)!bVar14 * auVar136._36_4_;
            bVar14 = (bool)((byte)(uVar74 >> 10) & 1);
            auVar146._40_4_ = (uint)bVar14 * auVar140._40_4_ | (uint)!bVar14 * auVar136._40_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xb) & 1);
            auVar146._44_4_ = (uint)bVar14 * auVar140._44_4_ | (uint)!bVar14 * auVar136._44_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xc) & 1);
            auVar146._48_4_ = (uint)bVar14 * auVar140._48_4_ | (uint)!bVar14 * auVar136._48_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xd) & 1);
            auVar146._52_4_ = (uint)bVar14 * auVar140._52_4_ | (uint)!bVar14 * auVar136._52_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xe) & 1);
            auVar146._56_4_ = (uint)bVar14 * auVar140._56_4_ | (uint)!bVar14 * auVar136._56_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xf) & 1);
            auVar146._60_4_ = (uint)bVar14 * auVar140._60_4_ | (uint)!bVar14 * auVar136._60_4_;
            bVar14 = (bool)((byte)uVar30 & 1);
            auVar147._0_4_ = (uint)bVar14 * auVar113._0_4_ | (uint)!bVar14 * auVar138._0_4_;
            bVar14 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar147._4_4_ = (uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar138._4_4_;
            bVar14 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar147._8_4_ = (uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar138._8_4_;
            bVar14 = (bool)((byte)(uVar30 >> 3) & 1);
            auVar147._12_4_ = (uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar138._12_4_;
            bVar14 = (bool)((byte)(uVar30 >> 4) & 1);
            auVar147._16_4_ = (uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar138._16_4_;
            bVar14 = (bool)((byte)(uVar30 >> 5) & 1);
            auVar147._20_4_ = (uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar138._20_4_;
            bVar14 = (bool)((byte)(uVar30 >> 6) & 1);
            auVar147._24_4_ = (uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar138._24_4_;
            bVar14 = (bool)((byte)(uVar30 >> 7) & 1);
            auVar147._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar138._28_4_;
            bVar14 = (bool)((byte)(uVar30 >> 8) & 1);
            auVar147._32_4_ = (uint)bVar14 * auVar113._32_4_ | (uint)!bVar14 * auVar138._32_4_;
            bVar14 = (bool)((byte)(uVar30 >> 9) & 1);
            auVar147._36_4_ = (uint)bVar14 * auVar113._36_4_ | (uint)!bVar14 * auVar138._36_4_;
            bVar14 = (bool)((byte)(uVar30 >> 10) & 1);
            auVar147._40_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * auVar138._40_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xb) & 1);
            auVar147._44_4_ = (uint)bVar14 * auVar113._44_4_ | (uint)!bVar14 * auVar138._44_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xc) & 1);
            auVar147._48_4_ = (uint)bVar14 * auVar113._48_4_ | (uint)!bVar14 * auVar138._48_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xd) & 1);
            auVar147._52_4_ = (uint)bVar14 * auVar113._52_4_ | (uint)!bVar14 * auVar138._52_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xe) & 1);
            auVar147._56_4_ = (uint)bVar14 * auVar113._56_4_ | (uint)!bVar14 * auVar138._56_4_;
            bVar14 = SUB81(uVar30 >> 0xf,0);
            auVar147._60_4_ = (uint)bVar14 * auVar113._60_4_ | (uint)!bVar14 * auVar138._60_4_;
            auVar113 = vxorps_avx512dq(auVar135,auVar137);
            bVar13 = (byte)uVar66;
            auVar148._0_4_ =
                 (uint)(bVar13 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar135._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar148._4_4_ = (uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar135._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar148._8_4_ = (uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar135._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar148._12_4_ = (uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar135._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar148._16_4_ = (uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar135._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar148._20_4_ = (uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar135._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar148._24_4_ = (uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar135._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar148._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar135._28_4_;
            bVar21 = (byte)(uVar66 >> 8);
            auVar148._32_4_ =
                 (uint)(bVar21 & 1) * auVar113._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar135._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar148._36_4_ = (uint)bVar14 * auVar113._36_4_ | (uint)!bVar14 * auVar135._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar148._40_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * auVar135._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar148._44_4_ = (uint)bVar14 * auVar113._44_4_ | (uint)!bVar14 * auVar135._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar148._48_4_ = (uint)bVar14 * auVar113._48_4_ | (uint)!bVar14 * auVar135._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar148._52_4_ = (uint)bVar14 * auVar113._52_4_ | (uint)!bVar14 * auVar135._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar148._56_4_ = (uint)bVar14 * auVar113._56_4_ | (uint)!bVar14 * auVar135._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar148._60_4_ = (uint)bVar14 * auVar113._60_4_ | (uint)!bVar14 * auVar135._60_4_;
            auVar113 = vxorps_avx512dq(auVar132,auVar137);
            auVar149._0_4_ =
                 (uint)(bVar13 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar132._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar149._4_4_ = (uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar132._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar149._8_4_ = (uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar132._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar149._12_4_ = (uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar132._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar149._16_4_ = (uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar132._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar149._20_4_ = (uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar132._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar149._24_4_ = (uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar132._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar149._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar132._28_4_;
            auVar149._32_4_ =
                 (uint)(bVar21 & 1) * auVar113._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar132._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar149._36_4_ = (uint)bVar14 * auVar113._36_4_ | (uint)!bVar14 * auVar132._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar149._40_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * auVar132._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar149._44_4_ = (uint)bVar14 * auVar113._44_4_ | (uint)!bVar14 * auVar132._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar149._48_4_ = (uint)bVar14 * auVar113._48_4_ | (uint)!bVar14 * auVar132._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar149._52_4_ = (uint)bVar14 * auVar113._52_4_ | (uint)!bVar14 * auVar132._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar149._56_4_ = (uint)bVar14 * auVar113._56_4_ | (uint)!bVar14 * auVar132._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar149._60_4_ = (uint)bVar14 * auVar113._60_4_ | (uint)!bVar14 * auVar132._60_4_;
            auVar113 = vxorps_avx512dq(auVar133,auVar137);
            auVar150._0_4_ =
                 (uint)(bVar13 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar133._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar150._4_4_ = (uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar133._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar150._8_4_ = (uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar133._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar150._12_4_ = (uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar133._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar150._16_4_ = (uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar133._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar150._20_4_ = (uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar133._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar150._24_4_ = (uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar133._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar150._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar133._28_4_;
            auVar150._32_4_ =
                 (uint)(bVar21 & 1) * auVar113._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar133._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar150._36_4_ = (uint)bVar14 * auVar113._36_4_ | (uint)!bVar14 * auVar133._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar150._40_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * auVar133._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar150._44_4_ = (uint)bVar14 * auVar113._44_4_ | (uint)!bVar14 * auVar133._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar150._48_4_ = (uint)bVar14 * auVar113._48_4_ | (uint)!bVar14 * auVar133._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar150._52_4_ = (uint)bVar14 * auVar113._52_4_ | (uint)!bVar14 * auVar133._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar150._56_4_ = (uint)bVar14 * auVar113._56_4_ | (uint)!bVar14 * auVar133._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar150._60_4_ = (uint)bVar14 * auVar113._60_4_ | (uint)!bVar14 * auVar133._60_4_;
            auVar113 = vxorps_avx512dq(auVar134,auVar137);
            auVar151._0_4_ =
                 (uint)(bVar13 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar134._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar151._4_4_ = (uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar134._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar151._8_4_ = (uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar134._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar151._12_4_ = (uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar134._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar151._16_4_ = (uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar134._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar151._20_4_ = (uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar134._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar151._24_4_ = (uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar134._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar151._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar134._28_4_;
            auVar151._32_4_ =
                 (uint)(bVar21 & 1) * auVar113._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar134._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar151._36_4_ = (uint)bVar14 * auVar113._36_4_ | (uint)!bVar14 * auVar134._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar151._40_4_ = (uint)bVar14 * auVar113._40_4_ | (uint)!bVar14 * auVar134._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar151._44_4_ = (uint)bVar14 * auVar113._44_4_ | (uint)!bVar14 * auVar134._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar151._48_4_ = (uint)bVar14 * auVar113._48_4_ | (uint)!bVar14 * auVar134._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar151._52_4_ = (uint)bVar14 * auVar113._52_4_ | (uint)!bVar14 * auVar134._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar151._56_4_ = (uint)bVar14 * auVar113._56_4_ | (uint)!bVar14 * auVar134._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar151._60_4_ = (uint)bVar14 * auVar113._60_4_ | (uint)!bVar14 * auVar134._60_4_;
            auVar113 = vxorps_avx512dq(auVar146,auVar137);
            bVar14 = (bool)((byte)uVar69 & 1);
            auVar152._0_4_ = (uint)bVar14 * auVar113._0_4_ | !bVar14 * auVar146._0_4_;
            bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar152._4_4_ = (uint)bVar14 * auVar113._4_4_ | !bVar14 * auVar146._4_4_;
            bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar152._8_4_ = (uint)bVar14 * auVar113._8_4_ | !bVar14 * auVar146._8_4_;
            bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar152._12_4_ = (uint)bVar14 * auVar113._12_4_ | !bVar14 * auVar146._12_4_;
            bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar152._16_4_ = (uint)bVar14 * auVar113._16_4_ | !bVar14 * auVar146._16_4_;
            bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar152._20_4_ = (uint)bVar14 * auVar113._20_4_ | !bVar14 * auVar146._20_4_;
            bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar152._24_4_ = (uint)bVar14 * auVar113._24_4_ | !bVar14 * auVar146._24_4_;
            bVar14 = (bool)((byte)(uVar69 >> 7) & 1);
            auVar152._28_4_ = (uint)bVar14 * auVar113._28_4_ | !bVar14 * auVar146._28_4_;
            bVar14 = (bool)((byte)(uVar69 >> 8) & 1);
            auVar152._32_4_ = (uint)bVar14 * auVar113._32_4_ | !bVar14 * auVar146._32_4_;
            bVar14 = (bool)((byte)(uVar69 >> 9) & 1);
            auVar152._36_4_ = (uint)bVar14 * auVar113._36_4_ | !bVar14 * auVar146._36_4_;
            bVar14 = (bool)((byte)(uVar69 >> 10) & 1);
            auVar152._40_4_ = (uint)bVar14 * auVar113._40_4_ | !bVar14 * auVar146._40_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xb) & 1);
            auVar152._44_4_ = (uint)bVar14 * auVar113._44_4_ | !bVar14 * auVar146._44_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xc) & 1);
            auVar152._48_4_ = (uint)bVar14 * auVar113._48_4_ | !bVar14 * auVar146._48_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xd) & 1);
            auVar152._52_4_ = (uint)bVar14 * auVar113._52_4_ | !bVar14 * auVar146._52_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xe) & 1);
            auVar152._56_4_ = (uint)bVar14 * auVar113._56_4_ | !bVar14 * auVar146._56_4_;
            bVar14 = SUB81(uVar69 >> 0xf,0);
            auVar152._60_4_ = (uint)bVar14 * auVar113._60_4_ | !bVar14 * auVar146._60_4_;
            auVar113 = vxorps_avx512dq(auVar147,auVar137);
            bVar14 = (bool)((byte)uVar28 & 1);
            auVar153._0_4_ = (uint)bVar14 * auVar113._0_4_ | !bVar14 * auVar147._0_4_;
            bVar14 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar153._4_4_ = (uint)bVar14 * auVar113._4_4_ | !bVar14 * auVar147._4_4_;
            bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar153._8_4_ = (uint)bVar14 * auVar113._8_4_ | !bVar14 * auVar147._8_4_;
            bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar153._12_4_ = (uint)bVar14 * auVar113._12_4_ | !bVar14 * auVar147._12_4_;
            bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar153._16_4_ = (uint)bVar14 * auVar113._16_4_ | !bVar14 * auVar147._16_4_;
            bVar14 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar153._20_4_ = (uint)bVar14 * auVar113._20_4_ | !bVar14 * auVar147._20_4_;
            bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar153._24_4_ = (uint)bVar14 * auVar113._24_4_ | !bVar14 * auVar147._24_4_;
            bVar14 = (bool)((byte)(uVar28 >> 7) & 1);
            auVar153._28_4_ = (uint)bVar14 * auVar113._28_4_ | !bVar14 * auVar147._28_4_;
            bVar14 = (bool)((byte)(uVar28 >> 8) & 1);
            auVar153._32_4_ = (uint)bVar14 * auVar113._32_4_ | !bVar14 * auVar147._32_4_;
            bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
            auVar153._36_4_ = (uint)bVar14 * auVar113._36_4_ | !bVar14 * auVar147._36_4_;
            bVar14 = (bool)((byte)(uVar28 >> 10) & 1);
            auVar153._40_4_ = (uint)bVar14 * auVar113._40_4_ | !bVar14 * auVar147._40_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xb) & 1);
            auVar153._44_4_ = (uint)bVar14 * auVar113._44_4_ | !bVar14 * auVar147._44_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xc) & 1);
            auVar153._48_4_ = (uint)bVar14 * auVar113._48_4_ | !bVar14 * auVar147._48_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xd) & 1);
            auVar153._52_4_ = (uint)bVar14 * auVar113._52_4_ | !bVar14 * auVar147._52_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xe) & 1);
            auVar153._56_4_ = (uint)bVar14 * auVar113._56_4_ | !bVar14 * auVar147._56_4_;
            bVar14 = SUB81(uVar28 >> 0xf,0);
            auVar153._60_4_ = (uint)bVar14 * auVar113._60_4_ | !bVar14 * auVar147._60_4_;
            auVar113 = vfmsub213ps_avx512f(auVar130,auVar139,auVar148);
            auVar132 = vfmsub213ps_avx512f(auVar83,auVar139,auVar149);
            auVar133 = vmulps_avx512f(auVar113,auVar113);
            auVar134 = vmulps_avx512f(auVar132,auVar132);
            auVar133 = vaddps_avx512f(auVar133,auVar134);
            auVar134 = vfmsub213ps_avx512f(auVar82,auVar139,auVar150);
            auVar135 = vmulps_avx512f(auVar134,auVar134);
            auVar133 = vaddps_avx512f(auVar135,auVar133);
            auVar135 = vfmsub213ps_avx512f(auVar122,auVar139,auVar151);
            auVar136 = vmulps_avx512f(auVar135,auVar135);
            auVar133 = vaddps_avx512f(auVar136,auVar133);
            auVar136 = vrsqrt14ps_avx512f(auVar133);
            auVar133 = vmulps_avx512f(auVar133,auVar144);
            auVar133 = vmulps_avx512f(auVar136,auVar133);
            auVar137 = vmulps_avx512f(auVar136,auVar136);
            auVar133 = vmulps_avx512f(auVar137,auVar133);
            auVar137 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
            auVar133 = vfmadd231ps_avx512f(auVar133,auVar137,auVar136);
            auVar113 = vmulps_avx512f(auVar113,auVar133);
            auVar132 = vmulps_avx512f(auVar132,auVar133);
            auVar134 = vmulps_avx512f(auVar134,auVar133);
            auVar133 = vmulps_avx512f(auVar135,auVar133);
            auVar113 = vmulps_avx512f(auVar113,auVar152);
            auVar132 = vmulps_avx512f(auVar132,auVar152);
            auVar134 = vmulps_avx512f(auVar134,auVar152);
            auVar133 = vmulps_avx512f(auVar133,auVar152);
            auVar113 = vfmsub231ps_avx512f(auVar113,auVar153,auVar130);
            auVar132 = vfmsub231ps_avx512f(auVar132,auVar153,auVar83);
            auVar134 = vfmsub231ps_avx512f(auVar134,auVar153,auVar82);
            auVar133 = vfmsub231ps_avx512f(auVar133,auVar122,auVar153);
            auVar135 = vsubps_avx512f(auVar148,auVar130);
            auVar130 = vfmadd213ps_avx512f(auVar135,auVar81,auVar130);
            auVar135 = vsubps_avx512f(auVar149,auVar83);
            auVar83 = vfmadd213ps_avx512f(auVar135,auVar81,auVar83);
            auVar135 = vsubps_avx512f(auVar150,auVar82);
            auVar82 = vfmadd213ps_avx512f(auVar135,auVar81,auVar82);
            auVar135 = vsubps_avx512f(auVar151,auVar122);
            auVar122 = vfmadd213ps_avx512f(auVar135,auVar81,auVar122);
            auVar135 = vmulps_avx512f(auVar130,auVar130);
            auVar136 = vmulps_avx512f(auVar83,auVar83);
            auVar135 = vaddps_avx512f(auVar135,auVar136);
            auVar136 = vmulps_avx512f(auVar82,auVar82);
            auVar135 = vaddps_avx512f(auVar136,auVar135);
            auVar136 = vmulps_avx512f(auVar122,auVar122);
            auVar135 = vaddps_avx512f(auVar136,auVar135);
            auVar136 = vmulps_avx512f(auVar135,auVar144);
            auVar135 = vrsqrt14ps_avx512f(auVar135);
            auVar136 = vmulps_avx512f(auVar135,auVar136);
            auVar138 = vmulps_avx512f(auVar135,auVar135);
            auVar136 = vmulps_avx512f(auVar138,auVar136);
            auVar135 = vfmadd231ps_avx512f(auVar136,auVar135,auVar137);
            auVar48._8_4_ = 0x3f7fdf3b;
            auVar48._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar48._12_4_ = 0x3f7fdf3b;
            auVar48._16_4_ = 0x3f7fdf3b;
            auVar48._20_4_ = 0x3f7fdf3b;
            auVar48._24_4_ = 0x3f7fdf3b;
            auVar48._28_4_ = 0x3f7fdf3b;
            auVar48._32_4_ = 0x3f7fdf3b;
            auVar48._36_4_ = 0x3f7fdf3b;
            auVar48._40_4_ = 0x3f7fdf3b;
            auVar48._44_4_ = 0x3f7fdf3b;
            auVar48._48_4_ = 0x3f7fdf3b;
            auVar48._52_4_ = 0x3f7fdf3b;
            auVar48._56_4_ = 0x3f7fdf3b;
            auVar48._60_4_ = 0x3f7fdf3b;
            uVar66 = vcmpps_avx512f(auVar139,auVar48,6);
            auVar130 = vmulps_avx512f(auVar130,auVar135);
            bVar13 = (byte)uVar66;
            auVar154._0_4_ =
                 (uint)(bVar13 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar113._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar154._4_4_ = (uint)bVar14 * auVar130._4_4_ | (uint)!bVar14 * auVar113._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar154._8_4_ = (uint)bVar14 * auVar130._8_4_ | (uint)!bVar14 * auVar113._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar154._12_4_ = (uint)bVar14 * auVar130._12_4_ | (uint)!bVar14 * auVar113._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar154._16_4_ = (uint)bVar14 * auVar130._16_4_ | (uint)!bVar14 * auVar113._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar154._20_4_ = (uint)bVar14 * auVar130._20_4_ | (uint)!bVar14 * auVar113._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar154._24_4_ = (uint)bVar14 * auVar130._24_4_ | (uint)!bVar14 * auVar113._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar154._28_4_ = (uint)bVar14 * auVar130._28_4_ | (uint)!bVar14 * auVar113._28_4_;
            bVar21 = (byte)(uVar66 >> 8);
            auVar154._32_4_ =
                 (uint)(bVar21 & 1) * auVar130._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar113._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar154._36_4_ = (uint)bVar14 * auVar130._36_4_ | (uint)!bVar14 * auVar113._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar154._40_4_ = (uint)bVar14 * auVar130._40_4_ | (uint)!bVar14 * auVar113._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar154._44_4_ = (uint)bVar14 * auVar130._44_4_ | (uint)!bVar14 * auVar113._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar154._48_4_ = (uint)bVar14 * auVar130._48_4_ | (uint)!bVar14 * auVar113._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar154._52_4_ = (uint)bVar14 * auVar130._52_4_ | (uint)!bVar14 * auVar113._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar154._56_4_ = (uint)bVar14 * auVar130._56_4_ | (uint)!bVar14 * auVar113._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar154._60_4_ = (uint)bVar14 * auVar130._60_4_ | (uint)!bVar14 * auVar113._60_4_;
            auVar83 = vmulps_avx512f(auVar83,auVar135);
            auVar155._0_4_ =
                 (uint)(bVar13 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar132._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar155._4_4_ = (uint)bVar14 * auVar83._4_4_ | (uint)!bVar14 * auVar132._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar155._8_4_ = (uint)bVar14 * auVar83._8_4_ | (uint)!bVar14 * auVar132._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar155._12_4_ = (uint)bVar14 * auVar83._12_4_ | (uint)!bVar14 * auVar132._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar155._16_4_ = (uint)bVar14 * auVar83._16_4_ | (uint)!bVar14 * auVar132._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar155._20_4_ = (uint)bVar14 * auVar83._20_4_ | (uint)!bVar14 * auVar132._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar155._24_4_ = (uint)bVar14 * auVar83._24_4_ | (uint)!bVar14 * auVar132._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar155._28_4_ = (uint)bVar14 * auVar83._28_4_ | (uint)!bVar14 * auVar132._28_4_;
            auVar155._32_4_ =
                 (uint)(bVar21 & 1) * auVar83._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar132._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar155._36_4_ = (uint)bVar14 * auVar83._36_4_ | (uint)!bVar14 * auVar132._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar155._40_4_ = (uint)bVar14 * auVar83._40_4_ | (uint)!bVar14 * auVar132._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar155._44_4_ = (uint)bVar14 * auVar83._44_4_ | (uint)!bVar14 * auVar132._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar155._48_4_ = (uint)bVar14 * auVar83._48_4_ | (uint)!bVar14 * auVar132._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar155._52_4_ = (uint)bVar14 * auVar83._52_4_ | (uint)!bVar14 * auVar132._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar155._56_4_ = (uint)bVar14 * auVar83._56_4_ | (uint)!bVar14 * auVar132._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar155._60_4_ = (uint)bVar14 * auVar83._60_4_ | (uint)!bVar14 * auVar132._60_4_;
            auVar83 = vbroadcastss_avx512f(in_ZMM20._0_16_);
            auVar82 = vmulps_avx512f(auVar82,auVar135);
            auVar156._0_4_ =
                 (uint)(bVar13 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar134._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar156._4_4_ = (uint)bVar14 * auVar82._4_4_ | (uint)!bVar14 * auVar134._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar156._8_4_ = (uint)bVar14 * auVar82._8_4_ | (uint)!bVar14 * auVar134._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar156._12_4_ = (uint)bVar14 * auVar82._12_4_ | (uint)!bVar14 * auVar134._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar156._16_4_ = (uint)bVar14 * auVar82._16_4_ | (uint)!bVar14 * auVar134._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar156._20_4_ = (uint)bVar14 * auVar82._20_4_ | (uint)!bVar14 * auVar134._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar156._24_4_ = (uint)bVar14 * auVar82._24_4_ | (uint)!bVar14 * auVar134._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar156._28_4_ = (uint)bVar14 * auVar82._28_4_ | (uint)!bVar14 * auVar134._28_4_;
            auVar156._32_4_ =
                 (uint)(bVar21 & 1) * auVar82._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar134._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar156._36_4_ = (uint)bVar14 * auVar82._36_4_ | (uint)!bVar14 * auVar134._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar156._40_4_ = (uint)bVar14 * auVar82._40_4_ | (uint)!bVar14 * auVar134._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar156._44_4_ = (uint)bVar14 * auVar82._44_4_ | (uint)!bVar14 * auVar134._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar156._48_4_ = (uint)bVar14 * auVar82._48_4_ | (uint)!bVar14 * auVar134._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar156._52_4_ = (uint)bVar14 * auVar82._52_4_ | (uint)!bVar14 * auVar134._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar156._56_4_ = (uint)bVar14 * auVar82._56_4_ | (uint)!bVar14 * auVar134._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar156._60_4_ = (uint)bVar14 * auVar82._60_4_ | (uint)!bVar14 * auVar134._60_4_;
            auVar82 = vpermps_avx512f(auVar85,in_ZMM20);
            auVar113 = vpermps_avx512f(auVar114,in_ZMM20);
            auVar122 = vmulps_avx512f(auVar122,auVar135);
            auVar157._0_4_ =
                 (uint)(bVar13 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar133._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar157._4_4_ = (uint)bVar14 * auVar122._4_4_ | (uint)!bVar14 * auVar133._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar157._8_4_ = (uint)bVar14 * auVar122._8_4_ | (uint)!bVar14 * auVar133._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar157._12_4_ = (uint)bVar14 * auVar122._12_4_ | (uint)!bVar14 * auVar133._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar157._16_4_ = (uint)bVar14 * auVar122._16_4_ | (uint)!bVar14 * auVar133._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar157._20_4_ = (uint)bVar14 * auVar122._20_4_ | (uint)!bVar14 * auVar133._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar157._24_4_ = (uint)bVar14 * auVar122._24_4_ | (uint)!bVar14 * auVar133._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar157._28_4_ = (uint)bVar14 * auVar122._28_4_ | (uint)!bVar14 * auVar133._28_4_;
            auVar157._32_4_ =
                 (uint)(bVar21 & 1) * auVar122._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar133._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar157._36_4_ = (uint)bVar14 * auVar122._36_4_ | (uint)!bVar14 * auVar133._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar157._40_4_ = (uint)bVar14 * auVar122._40_4_ | (uint)!bVar14 * auVar133._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar157._44_4_ = (uint)bVar14 * auVar122._44_4_ | (uint)!bVar14 * auVar133._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar157._48_4_ = (uint)bVar14 * auVar122._48_4_ | (uint)!bVar14 * auVar133._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar157._52_4_ = (uint)bVar14 * auVar122._52_4_ | (uint)!bVar14 * auVar133._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar157._56_4_ = (uint)bVar14 * auVar122._56_4_ | (uint)!bVar14 * auVar133._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar157._60_4_ = (uint)bVar14 * auVar122._60_4_ | (uint)!bVar14 * auVar133._60_4_;
            auVar122 = vbroadcastss_avx512f(in_ZMM23._0_16_);
            auVar130 = vpermps_avx512f(auVar85,in_ZMM23);
            auVar132 = vpermps_avx512f(auVar114,in_ZMM23);
            auVar133 = vsubps_avx512f(auVar141,auVar81);
            auVar83 = vmulps_avx512f(auVar81,auVar83);
            auVar83 = vfmadd213ps_avx512f(auVar84,auVar133,auVar83);
            auVar84 = vbroadcastss_avx512f(in_ZMM21._0_16_);
            auVar82 = vmulps_avx512f(auVar81,auVar82);
            auVar82 = vfmadd213ps_avx512f(auVar86,auVar133,auVar82);
            auVar86 = vpermps_avx512f(auVar85,in_ZMM21);
            auVar134 = vpermps_avx512f(auVar114,in_ZMM21);
            auVar85 = vpermps_avx512f(auVar85,in_ZMM22);
            auVar114 = vpermps_avx512f(auVar114,in_ZMM22);
            auVar135 = vbroadcastss_avx512f(in_ZMM22._0_16_);
            auVar113 = vmulps_avx512f(auVar81,auVar113);
            auVar116 = vfmadd213ps_avx512f(auVar116,auVar133,auVar113);
            auVar113 = vmulps_avx512f(auVar81,auVar122);
            auVar122 = vmulps_avx512f(auVar81,auVar130);
            auVar130 = vmulps_avx512f(auVar81,auVar132);
            auVar113 = vfmadd213ps_avx512f(auVar115,auVar133,auVar113);
            auVar115 = vfmadd213ps_avx512f(auVar117,auVar133,auVar122);
            auVar117 = vfmadd213ps_avx512f(auVar118,auVar133,auVar130);
            auVar84 = vmulps_avx512f(auVar81,auVar84);
            auVar86 = vmulps_avx512f(auVar81,auVar86);
            auVar118 = vmulps_avx512f(auVar81,auVar134);
            auVar84 = vfmadd213ps_avx512f(auVar119,auVar133,auVar84);
            auVar86 = vfmadd213ps_avx512f(auVar120,auVar133,auVar86);
            auVar118 = vfmadd213ps_avx512f(auVar121,auVar133,auVar118);
            auVar119 = vmulps_avx512f(auVar81,auVar135);
            auVar85 = vmulps_avx512f(auVar81,auVar85);
            auVar81 = vmulps_avx512f(auVar81,auVar114);
            auVar114 = vfmadd213ps_avx512f(auVar123,auVar133,auVar119);
            auVar85 = vfmadd213ps_avx512f(auVar124,auVar133,auVar85);
            auVar81 = vfmadd213ps_avx512f(auVar129,auVar133,auVar81);
            auVar119 = vmulps_avx512f(auVar154,auVar154);
            auVar120 = vmulps_avx512f(auVar155,auVar155);
            auVar121 = vaddps_avx512f(auVar119,auVar120);
            auVar122 = vmulps_avx512f(auVar156,auVar156);
            auVar121 = vsubps_avx512f(auVar121,auVar122);
            auVar123 = vmulps_avx512f(auVar157,auVar157);
            auVar121 = vsubps_avx512f(auVar121,auVar123);
            auVar124 = vmulps_avx512f(auVar155,auVar156);
            auVar129 = vmulps_avx512f(auVar154,auVar157);
            auVar130 = vaddps_avx512f(auVar124,auVar129);
            auVar130 = vaddps_avx512f(auVar130,auVar130);
            auVar132 = vmulps_avx512f(auVar155,auVar157);
            auVar133 = vmulps_avx512f(auVar154,auVar156);
            auVar134 = vsubps_avx512f(auVar132,auVar133);
            auVar134 = vaddps_avx512f(auVar134,auVar134);
            auVar124 = vsubps_avx512f(auVar124,auVar129);
            auVar124 = vaddps_avx512f(auVar124,auVar124);
            auVar119 = vsubps_avx512f(auVar119,auVar120);
            auVar120 = vaddps_avx512f(auVar122,auVar119);
            auVar120 = vsubps_avx512f(auVar120,auVar123);
            auVar129 = vmulps_avx512f(auVar156,auVar157);
            auVar136 = vmulps_avx512f(auVar154,auVar155);
            auVar137 = vaddps_avx512f(auVar129,auVar136);
            auVar137 = vaddps_avx512f(auVar137,auVar137);
            auVar132 = vaddps_avx512f(auVar132,auVar133);
            auVar132 = vaddps_avx512f(auVar132,auVar132);
            auVar129 = vsubps_avx512f(auVar129,auVar136);
            auVar129 = vaddps_avx512f(auVar129,auVar129);
            auVar119 = vsubps_avx512f(auVar119,auVar122);
            auVar119 = vaddps_avx512f(auVar123,auVar119);
            auVar122 = vmulps_avx512f(auVar134,auVar209);
            auVar75 = vxorps_avx512vl(auVar135._0_16_,auVar135._0_16_);
            auVar123 = vfmadd213ps_avx512f(ZEXT1664(auVar75),auVar130,auVar122);
            auVar122 = vaddps_avx512f(auVar130,auVar122);
            auVar130 = vfmadd213ps_avx512f(auVar130,auVar209,auVar134);
            auVar122 = vfmadd231ps_avx512f(auVar122,auVar121,auVar209);
            auVar130 = vfmadd231ps_avx512f(auVar130,auVar209,auVar121);
            auVar133 = vmulps_avx512f(auVar137,auVar209);
            auVar134 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar120,auVar133);
            auVar133 = vaddps_avx512f(auVar120,auVar133);
            auVar120 = vfmadd213ps_avx512f(auVar120,auVar209,auVar137);
            auVar134 = vaddps_avx512f(auVar124,auVar134);
            auVar133 = vfmadd231ps_avx512f(auVar133,auVar124,auVar209);
            auVar120 = vfmadd231ps_avx512f(auVar120,auVar209,auVar124);
            auVar124 = vmulps_avx512f(auVar119,auVar209);
            auVar135 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar129,auVar124);
            auVar124 = vaddps_avx512f(auVar129,auVar124);
            auVar119 = vfmadd213ps_avx512f(auVar129,auVar209,auVar119);
            auVar129 = vaddps_avx512f(auVar132,auVar135);
            auVar124 = vfmadd231ps_avx512f(auVar124,auVar132,auVar209);
            auVar119 = vfmadd231ps_avx512f(auVar119,auVar209,auVar132);
            auVar82 = vaddps_avx512f(auVar82,auVar209);
            auVar116 = vaddps_avx512f(auVar116,auVar209);
            auVar117 = vaddps_avx512f(auVar117,auVar209);
            auVar135 = vmulps_avx512f(auVar129,auVar209);
            auVar136 = vmulps_avx512f(auVar124,auVar209);
            auVar137 = vmulps_avx512f(auVar119,auVar209);
            auVar138 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar134,auVar135);
            auVar75 = vxorps_avx512vl(auVar132._0_16_,auVar132._0_16_);
            auVar132 = vfmadd213ps_avx512f(ZEXT1664(auVar75),auVar133,auVar136);
            auVar139 = vfmadd213ps_avx512f(auVar209,auVar120,auVar137);
            auVar135 = vfmadd231ps_avx512f(auVar135,auVar115,auVar134);
            auVar136 = vfmadd231ps_avx512f(auVar136,auVar115,auVar133);
            auVar115 = vfmadd213ps_avx512f(auVar115,auVar120,auVar137);
            auVar137 = vmulps_avx512f(auVar118,auVar129);
            auVar140 = vmulps_avx512f(auVar118,auVar124);
            auVar118 = vmulps_avx512f(auVar118,auVar119);
            auVar137 = vfmadd231ps_avx512f(auVar137,auVar86,auVar134);
            auVar140 = vfmadd231ps_avx512f(auVar140,auVar86,auVar133);
            auVar86 = vfmadd231ps_avx512f(auVar118,auVar120,auVar86);
            auVar118 = vmulps_avx512f(auVar81,auVar129);
            auVar124 = vmulps_avx512f(auVar81,auVar124);
            auVar81 = vmulps_avx512f(auVar81,auVar119);
            auVar118 = vfmadd231ps_avx512f(auVar118,auVar85,auVar134);
            auVar119 = vfmadd231ps_avx512f(auVar124,auVar85,auVar133);
            auVar81 = vfmadd231ps_avx512f(auVar81,auVar85,auVar120);
            auVar85 = vaddps_avx512f(auVar121,auVar123);
            auVar120 = vfmadd231ps_avx512f(auVar138,auVar83,auVar85);
            auVar121 = vfmadd231ps_avx512f(auVar132,auVar83,auVar122);
            auVar83 = vfmadd231ps_avx512f(auVar139,auVar130,auVar83);
            auVar123 = vfmadd231ps_avx512f(auVar135,auVar113,auVar85);
            auVar124 = vfmadd231ps_avx512f(auVar136,auVar113,auVar122);
            auVar113 = vfmadd231ps_avx512f(auVar115,auVar130,auVar113);
            auVar129 = vfmadd231ps_avx512f(auVar137,auVar84,auVar85);
            auVar132 = vfmadd231ps_avx512f(auVar140,auVar84,auVar122);
            auVar84 = vfmadd231ps_avx512f(auVar86,auVar130,auVar84);
            auVar85 = vfmadd231ps_avx512f(auVar118,auVar114,auVar85);
            auVar115 = vaddps_avx512f(auVar82,auVar85);
            auVar82 = vfmadd231ps_avx512f(auVar119,auVar114,auVar122);
            auVar119 = vaddps_avx512f(auVar116,auVar82);
            auVar81 = vfmadd231ps_avx512f(auVar81,auVar114,auVar130);
            auVar117 = vaddps_avx512f(auVar117,auVar81);
            auVar81 = vmulps_avx512f(auVar132,auVar113);
            auVar81 = vfmsub231ps_avx512f(auVar81,auVar124,auVar84);
            auVar82 = vmulps_avx512f(auVar84,auVar123);
            auVar85 = vfmsub231ps_avx512f(auVar82,auVar113,auVar129);
            auVar82 = vmulps_avx512f(auVar129,auVar124);
            auVar114 = vfmsub231ps_avx512f(auVar82,auVar123,auVar132);
            auVar82 = vmulps_avx512f(auVar83,auVar129);
            auVar86 = vfmsub231ps_avx512f(auVar82,auVar120,auVar84);
            auVar82 = vmulps_avx512f(auVar121,auVar84);
            auVar82 = vfmsub231ps_avx512f(auVar82,auVar132,auVar83);
            auVar84 = vmulps_avx512f(auVar120,auVar132);
            auVar116 = vfmsub231ps_avx512f(auVar84,auVar121,auVar129);
            auVar84 = vmulps_avx512f(auVar124,auVar83);
            auVar84 = vfmsub231ps_avx512f(auVar84,auVar121,auVar113);
            auVar113 = vmulps_avx512f(auVar113,auVar120);
            auVar113 = vfmsub231ps_avx512f(auVar113,auVar83,auVar123);
            auVar118 = vmulps_avx512f(auVar123,auVar121);
            auVar118 = vfmsub231ps_avx512f(auVar118,auVar120,auVar124);
            auVar83 = vmulps_avx512f(auVar83,auVar114);
            auVar83 = vfmadd231ps_avx512f(auVar83,auVar85,auVar121);
            auVar120 = vfmadd231ps_avx512f(auVar83,auVar81,auVar120);
            auVar81 = vdivps_avx512f(auVar81,auVar120);
            auVar83 = vdivps_avx512f(auVar82,auVar120);
            auVar82 = vdivps_avx512f(auVar84,auVar120);
            auVar84 = vdivps_avx512f(auVar85,auVar120);
            auVar85 = vdivps_avx512f(auVar86,auVar120);
            auVar86 = vdivps_avx512f(auVar113,auVar120);
            auVar114 = vdivps_avx512f(auVar114,auVar120);
            auVar116 = vdivps_avx512f(auVar116,auVar120);
            auVar113 = vdivps_avx512f(auVar118,auVar120);
            auVar118 = vmulps_avx512f(auVar117,auVar114);
            auVar120 = vmulps_avx512f(auVar117,auVar116);
            auVar121 = vmulps_avx512f(auVar117,auVar113);
            auVar117 = vfmadd231ps_avx512f(auVar118,auVar119,auVar84);
            auVar118 = vfmadd231ps_avx512f(auVar120,auVar119,auVar85);
            auVar119 = vfmadd231ps_avx512f(auVar121,auVar86,auVar119);
          }
          else {
            lVar12 = *(long *)&pGVar10[1].fnumTimeSegments;
            uVar69 = uVar65;
            auVar84 = auVar83;
            auVar85 = ZEXT1664(ZEXT816(0) << 0x40);
            do {
              uVar70 = 0;
              uVar68 = (uint)uVar69;
              for (uVar8 = uVar68; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
                uVar70 = uVar70 + 1;
              }
              lVar71 = (long)*(int *)(local_300 + (ulong)uVar70 * 4) * 0x38;
              plVar1 = (long *)(lVar12 + lVar71);
              iVar9 = *(int *)(lVar12 + 0x20 + lVar71);
              if (iVar9 == 0x9134) {
                lVar72 = *plVar1;
                lVar73 = plVar1[2] * uVar66;
                auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + lVar73)),
                                        ZEXT416(*(uint *)(lVar72 + 0x10 + lVar73)),0x1c);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x20 + lVar73)),0x28);
                in_ZMM5 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 4 + lVar73)),
                                        ZEXT416(*(uint *)(lVar72 + 0x14 + lVar73)),0x1c);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x24 + lVar73)),0x28);
                in_ZMM7 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 8 + lVar73)),
                                        ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)),0x1c);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x28 + lVar73)),0x28);
                in_ZMM8 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                        ZEXT416(*(uint *)(lVar72 + 0x1c + lVar73)),0x1c);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x2c + lVar73)),0x28);
                auVar84 = ZEXT1664(auVar75);
              }
              else {
                auVar86._16_48_ = auVar83._16_48_;
                if (iVar9 == 0x9234) {
                  lVar72 = *plVar1;
                  lVar73 = plVar1[2] * uVar66;
                  auVar75._8_8_ = 0;
                  auVar75._0_8_ = *(ulong *)(lVar72 + 4 + lVar73);
                  auVar76._8_8_ = 0;
                  auVar76._0_8_ = *(ulong *)(lVar72 + 0x10 + lVar73);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + lVar73)),_DAT_02060e80,
                                               auVar75);
                  in_ZMM5 = ZEXT1664(auVar75);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                               _DAT_02060e80,auVar76);
                  in_ZMM7 = ZEXT1664(auVar75);
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = *(ulong *)(lVar72 + 0x1c + lVar73);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)),
                                               _DAT_02060e80,auVar80);
                  in_ZMM8 = ZEXT1664(auVar75);
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = *(ulong *)(lVar72 + 0x28 + lVar73);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0x24 + lVar73)),
                                               _DAT_02060e80,auVar77);
                  auVar84 = ZEXT1664(auVar75);
                }
                else if (iVar9 == 0xb001) {
                  lVar72 = *plVar1;
                  lVar73 = plVar1[2] * uVar66;
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = *(ulong *)(lVar72 + 0x10 + lVar73);
                  auVar80 = vinsertps_avx512f(auVar78,ZEXT416(*(uint *)(lVar72 + 8 + lVar73)),0x20);
                  in_ZMM17 = ZEXT1664(auVar80);
                  auVar192._8_8_ = 0;
                  auVar192._0_8_ = *(ulong *)(lVar72 + 0x34 + lVar73);
                  auVar76 = vpermt2ps_avx512vl(auVar192,_DAT_02060e90,
                                               ZEXT416(*(uint *)(lVar72 + lVar73)));
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = *(ulong *)(lVar72 + 0x1c + lVar73);
                  auVar77 = vpermt2ps_avx512vl(auVar79,_DAT_02060e90,
                                               ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)));
                  fVar2 = *(float *)(lVar72 + 0x24 + lVar73);
                  fVar3 = *(float *)(lVar72 + 0x28 + lVar73);
                  fVar4 = *(float *)(lVar72 + 0x2c + lVar73);
                  fVar5 = *(float *)(lVar72 + 0x30 + lVar73);
                  auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                            ZEXT416((uint)fVar2));
                  auVar75 = vfmadd231ss_fma(auVar75,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
                  auVar75 = vfmadd231ss_fma(auVar75,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
                  auVar86._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
                  auVar84._4_60_ = auVar86._4_60_;
                  auVar84._0_4_ = auVar75._0_4_;
                  auVar78 = vrsqrt14ss_avx512f(auVar86._0_16_,auVar84._0_16_);
                  auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                  in_ZMM16 = ZEXT1664(auVar79);
                  fVar197 = auVar78._0_4_;
                  auVar75 = vaddss_avx512f(auVar79,ZEXT416((uint)(fVar197 * fVar197 *
                                                                 fVar197 * auVar75._0_4_ * -0.5)));
                  fVar197 = auVar75._0_4_;
                  auVar75 = vinsertps_avx(auVar77,ZEXT416((uint)(fVar2 * fVar197)),0x30);
                  auVar84 = ZEXT1664(auVar75);
                  auVar75 = vinsertps_avx(auVar76,ZEXT416((uint)(fVar3 * fVar197)),0x30);
                  in_ZMM5 = ZEXT1664(auVar75);
                  auVar75 = vinsertps_avx512f(auVar80,ZEXT416((uint)(fVar5 * fVar197)),0x30);
                  in_ZMM8 = ZEXT1664(auVar75);
                  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                          ZEXT416(*(uint *)(lVar72 + 4 + lVar73)),0x10);
                  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x3c + lVar73)),0x20);
                  auVar75 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar4 * fVar197)),0x30);
                  in_ZMM7 = ZEXT1664(auVar75);
                }
                else if (iVar9 == 0x9244) {
                  lVar72 = *plVar1;
                  lVar73 = plVar1[2] * uVar66;
                  in_ZMM5 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + lVar73));
                  in_ZMM7 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + 0x10 + lVar73));
                  in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + 0x20 + lVar73));
                  auVar84 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + 0x30 + lVar73));
                }
              }
              auVar83 = vpbroadcastd_avx512f();
              uVar29 = vpcmpeqd_avx512f(auVar83,auVar82);
              iVar9 = *(int *)(lVar12 + 0x58 + lVar71);
              if (iVar9 == 0x9134) {
                lVar71 = plVar1[7];
                lVar72 = plVar1[9] * uVar66;
                auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar71 + lVar72)),
                                        ZEXT416(*(uint *)(lVar71 + 0x10 + lVar72)),0x1c);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar71 + 0x20 + lVar72)),0x28);
                in_ZMM6 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar71 + 4 + lVar72)),
                                        ZEXT416(*(uint *)(lVar71 + 0x14 + lVar72)),0x1c);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar71 + 0x24 + lVar72)),0x28);
                in_ZMM9 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar71 + 8 + lVar72)),
                                        ZEXT416(*(uint *)(lVar71 + 0x18 + lVar72)),0x1c);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar71 + 0x28 + lVar72)),0x28);
                in_ZMM4 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar71 + 0xc + lVar72)),
                                        ZEXT416(*(uint *)(lVar71 + 0x1c + lVar72)),0x1c);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar71 + 0x2c + lVar72)),0x28);
                in_ZMM10 = ZEXT1664(auVar75);
              }
              else {
                auVar114._16_48_ = auVar83._16_48_;
                if (iVar9 == 0x9234) {
                  lVar71 = plVar1[7];
                  lVar72 = plVar1[9] * uVar66;
                  auVar185._8_8_ = 0;
                  auVar185._0_8_ = *(ulong *)(lVar71 + 4 + lVar72);
                  auVar204._8_8_ = 0;
                  auVar204._0_8_ = *(ulong *)(lVar71 + 0x10 + lVar72);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar71 + lVar72)),_DAT_02060e80,
                                               auVar185);
                  in_ZMM6 = ZEXT1664(auVar75);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar71 + 0xc + lVar72)),
                                               _DAT_02060e80,auVar204);
                  in_ZMM9 = ZEXT1664(auVar75);
                  auVar205._8_8_ = 0;
                  auVar205._0_8_ = *(ulong *)(lVar71 + 0x1c + lVar72);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar71 + 0x18 + lVar72)),
                                               _DAT_02060e80,auVar205);
                  in_ZMM4 = ZEXT1664(auVar75);
                  auVar207._8_8_ = 0;
                  auVar207._0_8_ = *(ulong *)(lVar71 + 0x28 + lVar72);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar71 + 0x24 + lVar72)),
                                               _DAT_02060e80,auVar207);
                  in_ZMM10 = ZEXT1664(auVar75);
                }
                else if (iVar9 == 0xb001) {
                  lVar71 = plVar1[7];
                  lVar72 = plVar1[9] * uVar66;
                  auVar186._8_8_ = 0;
                  auVar186._0_8_ = *(ulong *)(lVar71 + 0x10 + lVar72);
                  auVar75 = vinsertps_avx(auVar186,ZEXT416(*(uint *)(lVar71 + 8 + lVar72)),0x20);
                  auVar196._8_8_ = 0;
                  auVar196._0_8_ = *(ulong *)(lVar71 + 0x34 + lVar72);
                  auVar76 = vpermt2ps_avx512vl(auVar196,_DAT_02060e90,
                                               ZEXT416(*(uint *)(lVar71 + lVar72)));
                  auVar199._8_8_ = 0;
                  auVar199._0_8_ = *(ulong *)(lVar71 + 0x1c + lVar72);
                  auVar77 = vpermt2ps_avx512vl(auVar199,_DAT_02060e90,
                                               ZEXT416(*(uint *)(lVar71 + 0x18 + lVar72)));
                  fVar2 = *(float *)(lVar71 + 0x24 + lVar72);
                  fVar3 = *(float *)(lVar71 + 0x28 + lVar72);
                  fVar4 = *(float *)(lVar71 + 0x2c + lVar72);
                  fVar5 = *(float *)(lVar71 + 0x30 + lVar72);
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                            ZEXT416((uint)fVar2));
                  auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
                  auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
                  auVar114._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
                  auVar116._4_60_ = auVar114._4_60_;
                  auVar116._0_4_ = auVar80._0_4_;
                  auVar78 = vrsqrt14ss_avx512f(auVar114._0_16_,auVar116._0_16_);
                  auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                  in_ZMM17 = ZEXT1664(auVar79);
                  auVar80 = vmulss_avx512f(auVar78,ZEXT416((uint)(auVar80._0_4_ * -0.5)));
                  auVar78 = vmulss_avx512f(auVar78,auVar78);
                  in_ZMM16 = ZEXT1664(auVar78);
                  auVar80 = vmulss_avx512f(auVar78,auVar80);
                  auVar80 = vaddss_avx512f(auVar79,auVar80);
                  fVar197 = auVar80._0_4_;
                  auVar80 = vinsertps_avx(auVar77,ZEXT416((uint)(fVar2 * fVar197)),0x30);
                  in_ZMM10 = ZEXT1664(auVar80);
                  auVar80 = vinsertps_avx(auVar76,ZEXT416((uint)(fVar3 * fVar197)),0x30);
                  in_ZMM6 = ZEXT1664(auVar80);
                  auVar75 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar5 * fVar197)),0x30);
                  in_ZMM4 = ZEXT1664(auVar75);
                  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar71 + 0xc + lVar72)),
                                          ZEXT416(*(uint *)(lVar71 + 4 + lVar72)),0x10);
                  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar71 + 0x3c + lVar72)),0x20);
                  auVar75 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar4 * fVar197)),0x30);
                  in_ZMM9 = ZEXT1664(auVar75);
                }
                else if (iVar9 == 0x9244) {
                  lVar71 = plVar1[7];
                  lVar72 = plVar1[9] * uVar66;
                  in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar71 + lVar72));
                  in_ZMM9 = ZEXT1664(*(undefined1 (*) [16])(lVar71 + 0x10 + lVar72));
                  in_ZMM4 = ZEXT1664(*(undefined1 (*) [16])(lVar71 + 0x20 + lVar72));
                  in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar71 + 0x30 + lVar72));
                }
              }
              uVar70 = (uint)uVar29 & uVar68;
              uVar69 = (ulong)(~uVar70 & uVar68);
              auVar83 = vbroadcastss_avx512f(in_ZMM5._0_16_);
              bVar13 = (byte)uVar70;
              auVar113._0_4_ =
                   (uint)(bVar13 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM18._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar113._4_4_ = (uint)bVar14 * auVar83._4_4_ | (uint)!bVar14 * in_ZMM18._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar113._8_4_ = (uint)bVar14 * auVar83._8_4_ | (uint)!bVar14 * in_ZMM18._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar113._12_4_ = (uint)bVar14 * auVar83._12_4_ | (uint)!bVar14 * in_ZMM18._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar113._16_4_ = (uint)bVar14 * auVar83._16_4_ | (uint)!bVar14 * in_ZMM18._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar113._20_4_ = (uint)bVar14 * auVar83._20_4_ | (uint)!bVar14 * in_ZMM18._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar113._24_4_ = (uint)bVar14 * auVar83._24_4_ | (uint)!bVar14 * in_ZMM18._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar113._28_4_ = (uint)bVar14 * auVar83._28_4_ | (uint)!bVar14 * in_ZMM18._28_4_;
              bVar21 = (byte)(uVar70 >> 8);
              auVar113._32_4_ =
                   (uint)(bVar21 & 1) * auVar83._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM18._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar113._36_4_ = (uint)bVar14 * auVar83._36_4_ | (uint)!bVar14 * in_ZMM18._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar113._40_4_ = (uint)bVar14 * auVar83._40_4_ | (uint)!bVar14 * in_ZMM18._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar113._44_4_ = (uint)bVar14 * auVar83._44_4_ | (uint)!bVar14 * in_ZMM18._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar113._48_4_ = (uint)bVar14 * auVar83._48_4_ | (uint)!bVar14 * in_ZMM18._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar113._52_4_ = (uint)bVar14 * auVar83._52_4_ | (uint)!bVar14 * in_ZMM18._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar113._56_4_ = (uint)bVar14 * auVar83._56_4_ | (uint)!bVar14 * in_ZMM18._56_4_;
              auVar113._60_4_ =
                   (uVar70 >> 0xf) * auVar83._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM18._60_4_;
              auVar83 = vbroadcastss_avx512f(ZEXT416(1));
              auVar86 = vpermps_avx512f(auVar83,in_ZMM5);
              local_2c0 = (uint)(bVar13 & 1) * auVar86._0_4_ | !(bool)(bVar13 & 1) * local_2c0;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              uStack_2bc = (uint)bVar14 * auVar86._4_4_ | !bVar14 * uStack_2bc;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              uStack_2b8 = (uint)bVar14 * auVar86._8_4_ | !bVar14 * uStack_2b8;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              uStack_2b4 = (uint)bVar14 * auVar86._12_4_ | !bVar14 * uStack_2b4;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              uStack_2b0 = (uint)bVar14 * auVar86._16_4_ | !bVar14 * uStack_2b0;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              uStack_2ac = (uint)bVar14 * auVar86._20_4_ | !bVar14 * uStack_2ac;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              uStack_2a8 = (uint)bVar14 * auVar86._24_4_ | !bVar14 * uStack_2a8;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              uStack_2a4 = (uint)bVar14 * auVar86._28_4_ | !bVar14 * uStack_2a4;
              uStack_2a0 = (uint)(bVar21 & 1) * auVar86._32_4_ | !(bool)(bVar21 & 1) * uStack_2a0;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              uStack_29c = (uint)bVar14 * auVar86._36_4_ | !bVar14 * uStack_29c;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              uStack_298 = (uint)bVar14 * auVar86._40_4_ | !bVar14 * uStack_298;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              uStack_294 = (uint)bVar14 * auVar86._44_4_ | !bVar14 * uStack_294;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              uStack_290 = (uint)bVar14 * auVar86._48_4_ | !bVar14 * uStack_290;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              uStack_28c = (uint)bVar14 * auVar86._52_4_ | !bVar14 * uStack_28c;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              uStack_288 = (uint)bVar14 * auVar86._56_4_ | !bVar14 * uStack_288;
              uStack_284 = (uVar70 >> 0xf) * auVar86._60_4_ | !SUB41(uVar70 >> 0xf,0) * uStack_284;
              auVar86 = vbroadcastss_avx512f(ZEXT416(2));
              auVar114 = vpermps_avx512f(auVar86,in_ZMM5);
              local_280 = (uint)(bVar13 & 1) * auVar114._0_4_ | !(bool)(bVar13 & 1) * local_280;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              uStack_27c = (uint)bVar14 * auVar114._4_4_ | !bVar14 * uStack_27c;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              uStack_278 = (uint)bVar14 * auVar114._8_4_ | !bVar14 * uStack_278;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              uStack_274 = (uint)bVar14 * auVar114._12_4_ | !bVar14 * uStack_274;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              uStack_270 = (uint)bVar14 * auVar114._16_4_ | !bVar14 * uStack_270;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              uStack_26c = (uint)bVar14 * auVar114._20_4_ | !bVar14 * uStack_26c;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              uStack_268 = (uint)bVar14 * auVar114._24_4_ | !bVar14 * uStack_268;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              uStack_264 = (uint)bVar14 * auVar114._28_4_ | !bVar14 * uStack_264;
              uStack_260 = (uint)(bVar21 & 1) * auVar114._32_4_ | !(bool)(bVar21 & 1) * uStack_260;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              uStack_25c = (uint)bVar14 * auVar114._36_4_ | !bVar14 * uStack_25c;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              uStack_258 = (uint)bVar14 * auVar114._40_4_ | !bVar14 * uStack_258;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              uStack_254 = (uint)bVar14 * auVar114._44_4_ | !bVar14 * uStack_254;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              uStack_250 = (uint)bVar14 * auVar114._48_4_ | !bVar14 * uStack_250;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              uStack_24c = (uint)bVar14 * auVar114._52_4_ | !bVar14 * uStack_24c;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              uStack_248 = (uint)bVar14 * auVar114._56_4_ | !bVar14 * uStack_248;
              uStack_244 = (uVar70 >> 0xf) * auVar114._60_4_ | !SUB41(uVar70 >> 0xf,0) * uStack_244;
              auVar114 = vbroadcastss_avx512f(ZEXT416(3));
              auVar116 = vpermps_avx512f(auVar114,in_ZMM5);
              auVar115._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM28._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar115._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM28._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar115._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM28._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar115._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM28._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar115._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM28._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar115._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM28._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar115._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM28._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar115._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM28._28_4_;
              auVar115._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM28._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar115._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM28._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar115._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM28._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar115._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM28._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar115._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM28._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar115._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM28._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar115._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM28._56_4_;
              auVar115._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM28._60_4_;
              auVar116 = vbroadcastss_avx512f(in_ZMM7._0_16_);
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar70 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar70 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar70 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar70 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar70 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar70 >> 0xe) & 1);
              local_400._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * local_400._4_4_;
              local_400._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * local_400._0_4_
              ;
              local_400._8_4_ = (uint)bVar15 * auVar116._8_4_ | (uint)!bVar15 * local_400._8_4_;
              local_400._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * local_400._12_4_;
              local_400._16_4_ = (uint)bVar17 * auVar116._16_4_ | (uint)!bVar17 * local_400._16_4_;
              local_400._20_4_ = (uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * local_400._20_4_;
              local_400._24_4_ = (uint)bVar19 * auVar116._24_4_ | (uint)!bVar19 * local_400._24_4_;
              local_400._28_4_ = (uint)bVar20 * auVar116._28_4_ | (uint)!bVar20 * local_400._28_4_;
              local_400._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_400._32_4_;
              local_400._36_4_ = (uint)bVar22 * auVar116._36_4_ | (uint)!bVar22 * local_400._36_4_;
              local_400._40_4_ = (uint)bVar23 * auVar116._40_4_ | (uint)!bVar23 * local_400._40_4_;
              local_400._44_4_ = (uint)bVar24 * auVar116._44_4_ | (uint)!bVar24 * local_400._44_4_;
              local_400._48_4_ = (uint)bVar25 * auVar116._48_4_ | (uint)!bVar25 * local_400._48_4_;
              local_400._52_4_ = (uint)bVar26 * auVar116._52_4_ | (uint)!bVar26 * local_400._52_4_;
              local_400._56_4_ = (uint)bVar27 * auVar116._56_4_ | (uint)!bVar27 * local_400._56_4_;
              local_400._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * local_400._60_4_;
              auVar116 = vpermps_avx512f(auVar83,in_ZMM7);
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar70 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar70 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar70 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar70 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar70 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar70 >> 0xe) & 1);
              local_480._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * local_480._4_4_;
              local_480._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * local_480._0_4_
              ;
              local_480._8_4_ = (uint)bVar15 * auVar116._8_4_ | (uint)!bVar15 * local_480._8_4_;
              local_480._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * local_480._12_4_;
              local_480._16_4_ = (uint)bVar17 * auVar116._16_4_ | (uint)!bVar17 * local_480._16_4_;
              local_480._20_4_ = (uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * local_480._20_4_;
              local_480._24_4_ = (uint)bVar19 * auVar116._24_4_ | (uint)!bVar19 * local_480._24_4_;
              local_480._28_4_ = (uint)bVar20 * auVar116._28_4_ | (uint)!bVar20 * local_480._28_4_;
              local_480._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_480._32_4_;
              local_480._36_4_ = (uint)bVar22 * auVar116._36_4_ | (uint)!bVar22 * local_480._36_4_;
              local_480._40_4_ = (uint)bVar23 * auVar116._40_4_ | (uint)!bVar23 * local_480._40_4_;
              local_480._44_4_ = (uint)bVar24 * auVar116._44_4_ | (uint)!bVar24 * local_480._44_4_;
              local_480._48_4_ = (uint)bVar25 * auVar116._48_4_ | (uint)!bVar25 * local_480._48_4_;
              local_480._52_4_ = (uint)bVar26 * auVar116._52_4_ | (uint)!bVar26 * local_480._52_4_;
              local_480._56_4_ = (uint)bVar27 * auVar116._56_4_ | (uint)!bVar27 * local_480._56_4_;
              local_480._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * local_480._60_4_;
              auVar116 = vpermps_avx512f(auVar86,in_ZMM7);
              local_340 = (uint)(bVar13 & 1) * auVar116._0_4_ | !(bool)(bVar13 & 1) * local_340;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              uStack_33c = (uint)bVar14 * auVar116._4_4_ | !bVar14 * uStack_33c;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              uStack_338 = (uint)bVar14 * auVar116._8_4_ | !bVar14 * uStack_338;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              uStack_334 = (uint)bVar14 * auVar116._12_4_ | !bVar14 * uStack_334;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              uStack_330 = (uint)bVar14 * auVar116._16_4_ | !bVar14 * uStack_330;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              uStack_32c = (uint)bVar14 * auVar116._20_4_ | !bVar14 * uStack_32c;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              uStack_328 = (uint)bVar14 * auVar116._24_4_ | !bVar14 * uStack_328;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              uStack_324 = (uint)bVar14 * auVar116._28_4_ | !bVar14 * uStack_324;
              uStack_320 = (uint)(bVar21 & 1) * auVar116._32_4_ | !(bool)(bVar21 & 1) * uStack_320;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              uStack_31c = (uint)bVar14 * auVar116._36_4_ | !bVar14 * uStack_31c;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              uStack_318 = (uint)bVar14 * auVar116._40_4_ | !bVar14 * uStack_318;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              uStack_314 = (uint)bVar14 * auVar116._44_4_ | !bVar14 * uStack_314;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              uStack_310 = (uint)bVar14 * auVar116._48_4_ | !bVar14 * uStack_310;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              uStack_30c = (uint)bVar14 * auVar116._52_4_ | !bVar14 * uStack_30c;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              uStack_308 = (uint)bVar14 * auVar116._56_4_ | !bVar14 * uStack_308;
              uStack_304 = (uVar70 >> 0xf) * auVar116._60_4_ | !SUB41(uVar70 >> 0xf,0) * uStack_304;
              auVar116 = vpermps_avx512f(auVar114,in_ZMM7);
              auVar117._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM26._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar117._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM26._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar117._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM26._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar117._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM26._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar117._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM26._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar117._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM26._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar117._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM26._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar117._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM26._28_4_;
              auVar117._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM26._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar117._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM26._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar117._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM26._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar117._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM26._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar117._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM26._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar117._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM26._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar117._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM26._56_4_;
              auVar117._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM26._60_4_;
              auVar116 = vbroadcastss_avx512f(in_ZMM8._0_16_);
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar70 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar70 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar70 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar70 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar70 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar70 >> 0xe) & 1);
              local_500._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * local_500._4_4_;
              local_500._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * local_500._0_4_
              ;
              local_500._8_4_ = (uint)bVar15 * auVar116._8_4_ | (uint)!bVar15 * local_500._8_4_;
              local_500._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * local_500._12_4_;
              local_500._16_4_ = (uint)bVar17 * auVar116._16_4_ | (uint)!bVar17 * local_500._16_4_;
              local_500._20_4_ = (uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * local_500._20_4_;
              local_500._24_4_ = (uint)bVar19 * auVar116._24_4_ | (uint)!bVar19 * local_500._24_4_;
              local_500._28_4_ = (uint)bVar20 * auVar116._28_4_ | (uint)!bVar20 * local_500._28_4_;
              local_500._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_500._32_4_;
              local_500._36_4_ = (uint)bVar22 * auVar116._36_4_ | (uint)!bVar22 * local_500._36_4_;
              local_500._40_4_ = (uint)bVar23 * auVar116._40_4_ | (uint)!bVar23 * local_500._40_4_;
              local_500._44_4_ = (uint)bVar24 * auVar116._44_4_ | (uint)!bVar24 * local_500._44_4_;
              local_500._48_4_ = (uint)bVar25 * auVar116._48_4_ | (uint)!bVar25 * local_500._48_4_;
              local_500._52_4_ = (uint)bVar26 * auVar116._52_4_ | (uint)!bVar26 * local_500._52_4_;
              local_500._56_4_ = (uint)bVar27 * auVar116._56_4_ | (uint)!bVar27 * local_500._56_4_;
              local_500._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * local_500._60_4_;
              auVar116 = vpermps_avx512f(auVar83,in_ZMM8);
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar70 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar70 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar70 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar70 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar70 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar70 >> 0xe) & 1);
              local_380._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * local_380._4_4_;
              local_380._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * local_380._0_4_
              ;
              local_380._8_4_ = (uint)bVar15 * auVar116._8_4_ | (uint)!bVar15 * local_380._8_4_;
              local_380._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * local_380._12_4_;
              local_380._16_4_ = (uint)bVar17 * auVar116._16_4_ | (uint)!bVar17 * local_380._16_4_;
              local_380._20_4_ = (uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * local_380._20_4_;
              local_380._24_4_ = (uint)bVar19 * auVar116._24_4_ | (uint)!bVar19 * local_380._24_4_;
              local_380._28_4_ = (uint)bVar20 * auVar116._28_4_ | (uint)!bVar20 * local_380._28_4_;
              local_380._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_380._32_4_;
              local_380._36_4_ = (uint)bVar22 * auVar116._36_4_ | (uint)!bVar22 * local_380._36_4_;
              local_380._40_4_ = (uint)bVar23 * auVar116._40_4_ | (uint)!bVar23 * local_380._40_4_;
              local_380._44_4_ = (uint)bVar24 * auVar116._44_4_ | (uint)!bVar24 * local_380._44_4_;
              local_380._48_4_ = (uint)bVar25 * auVar116._48_4_ | (uint)!bVar25 * local_380._48_4_;
              local_380._52_4_ = (uint)bVar26 * auVar116._52_4_ | (uint)!bVar26 * local_380._52_4_;
              local_380._56_4_ = (uint)bVar27 * auVar116._56_4_ | (uint)!bVar27 * local_380._56_4_;
              local_380._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * local_380._60_4_;
              auVar116 = vpermps_avx512f(auVar86,in_ZMM8);
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar70 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar70 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar70 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar70 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar70 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar70 >> 0xe) & 1);
              local_3c0._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * local_3c0._4_4_;
              local_3c0._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * local_3c0._0_4_
              ;
              local_3c0._8_4_ = (uint)bVar15 * auVar116._8_4_ | (uint)!bVar15 * local_3c0._8_4_;
              local_3c0._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * local_3c0._12_4_;
              local_3c0._16_4_ = (uint)bVar17 * auVar116._16_4_ | (uint)!bVar17 * local_3c0._16_4_;
              local_3c0._20_4_ = (uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * local_3c0._20_4_;
              local_3c0._24_4_ = (uint)bVar19 * auVar116._24_4_ | (uint)!bVar19 * local_3c0._24_4_;
              local_3c0._28_4_ = (uint)bVar20 * auVar116._28_4_ | (uint)!bVar20 * local_3c0._28_4_;
              local_3c0._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_3c0._32_4_;
              local_3c0._36_4_ = (uint)bVar22 * auVar116._36_4_ | (uint)!bVar22 * local_3c0._36_4_;
              local_3c0._40_4_ = (uint)bVar23 * auVar116._40_4_ | (uint)!bVar23 * local_3c0._40_4_;
              local_3c0._44_4_ = (uint)bVar24 * auVar116._44_4_ | (uint)!bVar24 * local_3c0._44_4_;
              local_3c0._48_4_ = (uint)bVar25 * auVar116._48_4_ | (uint)!bVar25 * local_3c0._48_4_;
              local_3c0._52_4_ = (uint)bVar26 * auVar116._52_4_ | (uint)!bVar26 * local_3c0._52_4_;
              local_3c0._56_4_ = (uint)bVar27 * auVar116._56_4_ | (uint)!bVar27 * local_3c0._56_4_;
              local_3c0._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * local_3c0._60_4_;
              auVar116 = vpermps_avx512f(auVar114,in_ZMM8);
              auVar118._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM22._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar118._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM22._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar118._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM22._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar118._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM22._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar118._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM22._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar118._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM22._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar118._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM22._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar118._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM22._28_4_;
              auVar118._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM22._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar118._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM22._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar118._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM22._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar118._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM22._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar118._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM22._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar118._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM22._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar118._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM22._56_4_;
              auVar118._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM22._60_4_;
              auVar116 = vbroadcastss_avx512f(auVar84._0_16_);
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar70 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar70 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar70 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar70 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar70 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar70 >> 0xe) & 1);
              local_4c0._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * local_4c0._4_4_;
              local_4c0._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * local_4c0._0_4_
              ;
              local_4c0._8_4_ = (uint)bVar15 * auVar116._8_4_ | (uint)!bVar15 * local_4c0._8_4_;
              local_4c0._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * local_4c0._12_4_;
              local_4c0._16_4_ = (uint)bVar17 * auVar116._16_4_ | (uint)!bVar17 * local_4c0._16_4_;
              local_4c0._20_4_ = (uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * local_4c0._20_4_;
              local_4c0._24_4_ = (uint)bVar19 * auVar116._24_4_ | (uint)!bVar19 * local_4c0._24_4_;
              local_4c0._28_4_ = (uint)bVar20 * auVar116._28_4_ | (uint)!bVar20 * local_4c0._28_4_;
              local_4c0._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_4c0._32_4_;
              local_4c0._36_4_ = (uint)bVar22 * auVar116._36_4_ | (uint)!bVar22 * local_4c0._36_4_;
              local_4c0._40_4_ = (uint)bVar23 * auVar116._40_4_ | (uint)!bVar23 * local_4c0._40_4_;
              local_4c0._44_4_ = (uint)bVar24 * auVar116._44_4_ | (uint)!bVar24 * local_4c0._44_4_;
              local_4c0._48_4_ = (uint)bVar25 * auVar116._48_4_ | (uint)!bVar25 * local_4c0._48_4_;
              local_4c0._52_4_ = (uint)bVar26 * auVar116._52_4_ | (uint)!bVar26 * local_4c0._52_4_;
              local_4c0._56_4_ = (uint)bVar27 * auVar116._56_4_ | (uint)!bVar27 * local_4c0._56_4_;
              local_4c0._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * local_4c0._60_4_;
              auVar116 = vpermps_avx512f(auVar83,auVar84);
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar70 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar70 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar70 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar70 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar70 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar70 >> 0xe) & 1);
              local_540._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * local_540._4_4_;
              local_540._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * local_540._0_4_
              ;
              local_540._8_4_ = (uint)bVar15 * auVar116._8_4_ | (uint)!bVar15 * local_540._8_4_;
              local_540._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * local_540._12_4_;
              local_540._16_4_ = (uint)bVar17 * auVar116._16_4_ | (uint)!bVar17 * local_540._16_4_;
              local_540._20_4_ = (uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * local_540._20_4_;
              local_540._24_4_ = (uint)bVar19 * auVar116._24_4_ | (uint)!bVar19 * local_540._24_4_;
              local_540._28_4_ = (uint)bVar20 * auVar116._28_4_ | (uint)!bVar20 * local_540._28_4_;
              local_540._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_540._32_4_;
              local_540._36_4_ = (uint)bVar22 * auVar116._36_4_ | (uint)!bVar22 * local_540._36_4_;
              local_540._40_4_ = (uint)bVar23 * auVar116._40_4_ | (uint)!bVar23 * local_540._40_4_;
              local_540._44_4_ = (uint)bVar24 * auVar116._44_4_ | (uint)!bVar24 * local_540._44_4_;
              local_540._48_4_ = (uint)bVar25 * auVar116._48_4_ | (uint)!bVar25 * local_540._48_4_;
              local_540._52_4_ = (uint)bVar26 * auVar116._52_4_ | (uint)!bVar26 * local_540._52_4_;
              local_540._56_4_ = (uint)bVar27 * auVar116._56_4_ | (uint)!bVar27 * local_540._56_4_;
              local_540._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * local_540._60_4_;
              auVar116 = vpermps_avx512f(auVar86,auVar84);
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar70 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar70 >> 6) & 1);
              bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
              bVar22 = (bool)((byte)(uVar70 >> 9) & 1);
              bVar23 = (bool)((byte)(uVar70 >> 10) & 1);
              bVar24 = (bool)((byte)(uVar70 >> 0xb) & 1);
              bVar25 = (bool)((byte)(uVar70 >> 0xc) & 1);
              bVar26 = (bool)((byte)(uVar70 >> 0xd) & 1);
              bVar27 = (bool)((byte)(uVar70 >> 0xe) & 1);
              local_440._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * local_440._4_4_;
              local_440._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * local_440._0_4_
              ;
              local_440._8_4_ = (uint)bVar15 * auVar116._8_4_ | (uint)!bVar15 * local_440._8_4_;
              local_440._12_4_ = (uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * local_440._12_4_;
              local_440._16_4_ = (uint)bVar17 * auVar116._16_4_ | (uint)!bVar17 * local_440._16_4_;
              local_440._20_4_ = (uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * local_440._20_4_;
              local_440._24_4_ = (uint)bVar19 * auVar116._24_4_ | (uint)!bVar19 * local_440._24_4_;
              local_440._28_4_ = (uint)bVar20 * auVar116._28_4_ | (uint)!bVar20 * local_440._28_4_;
              local_440._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * local_440._32_4_;
              local_440._36_4_ = (uint)bVar22 * auVar116._36_4_ | (uint)!bVar22 * local_440._36_4_;
              local_440._40_4_ = (uint)bVar23 * auVar116._40_4_ | (uint)!bVar23 * local_440._40_4_;
              local_440._44_4_ = (uint)bVar24 * auVar116._44_4_ | (uint)!bVar24 * local_440._44_4_;
              local_440._48_4_ = (uint)bVar25 * auVar116._48_4_ | (uint)!bVar25 * local_440._48_4_;
              local_440._52_4_ = (uint)bVar26 * auVar116._52_4_ | (uint)!bVar26 * local_440._52_4_;
              local_440._56_4_ = (uint)bVar27 * auVar116._56_4_ | (uint)!bVar27 * local_440._56_4_;
              local_440._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * local_440._60_4_;
              auVar116 = vpermps_avx512f(auVar114,auVar84);
              auVar119._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM25._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar119._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM25._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar119._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM25._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar119._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM25._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar119._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM25._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar119._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM25._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar119._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM25._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar119._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM25._28_4_;
              auVar119._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM25._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar119._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM25._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar119._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM25._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar119._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM25._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar119._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM25._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar119._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM25._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar119._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM25._56_4_;
              auVar119._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM25._60_4_;
              auVar116 = vbroadcastss_avx512f(in_ZMM6._0_16_);
              auVar120._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM27._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar120._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM27._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar120._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM27._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar120._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM27._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar120._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM27._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar120._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM27._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar120._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM27._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar120._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM27._28_4_;
              auVar120._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM27._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar120._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM27._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar120._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM27._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar120._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM27._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar120._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM27._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar120._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM27._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar120._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM27._56_4_;
              auVar120._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM27._60_4_;
              auVar116 = vpermps_avx512f(auVar83,in_ZMM6);
              auVar121._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM24._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar121._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM24._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar121._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM24._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar121._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM24._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar121._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM24._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar121._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM24._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar121._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM24._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar121._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM24._28_4_;
              auVar121._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM24._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar121._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM24._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar121._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM24._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar121._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM24._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar121._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM24._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar121._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM24._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar121._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM24._56_4_;
              auVar121._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM24._60_4_;
              auVar116 = vpermps_avx512f(auVar86,in_ZMM6);
              auVar122._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM23._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar122._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM23._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar122._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM23._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar122._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM23._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar122._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM23._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar122._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM23._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar122._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM23._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar122._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM23._28_4_;
              auVar122._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM23._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar122._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM23._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar122._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM23._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar122._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM23._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar122._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM23._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar122._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM23._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar122._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM23._56_4_;
              auVar122._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM23._60_4_;
              auVar116 = vpermps_avx512f(auVar114,in_ZMM6);
              auVar123._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar85._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar123._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar85._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar123._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar85._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar123._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar85._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar123._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * auVar85._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar123._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * auVar85._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar123._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * auVar85._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar123._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * auVar85._28_4_;
              auVar123._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar85._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar123._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * auVar85._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar123._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * auVar85._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar123._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * auVar85._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar123._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * auVar85._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar123._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * auVar85._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar123._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * auVar85._56_4_;
              auVar123._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * auVar85._60_4_;
              auVar85 = vbroadcastss_avx512f(in_ZMM9._0_16_);
              auVar124._0_4_ =
                   (uint)(bVar13 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM21._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar124._4_4_ = (uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * in_ZMM21._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar124._8_4_ = (uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * in_ZMM21._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar124._12_4_ = (uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * in_ZMM21._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar124._16_4_ = (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * in_ZMM21._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar124._20_4_ = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * in_ZMM21._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar124._24_4_ = (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * in_ZMM21._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar124._28_4_ = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * in_ZMM21._28_4_;
              auVar124._32_4_ =
                   (uint)(bVar21 & 1) * auVar85._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM21._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar124._36_4_ = (uint)bVar14 * auVar85._36_4_ | (uint)!bVar14 * in_ZMM21._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar124._40_4_ = (uint)bVar14 * auVar85._40_4_ | (uint)!bVar14 * in_ZMM21._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar124._44_4_ = (uint)bVar14 * auVar85._44_4_ | (uint)!bVar14 * in_ZMM21._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar124._48_4_ = (uint)bVar14 * auVar85._48_4_ | (uint)!bVar14 * in_ZMM21._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar124._52_4_ = (uint)bVar14 * auVar85._52_4_ | (uint)!bVar14 * in_ZMM21._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar124._56_4_ = (uint)bVar14 * auVar85._56_4_ | (uint)!bVar14 * in_ZMM21._56_4_;
              auVar124._60_4_ =
                   (uVar70 >> 0xf) * auVar85._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM21._60_4_;
              auVar85 = vpermps_avx512f(auVar83,in_ZMM9);
              auVar129._0_4_ =
                   (uint)(bVar13 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM20._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar129._4_4_ = (uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * in_ZMM20._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar129._8_4_ = (uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * in_ZMM20._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar129._12_4_ = (uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * in_ZMM20._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar129._16_4_ = (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * in_ZMM20._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar129._20_4_ = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * in_ZMM20._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar129._24_4_ = (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * in_ZMM20._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar129._28_4_ = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * in_ZMM20._28_4_;
              auVar129._32_4_ =
                   (uint)(bVar21 & 1) * auVar85._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM20._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar129._36_4_ = (uint)bVar14 * auVar85._36_4_ | (uint)!bVar14 * in_ZMM20._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar129._40_4_ = (uint)bVar14 * auVar85._40_4_ | (uint)!bVar14 * in_ZMM20._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar129._44_4_ = (uint)bVar14 * auVar85._44_4_ | (uint)!bVar14 * in_ZMM20._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar129._48_4_ = (uint)bVar14 * auVar85._48_4_ | (uint)!bVar14 * in_ZMM20._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar129._52_4_ = (uint)bVar14 * auVar85._52_4_ | (uint)!bVar14 * in_ZMM20._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar129._56_4_ = (uint)bVar14 * auVar85._56_4_ | (uint)!bVar14 * in_ZMM20._56_4_;
              auVar129._60_4_ =
                   (uVar70 >> 0xf) * auVar85._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM20._60_4_;
              auVar85 = vpermps_avx512f(auVar86,in_ZMM9);
              auVar130._0_4_ =
                   (uint)(bVar13 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM19._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar130._4_4_ = (uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * in_ZMM19._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar130._8_4_ = (uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * in_ZMM19._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar130._12_4_ = (uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * in_ZMM19._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar130._16_4_ = (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * in_ZMM19._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar130._20_4_ = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * in_ZMM19._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar130._24_4_ = (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * in_ZMM19._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar130._28_4_ = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * in_ZMM19._28_4_;
              auVar130._32_4_ =
                   (uint)(bVar21 & 1) * auVar85._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM19._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar130._36_4_ = (uint)bVar14 * auVar85._36_4_ | (uint)!bVar14 * in_ZMM19._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar130._40_4_ = (uint)bVar14 * auVar85._40_4_ | (uint)!bVar14 * in_ZMM19._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar130._44_4_ = (uint)bVar14 * auVar85._44_4_ | (uint)!bVar14 * in_ZMM19._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar130._48_4_ = (uint)bVar14 * auVar85._48_4_ | (uint)!bVar14 * in_ZMM19._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar130._52_4_ = (uint)bVar14 * auVar85._52_4_ | (uint)!bVar14 * in_ZMM19._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar130._56_4_ = (uint)bVar14 * auVar85._56_4_ | (uint)!bVar14 * in_ZMM19._56_4_;
              auVar130._60_4_ =
                   (uVar70 >> 0xf) * auVar85._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM19._60_4_;
              auVar85 = vpermps_avx512f(auVar114,in_ZMM9);
              auVar132._0_4_ =
                   (uint)(bVar13 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM31._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar132._4_4_ = (uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * in_ZMM31._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar132._8_4_ = (uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * in_ZMM31._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar132._12_4_ = (uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * in_ZMM31._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar132._16_4_ = (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * in_ZMM31._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar132._20_4_ = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * in_ZMM31._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar132._24_4_ = (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * in_ZMM31._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar132._28_4_ = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * in_ZMM31._28_4_;
              auVar132._32_4_ =
                   (uint)(bVar21 & 1) * auVar85._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM31._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar132._36_4_ = (uint)bVar14 * auVar85._36_4_ | (uint)!bVar14 * in_ZMM31._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar132._40_4_ = (uint)bVar14 * auVar85._40_4_ | (uint)!bVar14 * in_ZMM31._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar132._44_4_ = (uint)bVar14 * auVar85._44_4_ | (uint)!bVar14 * in_ZMM31._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar132._48_4_ = (uint)bVar14 * auVar85._48_4_ | (uint)!bVar14 * in_ZMM31._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar132._52_4_ = (uint)bVar14 * auVar85._52_4_ | (uint)!bVar14 * in_ZMM31._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar132._56_4_ = (uint)bVar14 * auVar85._56_4_ | (uint)!bVar14 * in_ZMM31._56_4_;
              auVar132._60_4_ =
                   (uVar70 >> 0xf) * auVar85._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM31._60_4_;
              auVar85 = vbroadcastss_avx512f(in_ZMM4._0_16_);
              local_240 = (uint)(bVar13 & 1) * auVar85._0_4_ | !(bool)(bVar13 & 1) * local_240;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              uStack_23c = (uint)bVar14 * auVar85._4_4_ | !bVar14 * uStack_23c;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              uStack_238 = (uint)bVar14 * auVar85._8_4_ | !bVar14 * uStack_238;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              uStack_234 = (uint)bVar14 * auVar85._12_4_ | !bVar14 * uStack_234;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              uStack_230 = (uint)bVar14 * auVar85._16_4_ | !bVar14 * uStack_230;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              uStack_22c = (uint)bVar14 * auVar85._20_4_ | !bVar14 * uStack_22c;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              uStack_228 = (uint)bVar14 * auVar85._24_4_ | !bVar14 * uStack_228;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              uStack_224 = (uint)bVar14 * auVar85._28_4_ | !bVar14 * uStack_224;
              uStack_220 = (uint)(bVar21 & 1) * auVar85._32_4_ | !(bool)(bVar21 & 1) * uStack_220;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              uStack_21c = (uint)bVar14 * auVar85._36_4_ | !bVar14 * uStack_21c;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              uStack_218 = (uint)bVar14 * auVar85._40_4_ | !bVar14 * uStack_218;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              uStack_214 = (uint)bVar14 * auVar85._44_4_ | !bVar14 * uStack_214;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              uStack_210 = (uint)bVar14 * auVar85._48_4_ | !bVar14 * uStack_210;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              uStack_20c = (uint)bVar14 * auVar85._52_4_ | !bVar14 * uStack_20c;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              uStack_208 = (uint)bVar14 * auVar85._56_4_ | !bVar14 * uStack_208;
              uStack_204 = (uVar70 >> 0xf) * auVar85._60_4_ | !SUB41(uVar70 >> 0xf,0) * uStack_204;
              auVar85 = vpermps_avx512f(auVar83,in_ZMM4);
              local_200 = (uint)(bVar13 & 1) * auVar85._0_4_ | !(bool)(bVar13 & 1) * local_200;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              uStack_1fc = (uint)bVar14 * auVar85._4_4_ | !bVar14 * uStack_1fc;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              uStack_1f8 = (uint)bVar14 * auVar85._8_4_ | !bVar14 * uStack_1f8;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              uStack_1f4 = (uint)bVar14 * auVar85._12_4_ | !bVar14 * uStack_1f4;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              uStack_1f0 = (uint)bVar14 * auVar85._16_4_ | !bVar14 * uStack_1f0;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              uStack_1ec = (uint)bVar14 * auVar85._20_4_ | !bVar14 * uStack_1ec;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              uStack_1e8 = (uint)bVar14 * auVar85._24_4_ | !bVar14 * uStack_1e8;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              uStack_1e4 = (uint)bVar14 * auVar85._28_4_ | !bVar14 * uStack_1e4;
              uStack_1e0 = (uint)(bVar21 & 1) * auVar85._32_4_ | !(bool)(bVar21 & 1) * uStack_1e0;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              uStack_1dc = (uint)bVar14 * auVar85._36_4_ | !bVar14 * uStack_1dc;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              uStack_1d8 = (uint)bVar14 * auVar85._40_4_ | !bVar14 * uStack_1d8;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              uStack_1d4 = (uint)bVar14 * auVar85._44_4_ | !bVar14 * uStack_1d4;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              uStack_1d0 = (uint)bVar14 * auVar85._48_4_ | !bVar14 * uStack_1d0;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              uStack_1cc = (uint)bVar14 * auVar85._52_4_ | !bVar14 * uStack_1cc;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              uStack_1c8 = (uint)bVar14 * auVar85._56_4_ | !bVar14 * uStack_1c8;
              uStack_1c4 = (uVar70 >> 0xf) * auVar85._60_4_ | !SUB41(uVar70 >> 0xf,0) * uStack_1c4;
              auVar85 = vpermps_avx512f(auVar86,in_ZMM4);
              local_1c0 = (uint)(bVar13 & 1) * auVar85._0_4_ | !(bool)(bVar13 & 1) * local_1c0;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              uStack_1bc = (uint)bVar14 * auVar85._4_4_ | !bVar14 * uStack_1bc;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              uStack_1b8 = (uint)bVar14 * auVar85._8_4_ | !bVar14 * uStack_1b8;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              uStack_1b4 = (uint)bVar14 * auVar85._12_4_ | !bVar14 * uStack_1b4;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              uStack_1b0 = (uint)bVar14 * auVar85._16_4_ | !bVar14 * uStack_1b0;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              uStack_1ac = (uint)bVar14 * auVar85._20_4_ | !bVar14 * uStack_1ac;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              uStack_1a8 = (uint)bVar14 * auVar85._24_4_ | !bVar14 * uStack_1a8;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              uStack_1a4 = (uint)bVar14 * auVar85._28_4_ | !bVar14 * uStack_1a4;
              uStack_1a0 = (uint)(bVar21 & 1) * auVar85._32_4_ | !(bool)(bVar21 & 1) * uStack_1a0;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              uStack_19c = (uint)bVar14 * auVar85._36_4_ | !bVar14 * uStack_19c;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              uStack_198 = (uint)bVar14 * auVar85._40_4_ | !bVar14 * uStack_198;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              uStack_194 = (uint)bVar14 * auVar85._44_4_ | !bVar14 * uStack_194;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              uStack_190 = (uint)bVar14 * auVar85._48_4_ | !bVar14 * uStack_190;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              uStack_18c = (uint)bVar14 * auVar85._52_4_ | !bVar14 * uStack_18c;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              uStack_188 = (uint)bVar14 * auVar85._56_4_ | !bVar14 * uStack_188;
              uStack_184 = (uVar70 >> 0xf) * auVar85._60_4_ | !SUB41(uVar70 >> 0xf,0) * uStack_184;
              auVar85 = vpermps_avx512f(auVar114,in_ZMM4);
              auVar133._0_4_ =
                   (uint)(bVar13 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM29._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar133._4_4_ = (uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * in_ZMM29._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar133._8_4_ = (uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * in_ZMM29._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar133._12_4_ = (uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * in_ZMM29._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar133._16_4_ = (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * in_ZMM29._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar133._20_4_ = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * in_ZMM29._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar133._24_4_ = (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * in_ZMM29._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar133._28_4_ = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * in_ZMM29._28_4_;
              auVar133._32_4_ =
                   (uint)(bVar21 & 1) * auVar85._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM29._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar133._36_4_ = (uint)bVar14 * auVar85._36_4_ | (uint)!bVar14 * in_ZMM29._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar133._40_4_ = (uint)bVar14 * auVar85._40_4_ | (uint)!bVar14 * in_ZMM29._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar133._44_4_ = (uint)bVar14 * auVar85._44_4_ | (uint)!bVar14 * in_ZMM29._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar133._48_4_ = (uint)bVar14 * auVar85._48_4_ | (uint)!bVar14 * in_ZMM29._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar133._52_4_ = (uint)bVar14 * auVar85._52_4_ | (uint)!bVar14 * in_ZMM29._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar133._56_4_ = (uint)bVar14 * auVar85._56_4_ | (uint)!bVar14 * in_ZMM29._56_4_;
              auVar133._60_4_ =
                   (uVar70 >> 0xf) * auVar85._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM29._60_4_;
              auVar85 = vbroadcastss_avx512f(in_ZMM10._0_16_);
              local_180 = (uint)(bVar13 & 1) * auVar85._0_4_ | !(bool)(bVar13 & 1) * local_180;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              uStack_17c = (uint)bVar14 * auVar85._4_4_ | !bVar14 * uStack_17c;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              uStack_178 = (uint)bVar14 * auVar85._8_4_ | !bVar14 * uStack_178;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              uStack_174 = (uint)bVar14 * auVar85._12_4_ | !bVar14 * uStack_174;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              uStack_170 = (uint)bVar14 * auVar85._16_4_ | !bVar14 * uStack_170;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              uStack_16c = (uint)bVar14 * auVar85._20_4_ | !bVar14 * uStack_16c;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              uStack_168 = (uint)bVar14 * auVar85._24_4_ | !bVar14 * uStack_168;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              uStack_164 = (uint)bVar14 * auVar85._28_4_ | !bVar14 * uStack_164;
              uStack_160 = (uint)(bVar21 & 1) * auVar85._32_4_ | !(bool)(bVar21 & 1) * uStack_160;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              uStack_15c = (uint)bVar14 * auVar85._36_4_ | !bVar14 * uStack_15c;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              uStack_158 = (uint)bVar14 * auVar85._40_4_ | !bVar14 * uStack_158;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              uStack_154 = (uint)bVar14 * auVar85._44_4_ | !bVar14 * uStack_154;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              uStack_150 = (uint)bVar14 * auVar85._48_4_ | !bVar14 * uStack_150;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              uStack_14c = (uint)bVar14 * auVar85._52_4_ | !bVar14 * uStack_14c;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              uStack_148 = (uint)bVar14 * auVar85._56_4_ | !bVar14 * uStack_148;
              uStack_144 = (uVar70 >> 0xf) * auVar85._60_4_ | !SUB41(uVar70 >> 0xf,0) * uStack_144;
              auVar83 = vpermps_avx512f(auVar83,in_ZMM10);
              local_140 = (uint)(bVar13 & 1) * auVar83._0_4_ | !(bool)(bVar13 & 1) * local_140;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              uStack_13c = (uint)bVar14 * auVar83._4_4_ | !bVar14 * uStack_13c;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              uStack_138 = (uint)bVar14 * auVar83._8_4_ | !bVar14 * uStack_138;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              uStack_134 = (uint)bVar14 * auVar83._12_4_ | !bVar14 * uStack_134;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              uStack_130 = (uint)bVar14 * auVar83._16_4_ | !bVar14 * uStack_130;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              uStack_12c = (uint)bVar14 * auVar83._20_4_ | !bVar14 * uStack_12c;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              uStack_128 = (uint)bVar14 * auVar83._24_4_ | !bVar14 * uStack_128;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              uStack_124 = (uint)bVar14 * auVar83._28_4_ | !bVar14 * uStack_124;
              uStack_120 = (uint)(bVar21 & 1) * auVar83._32_4_ | !(bool)(bVar21 & 1) * uStack_120;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              uStack_11c = (uint)bVar14 * auVar83._36_4_ | !bVar14 * uStack_11c;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              uStack_118 = (uint)bVar14 * auVar83._40_4_ | !bVar14 * uStack_118;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              uStack_114 = (uint)bVar14 * auVar83._44_4_ | !bVar14 * uStack_114;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              uStack_110 = (uint)bVar14 * auVar83._48_4_ | !bVar14 * uStack_110;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              uStack_10c = (uint)bVar14 * auVar83._52_4_ | !bVar14 * uStack_10c;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              uStack_108 = (uint)bVar14 * auVar83._56_4_ | !bVar14 * uStack_108;
              uStack_104 = (uVar70 >> 0xf) * auVar83._60_4_ | !SUB41(uVar70 >> 0xf,0) * uStack_104;
              auVar83 = vpermps_avx512f(auVar86,in_ZMM10);
              local_100 = (uint)(bVar13 & 1) * auVar83._0_4_ | !(bool)(bVar13 & 1) * local_100;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              uStack_fc = (uint)bVar14 * auVar83._4_4_ | !bVar14 * uStack_fc;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              uStack_f8 = (uint)bVar14 * auVar83._8_4_ | !bVar14 * uStack_f8;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              uStack_f4 = (uint)bVar14 * auVar83._12_4_ | !bVar14 * uStack_f4;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              uStack_f0 = (uint)bVar14 * auVar83._16_4_ | !bVar14 * uStack_f0;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              uStack_ec = (uint)bVar14 * auVar83._20_4_ | !bVar14 * uStack_ec;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              uStack_e8 = (uint)bVar14 * auVar83._24_4_ | !bVar14 * uStack_e8;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              uStack_e4 = (uint)bVar14 * auVar83._28_4_ | !bVar14 * uStack_e4;
              uStack_e0 = (uint)(bVar21 & 1) * auVar83._32_4_ | !(bool)(bVar21 & 1) * uStack_e0;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              uStack_dc = (uint)bVar14 * auVar83._36_4_ | !bVar14 * uStack_dc;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              uStack_d8 = (uint)bVar14 * auVar83._40_4_ | !bVar14 * uStack_d8;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              uStack_d4 = (uint)bVar14 * auVar83._44_4_ | !bVar14 * uStack_d4;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              uStack_d0 = (uint)bVar14 * auVar83._48_4_ | !bVar14 * uStack_d0;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              uStack_cc = (uint)bVar14 * auVar83._52_4_ | !bVar14 * uStack_cc;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              uStack_c8 = (uint)bVar14 * auVar83._56_4_ | !bVar14 * uStack_c8;
              uStack_c4 = (uVar70 >> 0xf) * auVar83._60_4_ | !SUB41(uVar70 >> 0xf,0) * uStack_c4;
              auVar85 = vpermps_avx512f(auVar114,in_ZMM10);
              auVar83._0_4_ =
                   (uint)(bVar13 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM30._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar83._4_4_ = (uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * in_ZMM30._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar83._8_4_ = (uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * in_ZMM30._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar83._12_4_ = (uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * in_ZMM30._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar83._16_4_ = (uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * in_ZMM30._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar83._20_4_ = (uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * in_ZMM30._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar83._24_4_ = (uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * in_ZMM30._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar83._28_4_ = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * in_ZMM30._28_4_;
              auVar83._32_4_ =
                   (uint)(bVar21 & 1) * auVar85._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM30._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar83._36_4_ = (uint)bVar14 * auVar85._36_4_ | (uint)!bVar14 * in_ZMM30._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar83._40_4_ = (uint)bVar14 * auVar85._40_4_ | (uint)!bVar14 * in_ZMM30._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar83._44_4_ = (uint)bVar14 * auVar85._44_4_ | (uint)!bVar14 * in_ZMM30._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar83._48_4_ = (uint)bVar14 * auVar85._48_4_ | (uint)!bVar14 * in_ZMM30._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar83._52_4_ = (uint)bVar14 * auVar85._52_4_ | (uint)!bVar14 * in_ZMM30._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar83._56_4_ = (uint)bVar14 * auVar85._56_4_ | (uint)!bVar14 * in_ZMM30._56_4_;
              auVar83._60_4_ =
                   (uVar70 >> 0xf) * auVar85._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM30._60_4_;
              auVar85 = auVar123;
              in_ZMM18 = auVar113;
              in_ZMM19 = auVar130;
              in_ZMM20 = auVar129;
              in_ZMM21 = auVar124;
              in_ZMM22 = auVar118;
              in_ZMM23 = auVar122;
              in_ZMM24 = auVar121;
              in_ZMM25 = auVar119;
              in_ZMM26 = auVar117;
              in_ZMM27 = auVar120;
              in_ZMM28 = auVar115;
              in_ZMM29 = auVar133;
              in_ZMM30 = auVar83;
              in_ZMM31 = auVar132;
            } while ((short)(~uVar70 & uVar68) != 0);
            auVar82 = vmulps_avx512f(auVar83,auVar119);
            auVar84 = vmulps_avx512f(auVar123,auVar115);
            auVar82 = vaddps_avx512f(auVar84,auVar82);
            auVar84 = vmulps_avx512f(auVar132,auVar117);
            auVar82 = vaddps_avx512f(auVar84,auVar82);
            auVar84 = vmulps_avx512f(auVar133,auVar118);
            auVar84 = vaddps_avx512f(auVar84,auVar82);
            auVar86 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            auVar114 = vxorps_avx512dq(auVar84,auVar86);
            auVar116 = vmaxps_avx512f(auVar114,auVar84);
            auVar82._8_4_ = 0x7fffffff;
            auVar82._0_8_ = 0x7fffffff7fffffff;
            auVar82._12_4_ = 0x7fffffff;
            auVar82._16_4_ = 0x7fffffff;
            auVar82._20_4_ = 0x7fffffff;
            auVar82._24_4_ = 0x7fffffff;
            auVar82._28_4_ = 0x7fffffff;
            auVar82._32_4_ = 0x7fffffff;
            auVar82._36_4_ = 0x7fffffff;
            auVar82._40_4_ = 0x7fffffff;
            auVar82._44_4_ = 0x7fffffff;
            auVar82._48_4_ = 0x7fffffff;
            auVar82._52_4_ = 0x7fffffff;
            auVar82._56_4_ = 0x7fffffff;
            auVar82._60_4_ = 0x7fffffff;
            auVar82 = vandpd_avx512dq(auVar116,auVar82);
            auVar85._8_4_ = 0xbb8d3753;
            auVar85._0_8_ = 0xbb8d3753bb8d3753;
            auVar85._12_4_ = 0xbb8d3753;
            auVar85._16_4_ = 0xbb8d3753;
            auVar85._20_4_ = 0xbb8d3753;
            auVar85._24_4_ = 0xbb8d3753;
            auVar85._28_4_ = 0xbb8d3753;
            auVar85._32_4_ = 0xbb8d3753;
            auVar85._36_4_ = 0xbb8d3753;
            auVar85._40_4_ = 0xbb8d3753;
            auVar85._44_4_ = 0xbb8d3753;
            auVar85._48_4_ = 0xbb8d3753;
            auVar85._52_4_ = 0xbb8d3753;
            auVar85._56_4_ = 0xbb8d3753;
            auVar85._60_4_ = 0xbb8d3753;
            auVar85 = vmulps_avx512f(auVar82,auVar85);
            auVar134._8_4_ = 0x3c9df1b8;
            auVar134._0_8_ = 0x3c9df1b83c9df1b8;
            auVar134._12_4_ = 0x3c9df1b8;
            auVar134._16_4_ = 0x3c9df1b8;
            auVar134._20_4_ = 0x3c9df1b8;
            auVar134._24_4_ = 0x3c9df1b8;
            auVar134._28_4_ = 0x3c9df1b8;
            auVar134._32_4_ = 0x3c9df1b8;
            auVar134._36_4_ = 0x3c9df1b8;
            auVar134._40_4_ = 0x3c9df1b8;
            auVar134._44_4_ = 0x3c9df1b8;
            auVar134._48_4_ = 0x3c9df1b8;
            auVar134._52_4_ = 0x3c9df1b8;
            auVar134._56_4_ = 0x3c9df1b8;
            auVar134._60_4_ = 0x3c9df1b8;
            auVar85 = vaddps_avx512f(auVar85,auVar134);
            auVar85 = vmulps_avx512f(auVar85,auVar82);
            auVar135._8_4_ = 0xbd37e81c;
            auVar135._0_8_ = 0xbd37e81cbd37e81c;
            auVar135._12_4_ = 0xbd37e81c;
            auVar135._16_4_ = 0xbd37e81c;
            auVar135._20_4_ = 0xbd37e81c;
            auVar135._24_4_ = 0xbd37e81c;
            auVar135._28_4_ = 0xbd37e81c;
            auVar135._32_4_ = 0xbd37e81c;
            auVar135._36_4_ = 0xbd37e81c;
            auVar135._40_4_ = 0xbd37e81c;
            auVar135._44_4_ = 0xbd37e81c;
            auVar135._48_4_ = 0xbd37e81c;
            auVar135._52_4_ = 0xbd37e81c;
            auVar135._56_4_ = 0xbd37e81c;
            auVar135._60_4_ = 0xbd37e81c;
            auVar85 = vaddps_avx512f(auVar85,auVar135);
            auVar85 = vmulps_avx512f(auVar85,auVar82);
            auVar136._8_4_ = 0x3db3edac;
            auVar136._0_8_ = 0x3db3edac3db3edac;
            auVar136._12_4_ = 0x3db3edac;
            auVar136._16_4_ = 0x3db3edac;
            auVar136._20_4_ = 0x3db3edac;
            auVar136._24_4_ = 0x3db3edac;
            auVar136._28_4_ = 0x3db3edac;
            auVar136._32_4_ = 0x3db3edac;
            auVar136._36_4_ = 0x3db3edac;
            auVar136._40_4_ = 0x3db3edac;
            auVar136._44_4_ = 0x3db3edac;
            auVar136._48_4_ = 0x3db3edac;
            auVar136._52_4_ = 0x3db3edac;
            auVar136._56_4_ = 0x3db3edac;
            auVar136._60_4_ = 0x3db3edac;
            auVar85 = vaddps_avx512f(auVar85,auVar136);
            auVar85 = vmulps_avx512f(auVar85,auVar82);
            auVar137._8_4_ = 0xbe5ba881;
            auVar137._0_8_ = 0xbe5ba881be5ba881;
            auVar137._12_4_ = 0xbe5ba881;
            auVar137._16_4_ = 0xbe5ba881;
            auVar137._20_4_ = 0xbe5ba881;
            auVar137._24_4_ = 0xbe5ba881;
            auVar137._28_4_ = 0xbe5ba881;
            auVar137._32_4_ = 0xbe5ba881;
            auVar137._36_4_ = 0xbe5ba881;
            auVar137._40_4_ = 0xbe5ba881;
            auVar137._44_4_ = 0xbe5ba881;
            auVar137._48_4_ = 0xbe5ba881;
            auVar137._52_4_ = 0xbe5ba881;
            auVar137._56_4_ = 0xbe5ba881;
            auVar137._60_4_ = 0xbe5ba881;
            auVar85 = vaddps_avx512f(auVar85,auVar137);
            auVar85 = vmulps_avx512f(auVar85,auVar82);
            auVar138._8_4_ = 0x3fc90fd1;
            auVar138._0_8_ = 0x3fc90fd13fc90fd1;
            auVar138._12_4_ = 0x3fc90fd1;
            auVar138._16_4_ = 0x3fc90fd1;
            auVar138._20_4_ = 0x3fc90fd1;
            auVar138._24_4_ = 0x3fc90fd1;
            auVar138._28_4_ = 0x3fc90fd1;
            auVar138._32_4_ = 0x3fc90fd1;
            auVar138._36_4_ = 0x3fc90fd1;
            auVar138._40_4_ = 0x3fc90fd1;
            auVar138._44_4_ = 0x3fc90fd1;
            auVar138._48_4_ = 0x3fc90fd1;
            auVar138._52_4_ = 0x3fc90fd1;
            auVar138._56_4_ = 0x3fc90fd1;
            auVar138._60_4_ = 0x3fc90fd1;
            auVar85 = vaddps_avx512f(auVar85,auVar138);
            auVar134 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar135 = vsubps_avx512f(auVar134,auVar82);
            auVar135 = vsqrtps_avx512f(auVar135);
            uVar66 = vcmpps_avx512f(auVar82,auVar134,6);
            auVar82 = vmulps_avx512f(auVar135,auVar85);
            auVar176 = ZEXT1664(ZEXT816(0) << 0x40);
            uVar69 = vcmpps_avx512f(auVar116,auVar176,1);
            auVar85 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar82 = vsubps_avx512f(auVar85,auVar82);
            auVar82 = vmaxps_avx512f(auVar176,auVar82);
            auVar135 = vxorps_avx512dq(auVar82,auVar86);
            bVar14 = (bool)((byte)uVar69 & 1);
            auVar158._0_4_ = (uint)bVar14 * auVar135._0_4_ | (uint)!bVar14 * auVar82._0_4_;
            bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar158._4_4_ = (uint)bVar14 * auVar135._4_4_ | (uint)!bVar14 * auVar82._4_4_;
            bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar158._8_4_ = (uint)bVar14 * auVar135._8_4_ | (uint)!bVar14 * auVar82._8_4_;
            bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar158._12_4_ = (uint)bVar14 * auVar135._12_4_ | (uint)!bVar14 * auVar82._12_4_;
            bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar158._16_4_ = (uint)bVar14 * auVar135._16_4_ | (uint)!bVar14 * auVar82._16_4_;
            bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar158._20_4_ = (uint)bVar14 * auVar135._20_4_ | (uint)!bVar14 * auVar82._20_4_;
            bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar158._24_4_ = (uint)bVar14 * auVar135._24_4_ | (uint)!bVar14 * auVar82._24_4_;
            bVar14 = (bool)((byte)(uVar69 >> 7) & 1);
            auVar158._28_4_ = (uint)bVar14 * auVar135._28_4_ | (uint)!bVar14 * auVar82._28_4_;
            bVar14 = (bool)((byte)(uVar69 >> 8) & 1);
            auVar158._32_4_ = (uint)bVar14 * auVar135._32_4_ | (uint)!bVar14 * auVar82._32_4_;
            bVar14 = (bool)((byte)(uVar69 >> 9) & 1);
            auVar158._36_4_ = (uint)bVar14 * auVar135._36_4_ | (uint)!bVar14 * auVar82._36_4_;
            bVar14 = (bool)((byte)(uVar69 >> 10) & 1);
            auVar158._40_4_ = (uint)bVar14 * auVar135._40_4_ | (uint)!bVar14 * auVar82._40_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xb) & 1);
            auVar158._44_4_ = (uint)bVar14 * auVar135._44_4_ | (uint)!bVar14 * auVar82._44_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xc) & 1);
            auVar158._48_4_ = (uint)bVar14 * auVar135._48_4_ | (uint)!bVar14 * auVar82._48_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xd) & 1);
            auVar158._52_4_ = (uint)bVar14 * auVar135._52_4_ | (uint)!bVar14 * auVar82._52_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xe) & 1);
            auVar158._56_4_ = (uint)bVar14 * auVar135._56_4_ | (uint)!bVar14 * auVar82._56_4_;
            bVar14 = SUB81(uVar69 >> 0xf,0);
            auVar158._60_4_ = (uint)bVar14 * auVar135._60_4_ | (uint)!bVar14 * auVar82._60_4_;
            auVar82 = vsubps_avx512f(auVar85,auVar158);
            auVar135 = vbroadcastss_avx512f(ZEXT416(0x7fc00000));
            bVar14 = (bool)((byte)uVar66 & 1);
            auVar159._0_4_ = (uint)bVar14 * auVar135._0_4_ | (uint)!bVar14 * auVar82._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar159._4_4_ = (uint)bVar14 * auVar135._4_4_ | (uint)!bVar14 * auVar82._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar159._8_4_ = (uint)bVar14 * auVar135._8_4_ | (uint)!bVar14 * auVar82._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar159._12_4_ = (uint)bVar14 * auVar135._12_4_ | (uint)!bVar14 * auVar82._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar159._16_4_ = (uint)bVar14 * auVar135._16_4_ | (uint)!bVar14 * auVar82._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar159._20_4_ = (uint)bVar14 * auVar135._20_4_ | (uint)!bVar14 * auVar82._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar159._24_4_ = (uint)bVar14 * auVar135._24_4_ | (uint)!bVar14 * auVar82._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar159._28_4_ = (uint)bVar14 * auVar135._28_4_ | (uint)!bVar14 * auVar82._28_4_;
            bVar14 = (bool)((byte)(uVar66 >> 8) & 1);
            auVar159._32_4_ = (uint)bVar14 * auVar135._32_4_ | (uint)!bVar14 * auVar82._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar159._36_4_ = (uint)bVar14 * auVar135._36_4_ | (uint)!bVar14 * auVar82._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar159._40_4_ = (uint)bVar14 * auVar135._40_4_ | (uint)!bVar14 * auVar82._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar159._44_4_ = (uint)bVar14 * auVar135._44_4_ | (uint)!bVar14 * auVar82._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar159._48_4_ = (uint)bVar14 * auVar135._48_4_ | (uint)!bVar14 * auVar82._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar159._52_4_ = (uint)bVar14 * auVar135._52_4_ | (uint)!bVar14 * auVar82._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar159._56_4_ = (uint)bVar14 * auVar135._56_4_ | (uint)!bVar14 * auVar82._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar159._60_4_ = (uint)bVar14 * auVar135._60_4_ | (uint)!bVar14 * auVar82._60_4_;
            uVar66 = vcmpps_avx512f(auVar84,auVar114,1);
            auVar82 = vmulps_avx512f(auVar81,auVar159);
            auVar139._8_4_ = 0x3f22f983;
            auVar139._0_8_ = 0x3f22f9833f22f983;
            auVar139._12_4_ = 0x3f22f983;
            auVar139._16_4_ = 0x3f22f983;
            auVar139._20_4_ = 0x3f22f983;
            auVar139._24_4_ = 0x3f22f983;
            auVar139._28_4_ = 0x3f22f983;
            auVar139._32_4_ = 0x3f22f983;
            auVar139._36_4_ = 0x3f22f983;
            auVar139._40_4_ = 0x3f22f983;
            auVar139._44_4_ = 0x3f22f983;
            auVar139._48_4_ = 0x3f22f983;
            auVar139._52_4_ = 0x3f22f983;
            auVar139._56_4_ = 0x3f22f983;
            auVar139._60_4_ = 0x3f22f983;
            auVar84 = vmulps_avx512f(auVar82,auVar139);
            auVar84 = vrndscaleps_avx512f(auVar84,1);
            auVar85 = vmulps_avx512f(auVar84,auVar85);
            auVar82 = vsubps_avx512f(auVar82,auVar85);
            auVar84 = vcvtps2dq_avx512f(auVar84);
            auVar85 = vpbroadcastd_avx512f(ZEXT416(1));
            uVar30 = vptestnmd_avx512f(auVar84,auVar85);
            auVar140._8_4_ = 3;
            auVar140._0_8_ = 0x300000003;
            auVar140._12_4_ = 3;
            auVar140._16_4_ = 3;
            auVar140._20_4_ = 3;
            auVar140._24_4_ = 3;
            auVar140._28_4_ = 3;
            auVar140._32_4_ = 3;
            auVar140._36_4_ = 3;
            auVar140._40_4_ = 3;
            auVar140._44_4_ = 3;
            auVar140._48_4_ = 3;
            auVar140._52_4_ = 3;
            auVar140._56_4_ = 3;
            auVar140._60_4_ = 3;
            auVar114 = vpandd_avx512f(auVar84,auVar140);
            uVar69 = vpcmpgtd_avx512f(auVar114,auVar85);
            auVar85 = vpternlogd_avx512f(auVar85,auVar85,auVar85,0xff);
            auVar85 = vpaddd_avx512f(auVar114,auVar85);
            auVar141._8_4_ = 2;
            auVar141._0_8_ = 0x200000002;
            auVar141._12_4_ = 2;
            auVar141._16_4_ = 2;
            auVar141._20_4_ = 2;
            auVar141._24_4_ = 2;
            auVar141._28_4_ = 2;
            auVar141._32_4_ = 2;
            auVar141._36_4_ = 2;
            auVar141._40_4_ = 2;
            auVar141._44_4_ = 2;
            auVar141._48_4_ = 2;
            auVar141._52_4_ = 2;
            auVar141._56_4_ = 2;
            auVar141._60_4_ = 2;
            uVar28 = vpcmpud_avx512f(auVar85,auVar141,1);
            auVar85 = vmulps_avx512f(auVar82,auVar82);
            auVar144._8_4_ = 0xb2d70013;
            auVar144._0_8_ = 0xb2d70013b2d70013;
            auVar144._12_4_ = 0xb2d70013;
            auVar144._16_4_ = 0xb2d70013;
            auVar144._20_4_ = 0xb2d70013;
            auVar144._24_4_ = 0xb2d70013;
            auVar144._28_4_ = 0xb2d70013;
            auVar144._32_4_ = 0xb2d70013;
            auVar144._36_4_ = 0xb2d70013;
            auVar144._40_4_ = 0xb2d70013;
            auVar144._44_4_ = 0xb2d70013;
            auVar144._48_4_ = 0xb2d70013;
            auVar144._52_4_ = 0xb2d70013;
            auVar144._56_4_ = 0xb2d70013;
            auVar144._60_4_ = 0xb2d70013;
            auVar114 = vmulps_avx512f(auVar85,auVar144);
            auVar145._8_4_ = 0x363938a8;
            auVar145._0_8_ = 0x363938a8363938a8;
            auVar145._12_4_ = 0x363938a8;
            auVar145._16_4_ = 0x363938a8;
            auVar145._20_4_ = 0x363938a8;
            auVar145._24_4_ = 0x363938a8;
            auVar145._28_4_ = 0x363938a8;
            auVar145._32_4_ = 0x363938a8;
            auVar145._36_4_ = 0x363938a8;
            auVar145._40_4_ = 0x363938a8;
            auVar145._44_4_ = 0x363938a8;
            auVar145._48_4_ = 0x363938a8;
            auVar145._52_4_ = 0x363938a8;
            auVar145._56_4_ = 0x363938a8;
            auVar145._60_4_ = 0x363938a8;
            auVar114 = vaddps_avx512f(auVar114,auVar145);
            auVar209._8_4_ = 0xb48b634d;
            auVar209._0_8_ = 0xb48b634db48b634d;
            auVar209._12_4_ = 0xb48b634d;
            auVar209._16_4_ = 0xb48b634d;
            auVar209._20_4_ = 0xb48b634d;
            auVar209._24_4_ = 0xb48b634d;
            auVar209._28_4_ = 0xb48b634d;
            auVar209._32_4_ = 0xb48b634d;
            auVar209._36_4_ = 0xb48b634d;
            auVar209._40_4_ = 0xb48b634d;
            auVar209._44_4_ = 0xb48b634d;
            auVar209._48_4_ = 0xb48b634d;
            auVar209._52_4_ = 0xb48b634d;
            auVar209._56_4_ = 0xb48b634d;
            auVar209._60_4_ = 0xb48b634d;
            auVar135 = vmulps_avx512f(auVar85,auVar209);
            auVar84 = vpslld_avx512f(auVar84,0x1f);
            auVar49._8_4_ = 0x37cfab9c;
            auVar49._0_8_ = 0x37cfab9c37cfab9c;
            auVar49._12_4_ = 0x37cfab9c;
            auVar49._16_4_ = 0x37cfab9c;
            auVar49._20_4_ = 0x37cfab9c;
            auVar49._24_4_ = 0x37cfab9c;
            auVar49._28_4_ = 0x37cfab9c;
            auVar49._32_4_ = 0x37cfab9c;
            auVar49._36_4_ = 0x37cfab9c;
            auVar49._40_4_ = 0x37cfab9c;
            auVar49._44_4_ = 0x37cfab9c;
            auVar49._48_4_ = 0x37cfab9c;
            auVar49._52_4_ = 0x37cfab9c;
            auVar49._56_4_ = 0x37cfab9c;
            auVar49._60_4_ = 0x37cfab9c;
            auVar135 = vaddps_avx512f(auVar135,auVar49);
            auVar114 = vmulps_avx512f(auVar85,auVar114);
            auVar50._8_4_ = 0xb9501096;
            auVar50._0_8_ = 0xb9501096b9501096;
            auVar50._12_4_ = 0xb9501096;
            auVar50._16_4_ = 0xb9501096;
            auVar50._20_4_ = 0xb9501096;
            auVar50._24_4_ = 0xb9501096;
            auVar50._28_4_ = 0xb9501096;
            auVar50._32_4_ = 0xb9501096;
            auVar50._36_4_ = 0xb9501096;
            auVar50._40_4_ = 0xb9501096;
            auVar50._44_4_ = 0xb9501096;
            auVar50._48_4_ = 0xb9501096;
            auVar50._52_4_ = 0xb9501096;
            auVar50._56_4_ = 0xb9501096;
            auVar50._60_4_ = 0xb9501096;
            auVar114 = vaddps_avx512f(auVar114,auVar50);
            auVar135 = vmulps_avx512f(auVar85,auVar135);
            auVar51._8_4_ = 0xbab60981;
            auVar51._0_8_ = 0xbab60981bab60981;
            auVar51._12_4_ = 0xbab60981;
            auVar51._16_4_ = 0xbab60981;
            auVar51._20_4_ = 0xbab60981;
            auVar51._24_4_ = 0xbab60981;
            auVar51._28_4_ = 0xbab60981;
            auVar51._32_4_ = 0xbab60981;
            auVar51._36_4_ = 0xbab60981;
            auVar51._40_4_ = 0xbab60981;
            auVar51._44_4_ = 0xbab60981;
            auVar51._48_4_ = 0xbab60981;
            auVar51._52_4_ = 0xbab60981;
            auVar51._56_4_ = 0xbab60981;
            auVar51._60_4_ = 0xbab60981;
            auVar135 = vaddps_avx512f(auVar135,auVar51);
            auVar114 = vmulps_avx512f(auVar85,auVar114);
            auVar52._8_4_ = 0x3c088898;
            auVar52._0_8_ = 0x3c0888983c088898;
            auVar52._12_4_ = 0x3c088898;
            auVar52._16_4_ = 0x3c088898;
            auVar52._20_4_ = 0x3c088898;
            auVar52._24_4_ = 0x3c088898;
            auVar52._28_4_ = 0x3c088898;
            auVar52._32_4_ = 0x3c088898;
            auVar52._36_4_ = 0x3c088898;
            auVar52._40_4_ = 0x3c088898;
            auVar52._44_4_ = 0x3c088898;
            auVar52._48_4_ = 0x3c088898;
            auVar52._52_4_ = 0x3c088898;
            auVar52._56_4_ = 0x3c088898;
            auVar52._60_4_ = 0x3c088898;
            auVar114 = vaddps_avx512f(auVar114,auVar52);
            auVar135 = vmulps_avx512f(auVar85,auVar135);
            auVar53._8_4_ = 0x3d2aaaa4;
            auVar53._0_8_ = 0x3d2aaaa43d2aaaa4;
            auVar53._12_4_ = 0x3d2aaaa4;
            auVar53._16_4_ = 0x3d2aaaa4;
            auVar53._20_4_ = 0x3d2aaaa4;
            auVar53._24_4_ = 0x3d2aaaa4;
            auVar53._28_4_ = 0x3d2aaaa4;
            auVar53._32_4_ = 0x3d2aaaa4;
            auVar53._36_4_ = 0x3d2aaaa4;
            auVar53._40_4_ = 0x3d2aaaa4;
            auVar53._44_4_ = 0x3d2aaaa4;
            auVar53._48_4_ = 0x3d2aaaa4;
            auVar53._52_4_ = 0x3d2aaaa4;
            auVar53._56_4_ = 0x3d2aaaa4;
            auVar53._60_4_ = 0x3d2aaaa4;
            auVar135 = vaddps_avx512f(auVar135,auVar53);
            auVar114 = vmulps_avx512f(auVar85,auVar114);
            auVar54._8_4_ = 0xbe2aaaab;
            auVar54._0_8_ = 0xbe2aaaabbe2aaaab;
            auVar54._12_4_ = 0xbe2aaaab;
            auVar54._16_4_ = 0xbe2aaaab;
            auVar54._20_4_ = 0xbe2aaaab;
            auVar54._24_4_ = 0xbe2aaaab;
            auVar54._28_4_ = 0xbe2aaaab;
            auVar54._32_4_ = 0xbe2aaaab;
            auVar54._36_4_ = 0xbe2aaaab;
            auVar54._40_4_ = 0xbe2aaaab;
            auVar54._44_4_ = 0xbe2aaaab;
            auVar54._48_4_ = 0xbe2aaaab;
            auVar54._52_4_ = 0xbe2aaaab;
            auVar54._56_4_ = 0xbe2aaaab;
            auVar54._60_4_ = 0xbe2aaaab;
            auVar114 = vaddps_avx512f(auVar114,auVar54);
            uVar74 = vpmovd2m_avx512dq(auVar84);
            auVar84 = vmulps_avx512f(auVar85,auVar135);
            auVar135 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
            auVar84 = vaddps_avx512f(auVar84,auVar135);
            auVar114 = vmulps_avx512f(auVar85,auVar114);
            auVar84 = vmulps_avx512f(auVar85,auVar84);
            auVar85 = vaddps_avx512f(auVar114,auVar134);
            auVar82 = vmulps_avx512f(auVar82,auVar85);
            auVar84 = vaddps_avx512f(auVar84,auVar134);
            auVar114 = vblendmps_avx512f(auVar82,auVar84);
            bVar14 = (bool)((byte)uVar74 & 1);
            auVar160._0_4_ = (uint)bVar14 * auVar114._0_4_ | (uint)!bVar14 * auVar85._0_4_;
            bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar160._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * auVar85._4_4_;
            bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar160._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * auVar85._8_4_;
            bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar160._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * auVar85._12_4_;
            bVar14 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar160._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * auVar85._16_4_;
            bVar14 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar160._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * auVar85._20_4_;
            bVar14 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar160._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * auVar85._24_4_;
            bVar14 = (bool)((byte)(uVar74 >> 7) & 1);
            auVar160._28_4_ = (uint)bVar14 * auVar114._28_4_ | (uint)!bVar14 * auVar85._28_4_;
            bVar14 = (bool)((byte)(uVar74 >> 8) & 1);
            auVar160._32_4_ = (uint)bVar14 * auVar114._32_4_ | (uint)!bVar14 * auVar85._32_4_;
            bVar14 = (bool)((byte)(uVar74 >> 9) & 1);
            auVar160._36_4_ = (uint)bVar14 * auVar114._36_4_ | (uint)!bVar14 * auVar85._36_4_;
            bVar14 = (bool)((byte)(uVar74 >> 10) & 1);
            auVar160._40_4_ = (uint)bVar14 * auVar114._40_4_ | (uint)!bVar14 * auVar85._40_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xb) & 1);
            auVar160._44_4_ = (uint)bVar14 * auVar114._44_4_ | (uint)!bVar14 * auVar85._44_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xc) & 1);
            auVar160._48_4_ = (uint)bVar14 * auVar114._48_4_ | (uint)!bVar14 * auVar85._48_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xd) & 1);
            auVar160._52_4_ = (uint)bVar14 * auVar114._52_4_ | (uint)!bVar14 * auVar85._52_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xe) & 1);
            auVar160._56_4_ = (uint)bVar14 * auVar114._56_4_ | (uint)!bVar14 * auVar85._56_4_;
            bVar14 = (bool)((byte)(uVar74 >> 0xf) & 1);
            auVar160._60_4_ = (uint)bVar14 * auVar114._60_4_ | (uint)!bVar14 * auVar85._60_4_;
            bVar14 = (bool)((byte)uVar30 & 1);
            auVar161._0_4_ = (uint)bVar14 * auVar84._0_4_ | (uint)!bVar14 * auVar82._0_4_;
            bVar14 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar161._4_4_ = (uint)bVar14 * auVar84._4_4_ | (uint)!bVar14 * auVar82._4_4_;
            bVar14 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar161._8_4_ = (uint)bVar14 * auVar84._8_4_ | (uint)!bVar14 * auVar82._8_4_;
            bVar14 = (bool)((byte)(uVar30 >> 3) & 1);
            auVar161._12_4_ = (uint)bVar14 * auVar84._12_4_ | (uint)!bVar14 * auVar82._12_4_;
            bVar14 = (bool)((byte)(uVar30 >> 4) & 1);
            auVar161._16_4_ = (uint)bVar14 * auVar84._16_4_ | (uint)!bVar14 * auVar82._16_4_;
            bVar14 = (bool)((byte)(uVar30 >> 5) & 1);
            auVar161._20_4_ = (uint)bVar14 * auVar84._20_4_ | (uint)!bVar14 * auVar82._20_4_;
            bVar14 = (bool)((byte)(uVar30 >> 6) & 1);
            auVar161._24_4_ = (uint)bVar14 * auVar84._24_4_ | (uint)!bVar14 * auVar82._24_4_;
            bVar14 = (bool)((byte)(uVar30 >> 7) & 1);
            auVar161._28_4_ = (uint)bVar14 * auVar84._28_4_ | (uint)!bVar14 * auVar82._28_4_;
            bVar14 = (bool)((byte)(uVar30 >> 8) & 1);
            auVar161._32_4_ = (uint)bVar14 * auVar84._32_4_ | (uint)!bVar14 * auVar82._32_4_;
            bVar14 = (bool)((byte)(uVar30 >> 9) & 1);
            auVar161._36_4_ = (uint)bVar14 * auVar84._36_4_ | (uint)!bVar14 * auVar82._36_4_;
            bVar14 = (bool)((byte)(uVar30 >> 10) & 1);
            auVar161._40_4_ = (uint)bVar14 * auVar84._40_4_ | (uint)!bVar14 * auVar82._40_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xb) & 1);
            auVar161._44_4_ = (uint)bVar14 * auVar84._44_4_ | (uint)!bVar14 * auVar82._44_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xc) & 1);
            auVar161._48_4_ = (uint)bVar14 * auVar84._48_4_ | (uint)!bVar14 * auVar82._48_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xd) & 1);
            auVar161._52_4_ = (uint)bVar14 * auVar84._52_4_ | (uint)!bVar14 * auVar82._52_4_;
            bVar14 = (bool)((byte)(uVar30 >> 0xe) & 1);
            auVar161._56_4_ = (uint)bVar14 * auVar84._56_4_ | (uint)!bVar14 * auVar82._56_4_;
            bVar14 = SUB81(uVar30 >> 0xf,0);
            auVar161._60_4_ = (uint)bVar14 * auVar84._60_4_ | (uint)!bVar14 * auVar82._60_4_;
            auVar82 = vxorps_avx512dq(auVar83,auVar86);
            bVar13 = (byte)uVar66;
            auVar162._0_4_ =
                 (uint)(bVar13 & 1) * auVar82._0_4_ | !(bool)(bVar13 & 1) * auVar83._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar162._4_4_ = (uint)bVar14 * auVar82._4_4_ | !bVar14 * auVar83._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar162._8_4_ = (uint)bVar14 * auVar82._8_4_ | !bVar14 * auVar83._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar162._12_4_ = (uint)bVar14 * auVar82._12_4_ | !bVar14 * auVar83._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar162._16_4_ = (uint)bVar14 * auVar82._16_4_ | !bVar14 * auVar83._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar162._20_4_ = (uint)bVar14 * auVar82._20_4_ | !bVar14 * auVar83._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar162._24_4_ = (uint)bVar14 * auVar82._24_4_ | !bVar14 * auVar83._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar162._28_4_ = (uint)bVar14 * auVar82._28_4_ | !bVar14 * auVar83._28_4_;
            bVar21 = (byte)(uVar66 >> 8);
            auVar162._32_4_ =
                 (uint)(bVar21 & 1) * auVar82._32_4_ | !(bool)(bVar21 & 1) * auVar83._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar162._36_4_ = (uint)bVar14 * auVar82._36_4_ | !bVar14 * auVar83._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar162._40_4_ = (uint)bVar14 * auVar82._40_4_ | !bVar14 * auVar83._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar162._44_4_ = (uint)bVar14 * auVar82._44_4_ | !bVar14 * auVar83._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar162._48_4_ = (uint)bVar14 * auVar82._48_4_ | !bVar14 * auVar83._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar162._52_4_ = (uint)bVar14 * auVar82._52_4_ | !bVar14 * auVar83._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar162._56_4_ = (uint)bVar14 * auVar82._56_4_ | !bVar14 * auVar83._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar162._60_4_ = (uint)bVar14 * auVar82._60_4_ | !bVar14 * auVar83._60_4_;
            auVar83 = vxorps_avx512dq(auVar123,auVar86);
            auVar163._0_4_ =
                 (uint)(bVar13 & 1) * auVar83._0_4_ | !(bool)(bVar13 & 1) * auVar123._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar163._4_4_ = (uint)bVar14 * auVar83._4_4_ | !bVar14 * auVar123._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar163._8_4_ = (uint)bVar14 * auVar83._8_4_ | !bVar14 * auVar123._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar163._12_4_ = (uint)bVar14 * auVar83._12_4_ | !bVar14 * auVar123._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar163._16_4_ = (uint)bVar14 * auVar83._16_4_ | !bVar14 * auVar123._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar163._20_4_ = (uint)bVar14 * auVar83._20_4_ | !bVar14 * auVar123._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar163._24_4_ = (uint)bVar14 * auVar83._24_4_ | !bVar14 * auVar123._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar163._28_4_ = (uint)bVar14 * auVar83._28_4_ | !bVar14 * auVar123._28_4_;
            auVar163._32_4_ =
                 (uint)(bVar21 & 1) * auVar83._32_4_ | !(bool)(bVar21 & 1) * auVar123._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar163._36_4_ = (uint)bVar14 * auVar83._36_4_ | !bVar14 * auVar123._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar163._40_4_ = (uint)bVar14 * auVar83._40_4_ | !bVar14 * auVar123._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar163._44_4_ = (uint)bVar14 * auVar83._44_4_ | !bVar14 * auVar123._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar163._48_4_ = (uint)bVar14 * auVar83._48_4_ | !bVar14 * auVar123._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar163._52_4_ = (uint)bVar14 * auVar83._52_4_ | !bVar14 * auVar123._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar163._56_4_ = (uint)bVar14 * auVar83._56_4_ | !bVar14 * auVar123._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar163._60_4_ = (uint)bVar14 * auVar83._60_4_ | !bVar14 * auVar123._60_4_;
            auVar83 = vxorps_avx512dq(auVar132,auVar86);
            auVar164._0_4_ =
                 (uint)(bVar13 & 1) * auVar83._0_4_ | !(bool)(bVar13 & 1) * auVar132._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar164._4_4_ = (uint)bVar14 * auVar83._4_4_ | !bVar14 * auVar132._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar164._8_4_ = (uint)bVar14 * auVar83._8_4_ | !bVar14 * auVar132._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar164._12_4_ = (uint)bVar14 * auVar83._12_4_ | !bVar14 * auVar132._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar164._16_4_ = (uint)bVar14 * auVar83._16_4_ | !bVar14 * auVar132._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar164._20_4_ = (uint)bVar14 * auVar83._20_4_ | !bVar14 * auVar132._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar164._24_4_ = (uint)bVar14 * auVar83._24_4_ | !bVar14 * auVar132._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar164._28_4_ = (uint)bVar14 * auVar83._28_4_ | !bVar14 * auVar132._28_4_;
            auVar164._32_4_ =
                 (uint)(bVar21 & 1) * auVar83._32_4_ | !(bool)(bVar21 & 1) * auVar132._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar164._36_4_ = (uint)bVar14 * auVar83._36_4_ | !bVar14 * auVar132._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar164._40_4_ = (uint)bVar14 * auVar83._40_4_ | !bVar14 * auVar132._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar164._44_4_ = (uint)bVar14 * auVar83._44_4_ | !bVar14 * auVar132._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar164._48_4_ = (uint)bVar14 * auVar83._48_4_ | !bVar14 * auVar132._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar164._52_4_ = (uint)bVar14 * auVar83._52_4_ | !bVar14 * auVar132._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar164._56_4_ = (uint)bVar14 * auVar83._56_4_ | !bVar14 * auVar132._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar164._60_4_ = (uint)bVar14 * auVar83._60_4_ | !bVar14 * auVar132._60_4_;
            auVar83 = vxorps_avx512dq(auVar133,auVar86);
            auVar165._0_4_ =
                 (uint)(bVar13 & 1) * auVar83._0_4_ | !(bool)(bVar13 & 1) * auVar133._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar165._4_4_ = (uint)bVar14 * auVar83._4_4_ | !bVar14 * auVar133._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar165._8_4_ = (uint)bVar14 * auVar83._8_4_ | !bVar14 * auVar133._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar165._12_4_ = (uint)bVar14 * auVar83._12_4_ | !bVar14 * auVar133._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar165._16_4_ = (uint)bVar14 * auVar83._16_4_ | !bVar14 * auVar133._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar165._20_4_ = (uint)bVar14 * auVar83._20_4_ | !bVar14 * auVar133._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar165._24_4_ = (uint)bVar14 * auVar83._24_4_ | !bVar14 * auVar133._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar165._28_4_ = (uint)bVar14 * auVar83._28_4_ | !bVar14 * auVar133._28_4_;
            auVar165._32_4_ =
                 (uint)(bVar21 & 1) * auVar83._32_4_ | !(bool)(bVar21 & 1) * auVar133._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar165._36_4_ = (uint)bVar14 * auVar83._36_4_ | !bVar14 * auVar133._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar165._40_4_ = (uint)bVar14 * auVar83._40_4_ | !bVar14 * auVar133._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar165._44_4_ = (uint)bVar14 * auVar83._44_4_ | !bVar14 * auVar133._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar165._48_4_ = (uint)bVar14 * auVar83._48_4_ | !bVar14 * auVar133._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar165._52_4_ = (uint)bVar14 * auVar83._52_4_ | !bVar14 * auVar133._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar165._56_4_ = (uint)bVar14 * auVar83._56_4_ | !bVar14 * auVar133._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar165._60_4_ = (uint)bVar14 * auVar83._60_4_ | !bVar14 * auVar133._60_4_;
            auVar83 = vxorps_avx512dq(auVar160,auVar86);
            bVar14 = (bool)((byte)uVar69 & 1);
            auVar166._0_4_ = (uint)bVar14 * auVar83._0_4_ | !bVar14 * auVar160._0_4_;
            bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
            auVar166._4_4_ = (uint)bVar14 * auVar83._4_4_ | !bVar14 * auVar160._4_4_;
            bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
            auVar166._8_4_ = (uint)bVar14 * auVar83._8_4_ | !bVar14 * auVar160._8_4_;
            bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
            auVar166._12_4_ = (uint)bVar14 * auVar83._12_4_ | !bVar14 * auVar160._12_4_;
            bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
            auVar166._16_4_ = (uint)bVar14 * auVar83._16_4_ | !bVar14 * auVar160._16_4_;
            bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
            auVar166._20_4_ = (uint)bVar14 * auVar83._20_4_ | !bVar14 * auVar160._20_4_;
            bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
            auVar166._24_4_ = (uint)bVar14 * auVar83._24_4_ | !bVar14 * auVar160._24_4_;
            bVar14 = (bool)((byte)(uVar69 >> 7) & 1);
            auVar166._28_4_ = (uint)bVar14 * auVar83._28_4_ | !bVar14 * auVar160._28_4_;
            bVar14 = (bool)((byte)(uVar69 >> 8) & 1);
            auVar166._32_4_ = (uint)bVar14 * auVar83._32_4_ | !bVar14 * auVar160._32_4_;
            bVar14 = (bool)((byte)(uVar69 >> 9) & 1);
            auVar166._36_4_ = (uint)bVar14 * auVar83._36_4_ | !bVar14 * auVar160._36_4_;
            bVar14 = (bool)((byte)(uVar69 >> 10) & 1);
            auVar166._40_4_ = (uint)bVar14 * auVar83._40_4_ | !bVar14 * auVar160._40_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xb) & 1);
            auVar166._44_4_ = (uint)bVar14 * auVar83._44_4_ | !bVar14 * auVar160._44_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xc) & 1);
            auVar166._48_4_ = (uint)bVar14 * auVar83._48_4_ | !bVar14 * auVar160._48_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xd) & 1);
            auVar166._52_4_ = (uint)bVar14 * auVar83._52_4_ | !bVar14 * auVar160._52_4_;
            bVar14 = (bool)((byte)(uVar69 >> 0xe) & 1);
            auVar166._56_4_ = (uint)bVar14 * auVar83._56_4_ | !bVar14 * auVar160._56_4_;
            bVar14 = SUB81(uVar69 >> 0xf,0);
            auVar166._60_4_ = (uint)bVar14 * auVar83._60_4_ | !bVar14 * auVar160._60_4_;
            auVar83 = vxorps_avx512dq(auVar161,auVar86);
            bVar14 = (bool)((byte)uVar28 & 1);
            auVar167._0_4_ = (uint)bVar14 * auVar83._0_4_ | !bVar14 * auVar161._0_4_;
            bVar14 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar167._4_4_ = (uint)bVar14 * auVar83._4_4_ | !bVar14 * auVar161._4_4_;
            bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar167._8_4_ = (uint)bVar14 * auVar83._8_4_ | !bVar14 * auVar161._8_4_;
            bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
            auVar167._12_4_ = (uint)bVar14 * auVar83._12_4_ | !bVar14 * auVar161._12_4_;
            bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
            auVar167._16_4_ = (uint)bVar14 * auVar83._16_4_ | !bVar14 * auVar161._16_4_;
            bVar14 = (bool)((byte)(uVar28 >> 5) & 1);
            auVar167._20_4_ = (uint)bVar14 * auVar83._20_4_ | !bVar14 * auVar161._20_4_;
            bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
            auVar167._24_4_ = (uint)bVar14 * auVar83._24_4_ | !bVar14 * auVar161._24_4_;
            bVar14 = (bool)((byte)(uVar28 >> 7) & 1);
            auVar167._28_4_ = (uint)bVar14 * auVar83._28_4_ | !bVar14 * auVar161._28_4_;
            bVar14 = (bool)((byte)(uVar28 >> 8) & 1);
            auVar167._32_4_ = (uint)bVar14 * auVar83._32_4_ | !bVar14 * auVar161._32_4_;
            bVar14 = (bool)((byte)(uVar28 >> 9) & 1);
            auVar167._36_4_ = (uint)bVar14 * auVar83._36_4_ | !bVar14 * auVar161._36_4_;
            bVar14 = (bool)((byte)(uVar28 >> 10) & 1);
            auVar167._40_4_ = (uint)bVar14 * auVar83._40_4_ | !bVar14 * auVar161._40_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xb) & 1);
            auVar167._44_4_ = (uint)bVar14 * auVar83._44_4_ | !bVar14 * auVar161._44_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xc) & 1);
            auVar167._48_4_ = (uint)bVar14 * auVar83._48_4_ | !bVar14 * auVar161._48_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xd) & 1);
            auVar167._52_4_ = (uint)bVar14 * auVar83._52_4_ | !bVar14 * auVar161._52_4_;
            bVar14 = (bool)((byte)(uVar28 >> 0xe) & 1);
            auVar167._56_4_ = (uint)bVar14 * auVar83._56_4_ | !bVar14 * auVar161._56_4_;
            bVar14 = SUB81(uVar28 >> 0xf,0);
            auVar167._60_4_ = (uint)bVar14 * auVar83._60_4_ | !bVar14 * auVar161._60_4_;
            auVar83 = vfmsub213ps_avx512f(auVar119,auVar116,auVar162);
            auVar82 = vfmsub213ps_avx512f(auVar115,auVar116,auVar163);
            auVar84 = vmulps_avx512f(auVar83,auVar83);
            auVar85 = vmulps_avx512f(auVar82,auVar82);
            auVar84 = vaddps_avx512f(auVar84,auVar85);
            auVar85 = vfmsub213ps_avx512f(auVar117,auVar116,auVar164);
            auVar86 = vmulps_avx512f(auVar85,auVar85);
            auVar84 = vaddps_avx512f(auVar86,auVar84);
            auVar86 = vfmsub213ps_avx512f(auVar118,auVar116,auVar165);
            auVar114 = vmulps_avx512f(auVar86,auVar86);
            auVar84 = vaddps_avx512f(auVar114,auVar84);
            auVar114 = vrsqrt14ps_avx512f(auVar84);
            auVar84 = vmulps_avx512f(auVar84,auVar135);
            auVar84 = vmulps_avx512f(auVar84,auVar114);
            auVar123 = vmulps_avx512f(auVar114,auVar114);
            auVar84 = vmulps_avx512f(auVar84,auVar123);
            auVar123 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
            auVar84 = vfmadd231ps_avx512f(auVar84,auVar123,auVar114);
            auVar83 = vmulps_avx512f(auVar83,auVar84);
            auVar82 = vmulps_avx512f(auVar82,auVar84);
            auVar85 = vmulps_avx512f(auVar85,auVar84);
            auVar84 = vmulps_avx512f(auVar86,auVar84);
            auVar83 = vmulps_avx512f(auVar83,auVar166);
            auVar82 = vmulps_avx512f(auVar82,auVar166);
            auVar85 = vmulps_avx512f(auVar85,auVar166);
            auVar84 = vmulps_avx512f(auVar84,auVar166);
            auVar83 = vfmsub231ps_avx512f(auVar83,auVar167,auVar119);
            auVar82 = vfmsub231ps_avx512f(auVar82,auVar167,auVar115);
            auVar85 = vfmsub231ps_avx512f(auVar85,auVar167,auVar117);
            auVar84 = vfmsub231ps_avx512f(auVar84,auVar118,auVar167);
            auVar86 = vsubps_avx512f(auVar162,auVar119);
            auVar86 = vfmadd213ps_avx512f(auVar86,auVar81,auVar119);
            auVar114 = vsubps_avx512f(auVar163,auVar115);
            auVar114 = vfmadd213ps_avx512f(auVar114,auVar81,auVar115);
            auVar115 = vsubps_avx512f(auVar164,auVar117);
            auVar115 = vfmadd213ps_avx512f(auVar115,auVar81,auVar117);
            auVar117 = vsubps_avx512f(auVar165,auVar118);
            auVar117 = vfmadd213ps_avx512f(auVar117,auVar81,auVar118);
            auVar118 = vmulps_avx512f(auVar86,auVar86);
            auVar119 = vmulps_avx512f(auVar114,auVar114);
            auVar118 = vaddps_avx512f(auVar118,auVar119);
            auVar119 = vmulps_avx512f(auVar115,auVar115);
            auVar118 = vaddps_avx512f(auVar119,auVar118);
            auVar119 = vmulps_avx512f(auVar117,auVar117);
            auVar118 = vaddps_avx512f(auVar119,auVar118);
            auVar119 = vmulps_avx512f(auVar118,auVar135);
            auVar118 = vrsqrt14ps_avx512f(auVar118);
            auVar119 = vmulps_avx512f(auVar119,auVar118);
            auVar132 = vmulps_avx512f(auVar118,auVar118);
            auVar119 = vmulps_avx512f(auVar119,auVar132);
            auVar118 = vfmadd231ps_avx512f(auVar119,auVar118,auVar123);
            auVar55._8_4_ = 0x3f7fdf3b;
            auVar55._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar55._12_4_ = 0x3f7fdf3b;
            auVar55._16_4_ = 0x3f7fdf3b;
            auVar55._20_4_ = 0x3f7fdf3b;
            auVar55._24_4_ = 0x3f7fdf3b;
            auVar55._28_4_ = 0x3f7fdf3b;
            auVar55._32_4_ = 0x3f7fdf3b;
            auVar55._36_4_ = 0x3f7fdf3b;
            auVar55._40_4_ = 0x3f7fdf3b;
            auVar55._44_4_ = 0x3f7fdf3b;
            auVar55._48_4_ = 0x3f7fdf3b;
            auVar55._52_4_ = 0x3f7fdf3b;
            auVar55._56_4_ = 0x3f7fdf3b;
            auVar55._60_4_ = 0x3f7fdf3b;
            uVar66 = vcmpps_avx512f(auVar116,auVar55,6);
            auVar86 = vmulps_avx512f(auVar86,auVar118);
            bVar13 = (byte)uVar66;
            auVar168._0_4_ =
                 (uint)(bVar13 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar83._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar168._4_4_ = (uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * auVar83._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar168._8_4_ = (uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * auVar83._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar168._12_4_ = (uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * auVar83._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar168._16_4_ = (uint)bVar14 * auVar86._16_4_ | (uint)!bVar14 * auVar83._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar168._20_4_ = (uint)bVar14 * auVar86._20_4_ | (uint)!bVar14 * auVar83._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar168._24_4_ = (uint)bVar14 * auVar86._24_4_ | (uint)!bVar14 * auVar83._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar168._28_4_ = (uint)bVar14 * auVar86._28_4_ | (uint)!bVar14 * auVar83._28_4_;
            bVar21 = (byte)(uVar66 >> 8);
            auVar168._32_4_ =
                 (uint)(bVar21 & 1) * auVar86._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar83._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar168._36_4_ = (uint)bVar14 * auVar86._36_4_ | (uint)!bVar14 * auVar83._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar168._40_4_ = (uint)bVar14 * auVar86._40_4_ | (uint)!bVar14 * auVar83._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar168._44_4_ = (uint)bVar14 * auVar86._44_4_ | (uint)!bVar14 * auVar83._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar168._48_4_ = (uint)bVar14 * auVar86._48_4_ | (uint)!bVar14 * auVar83._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar168._52_4_ = (uint)bVar14 * auVar86._52_4_ | (uint)!bVar14 * auVar83._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar168._56_4_ = (uint)bVar14 * auVar86._56_4_ | (uint)!bVar14 * auVar83._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar168._60_4_ = (uint)bVar14 * auVar86._60_4_ | (uint)!bVar14 * auVar83._60_4_;
            auVar83 = vmulps_avx512f(auVar114,auVar118);
            auVar169._0_4_ =
                 (uint)(bVar13 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar82._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar169._4_4_ = (uint)bVar14 * auVar83._4_4_ | (uint)!bVar14 * auVar82._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar169._8_4_ = (uint)bVar14 * auVar83._8_4_ | (uint)!bVar14 * auVar82._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar169._12_4_ = (uint)bVar14 * auVar83._12_4_ | (uint)!bVar14 * auVar82._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar169._16_4_ = (uint)bVar14 * auVar83._16_4_ | (uint)!bVar14 * auVar82._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar169._20_4_ = (uint)bVar14 * auVar83._20_4_ | (uint)!bVar14 * auVar82._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar169._24_4_ = (uint)bVar14 * auVar83._24_4_ | (uint)!bVar14 * auVar82._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar169._28_4_ = (uint)bVar14 * auVar83._28_4_ | (uint)!bVar14 * auVar82._28_4_;
            auVar169._32_4_ =
                 (uint)(bVar21 & 1) * auVar83._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar82._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar169._36_4_ = (uint)bVar14 * auVar83._36_4_ | (uint)!bVar14 * auVar82._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar169._40_4_ = (uint)bVar14 * auVar83._40_4_ | (uint)!bVar14 * auVar82._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar169._44_4_ = (uint)bVar14 * auVar83._44_4_ | (uint)!bVar14 * auVar82._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar169._48_4_ = (uint)bVar14 * auVar83._48_4_ | (uint)!bVar14 * auVar82._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar169._52_4_ = (uint)bVar14 * auVar83._52_4_ | (uint)!bVar14 * auVar82._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar169._56_4_ = (uint)bVar14 * auVar83._56_4_ | (uint)!bVar14 * auVar82._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar169._60_4_ = (uint)bVar14 * auVar83._60_4_ | (uint)!bVar14 * auVar82._60_4_;
            auVar83 = vmulps_avx512f(auVar115,auVar118);
            auVar170._0_4_ =
                 (uint)(bVar13 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar85._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar170._4_4_ = (uint)bVar14 * auVar83._4_4_ | (uint)!bVar14 * auVar85._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar170._8_4_ = (uint)bVar14 * auVar83._8_4_ | (uint)!bVar14 * auVar85._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar170._12_4_ = (uint)bVar14 * auVar83._12_4_ | (uint)!bVar14 * auVar85._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar170._16_4_ = (uint)bVar14 * auVar83._16_4_ | (uint)!bVar14 * auVar85._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar170._20_4_ = (uint)bVar14 * auVar83._20_4_ | (uint)!bVar14 * auVar85._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar170._24_4_ = (uint)bVar14 * auVar83._24_4_ | (uint)!bVar14 * auVar85._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar170._28_4_ = (uint)bVar14 * auVar83._28_4_ | (uint)!bVar14 * auVar85._28_4_;
            auVar170._32_4_ =
                 (uint)(bVar21 & 1) * auVar83._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar85._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar170._36_4_ = (uint)bVar14 * auVar83._36_4_ | (uint)!bVar14 * auVar85._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar170._40_4_ = (uint)bVar14 * auVar83._40_4_ | (uint)!bVar14 * auVar85._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar170._44_4_ = (uint)bVar14 * auVar83._44_4_ | (uint)!bVar14 * auVar85._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar170._48_4_ = (uint)bVar14 * auVar83._48_4_ | (uint)!bVar14 * auVar85._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar170._52_4_ = (uint)bVar14 * auVar83._52_4_ | (uint)!bVar14 * auVar85._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar170._56_4_ = (uint)bVar14 * auVar83._56_4_ | (uint)!bVar14 * auVar85._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar170._60_4_ = (uint)bVar14 * auVar83._60_4_ | (uint)!bVar14 * auVar85._60_4_;
            auVar83 = vmulps_avx512f(auVar117,auVar118);
            auVar171._0_4_ =
                 (uint)(bVar13 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar84._0_4_;
            bVar14 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar171._4_4_ = (uint)bVar14 * auVar83._4_4_ | (uint)!bVar14 * auVar84._4_4_;
            bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar171._8_4_ = (uint)bVar14 * auVar83._8_4_ | (uint)!bVar14 * auVar84._8_4_;
            bVar14 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar171._12_4_ = (uint)bVar14 * auVar83._12_4_ | (uint)!bVar14 * auVar84._12_4_;
            bVar14 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar171._16_4_ = (uint)bVar14 * auVar83._16_4_ | (uint)!bVar14 * auVar84._16_4_;
            bVar14 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar171._20_4_ = (uint)bVar14 * auVar83._20_4_ | (uint)!bVar14 * auVar84._20_4_;
            bVar14 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar171._24_4_ = (uint)bVar14 * auVar83._24_4_ | (uint)!bVar14 * auVar84._24_4_;
            bVar14 = (bool)((byte)(uVar66 >> 7) & 1);
            auVar171._28_4_ = (uint)bVar14 * auVar83._28_4_ | (uint)!bVar14 * auVar84._28_4_;
            auVar171._32_4_ =
                 (uint)(bVar21 & 1) * auVar83._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar84._32_4_;
            bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
            auVar171._36_4_ = (uint)bVar14 * auVar83._36_4_ | (uint)!bVar14 * auVar84._36_4_;
            bVar14 = (bool)((byte)(uVar66 >> 10) & 1);
            auVar171._40_4_ = (uint)bVar14 * auVar83._40_4_ | (uint)!bVar14 * auVar84._40_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xb) & 1);
            auVar171._44_4_ = (uint)bVar14 * auVar83._44_4_ | (uint)!bVar14 * auVar84._44_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xc) & 1);
            auVar171._48_4_ = (uint)bVar14 * auVar83._48_4_ | (uint)!bVar14 * auVar84._48_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xd) & 1);
            auVar171._52_4_ = (uint)bVar14 * auVar83._52_4_ | (uint)!bVar14 * auVar84._52_4_;
            bVar14 = (bool)((byte)(uVar66 >> 0xe) & 1);
            auVar171._56_4_ = (uint)bVar14 * auVar83._56_4_ | (uint)!bVar14 * auVar84._56_4_;
            bVar14 = SUB81(uVar66 >> 0xf,0);
            auVar171._60_4_ = (uint)bVar14 * auVar83._60_4_ | (uint)!bVar14 * auVar84._60_4_;
            auVar83 = vsubps_avx512f(auVar134,auVar81);
            auVar82 = vmulps_avx512f(auVar81,auVar120);
            auVar82 = vfmadd213ps_avx512f(auVar113,auVar83,auVar82);
            auVar84 = vmulps_avx512f(auVar81,auVar121);
            auVar57._4_4_ = uStack_2bc;
            auVar57._0_4_ = local_2c0;
            auVar57._8_4_ = uStack_2b8;
            auVar57._12_4_ = uStack_2b4;
            auVar57._16_4_ = uStack_2b0;
            auVar57._20_4_ = uStack_2ac;
            auVar57._24_4_ = uStack_2a8;
            auVar57._28_4_ = uStack_2a4;
            auVar57._32_4_ = uStack_2a0;
            auVar57._36_4_ = uStack_29c;
            auVar57._40_4_ = uStack_298;
            auVar57._44_4_ = uStack_294;
            auVar57._48_4_ = uStack_290;
            auVar57._52_4_ = uStack_28c;
            auVar57._56_4_ = uStack_288;
            auVar57._60_4_ = uStack_284;
            auVar84 = vfmadd213ps_avx512f(auVar57,auVar83,auVar84);
            auVar85 = vmulps_avx512f(auVar81,auVar122);
            auVar58._4_4_ = uStack_27c;
            auVar58._0_4_ = local_280;
            auVar58._8_4_ = uStack_278;
            auVar58._12_4_ = uStack_274;
            auVar58._16_4_ = uStack_270;
            auVar58._20_4_ = uStack_26c;
            auVar58._24_4_ = uStack_268;
            auVar58._28_4_ = uStack_264;
            auVar58._32_4_ = uStack_260;
            auVar58._36_4_ = uStack_25c;
            auVar58._40_4_ = uStack_258;
            auVar58._44_4_ = uStack_254;
            auVar58._48_4_ = uStack_250;
            auVar58._52_4_ = uStack_24c;
            auVar58._56_4_ = uStack_248;
            auVar58._60_4_ = uStack_244;
            auVar85 = vfmadd213ps_avx512f(auVar58,auVar83,auVar85);
            auVar86 = vmulps_avx512f(auVar81,auVar124);
            auVar114 = vmulps_avx512f(auVar81,auVar129);
            auVar116 = vmulps_avx512f(auVar81,auVar130);
            auVar86 = vfmadd213ps_avx512f(local_400,auVar83,auVar86);
            auVar114 = vfmadd213ps_avx512f(local_480,auVar83,auVar114);
            auVar56._4_4_ = uStack_33c;
            auVar56._0_4_ = local_340;
            auVar56._8_4_ = uStack_338;
            auVar56._12_4_ = uStack_334;
            auVar56._16_4_ = uStack_330;
            auVar56._20_4_ = uStack_32c;
            auVar56._24_4_ = uStack_328;
            auVar56._28_4_ = uStack_324;
            auVar56._32_4_ = uStack_320;
            auVar56._36_4_ = uStack_31c;
            auVar56._40_4_ = uStack_318;
            auVar56._44_4_ = uStack_314;
            auVar56._48_4_ = uStack_310;
            auVar56._52_4_ = uStack_30c;
            auVar56._56_4_ = uStack_308;
            auVar56._60_4_ = uStack_304;
            auVar116 = vfmadd213ps_avx512f(auVar56,auVar83,auVar116);
            auVar59._4_4_ = uStack_23c;
            auVar59._0_4_ = local_240;
            auVar59._8_4_ = uStack_238;
            auVar59._12_4_ = uStack_234;
            auVar59._16_4_ = uStack_230;
            auVar59._20_4_ = uStack_22c;
            auVar59._24_4_ = uStack_228;
            auVar59._28_4_ = uStack_224;
            auVar59._32_4_ = uStack_220;
            auVar59._36_4_ = uStack_21c;
            auVar59._40_4_ = uStack_218;
            auVar59._44_4_ = uStack_214;
            auVar59._48_4_ = uStack_210;
            auVar59._52_4_ = uStack_20c;
            auVar59._56_4_ = uStack_208;
            auVar59._60_4_ = uStack_204;
            auVar113 = vmulps_avx512f(auVar81,auVar59);
            auVar60._4_4_ = uStack_1fc;
            auVar60._0_4_ = local_200;
            auVar60._8_4_ = uStack_1f8;
            auVar60._12_4_ = uStack_1f4;
            auVar60._16_4_ = uStack_1f0;
            auVar60._20_4_ = uStack_1ec;
            auVar60._24_4_ = uStack_1e8;
            auVar60._28_4_ = uStack_1e4;
            auVar60._32_4_ = uStack_1e0;
            auVar60._36_4_ = uStack_1dc;
            auVar60._40_4_ = uStack_1d8;
            auVar60._44_4_ = uStack_1d4;
            auVar60._48_4_ = uStack_1d0;
            auVar60._52_4_ = uStack_1cc;
            auVar60._56_4_ = uStack_1c8;
            auVar60._60_4_ = uStack_1c4;
            auVar115 = vmulps_avx512f(auVar81,auVar60);
            auVar61._4_4_ = uStack_1bc;
            auVar61._0_4_ = local_1c0;
            auVar61._8_4_ = uStack_1b8;
            auVar61._12_4_ = uStack_1b4;
            auVar61._16_4_ = uStack_1b0;
            auVar61._20_4_ = uStack_1ac;
            auVar61._24_4_ = uStack_1a8;
            auVar61._28_4_ = uStack_1a4;
            auVar61._32_4_ = uStack_1a0;
            auVar61._36_4_ = uStack_19c;
            auVar61._40_4_ = uStack_198;
            auVar61._44_4_ = uStack_194;
            auVar61._48_4_ = uStack_190;
            auVar61._52_4_ = uStack_18c;
            auVar61._56_4_ = uStack_188;
            auVar61._60_4_ = uStack_184;
            auVar117 = vmulps_avx512f(auVar81,auVar61);
            auVar113 = vfmadd213ps_avx512f(local_500,auVar83,auVar113);
            auVar115 = vfmadd213ps_avx512f(local_380,auVar83,auVar115);
            auVar117 = vfmadd213ps_avx512f(local_3c0,auVar83,auVar117);
            auVar62._4_4_ = uStack_17c;
            auVar62._0_4_ = local_180;
            auVar62._8_4_ = uStack_178;
            auVar62._12_4_ = uStack_174;
            auVar62._16_4_ = uStack_170;
            auVar62._20_4_ = uStack_16c;
            auVar62._24_4_ = uStack_168;
            auVar62._28_4_ = uStack_164;
            auVar62._32_4_ = uStack_160;
            auVar62._36_4_ = uStack_15c;
            auVar62._40_4_ = uStack_158;
            auVar62._44_4_ = uStack_154;
            auVar62._48_4_ = uStack_150;
            auVar62._52_4_ = uStack_14c;
            auVar62._56_4_ = uStack_148;
            auVar62._60_4_ = uStack_144;
            auVar118 = vmulps_avx512f(auVar81,auVar62);
            auVar63._4_4_ = uStack_13c;
            auVar63._0_4_ = local_140;
            auVar63._8_4_ = uStack_138;
            auVar63._12_4_ = uStack_134;
            auVar63._16_4_ = uStack_130;
            auVar63._20_4_ = uStack_12c;
            auVar63._24_4_ = uStack_128;
            auVar63._28_4_ = uStack_124;
            auVar63._32_4_ = uStack_120;
            auVar63._36_4_ = uStack_11c;
            auVar63._40_4_ = uStack_118;
            auVar63._44_4_ = uStack_114;
            auVar63._48_4_ = uStack_110;
            auVar63._52_4_ = uStack_10c;
            auVar63._56_4_ = uStack_108;
            auVar63._60_4_ = uStack_104;
            auVar119 = vmulps_avx512f(auVar81,auVar63);
            auVar64._4_4_ = uStack_fc;
            auVar64._0_4_ = local_100;
            auVar64._8_4_ = uStack_f8;
            auVar64._12_4_ = uStack_f4;
            auVar64._16_4_ = uStack_f0;
            auVar64._20_4_ = uStack_ec;
            auVar64._24_4_ = uStack_e8;
            auVar64._28_4_ = uStack_e4;
            auVar64._32_4_ = uStack_e0;
            auVar64._36_4_ = uStack_dc;
            auVar64._40_4_ = uStack_d8;
            auVar64._44_4_ = uStack_d4;
            auVar64._48_4_ = uStack_d0;
            auVar64._52_4_ = uStack_cc;
            auVar64._56_4_ = uStack_c8;
            auVar64._60_4_ = uStack_c4;
            auVar81 = vmulps_avx512f(auVar81,auVar64);
            auVar118 = vfmadd213ps_avx512f(local_4c0,auVar83,auVar118);
            auVar119 = vfmadd213ps_avx512f(local_540,auVar83,auVar119);
            auVar81 = vfmadd213ps_avx512f(local_440,auVar83,auVar81);
            auVar83 = vmulps_avx512f(auVar168,auVar168);
            auVar120 = vmulps_avx512f(auVar169,auVar169);
            auVar121 = vaddps_avx512f(auVar83,auVar120);
            auVar122 = vmulps_avx512f(auVar170,auVar170);
            auVar121 = vsubps_avx512f(auVar121,auVar122);
            auVar123 = vmulps_avx512f(auVar171,auVar171);
            auVar121 = vsubps_avx512f(auVar121,auVar123);
            auVar124 = vmulps_avx512f(auVar169,auVar170);
            auVar129 = vmulps_avx512f(auVar168,auVar171);
            auVar130 = vaddps_avx512f(auVar124,auVar129);
            auVar130 = vaddps_avx512f(auVar130,auVar130);
            auVar132 = vmulps_avx512f(auVar169,auVar171);
            auVar133 = vmulps_avx512f(auVar168,auVar170);
            auVar134 = vsubps_avx512f(auVar132,auVar133);
            auVar134 = vaddps_avx512f(auVar134,auVar134);
            auVar124 = vsubps_avx512f(auVar124,auVar129);
            auVar124 = vaddps_avx512f(auVar124,auVar124);
            auVar83 = vsubps_avx512f(auVar83,auVar120);
            auVar120 = vaddps_avx512f(auVar122,auVar83);
            auVar120 = vsubps_avx512f(auVar120,auVar123);
            auVar129 = vmulps_avx512f(auVar170,auVar171);
            auVar135 = vmulps_avx512f(auVar168,auVar169);
            auVar136 = vaddps_avx512f(auVar129,auVar135);
            auVar136 = vaddps_avx512f(auVar136,auVar136);
            auVar132 = vaddps_avx512f(auVar132,auVar133);
            auVar132 = vaddps_avx512f(auVar132,auVar132);
            auVar129 = vsubps_avx512f(auVar129,auVar135);
            auVar129 = vaddps_avx512f(auVar129,auVar129);
            auVar83 = vsubps_avx512f(auVar83,auVar122);
            auVar83 = vaddps_avx512f(auVar123,auVar83);
            auVar122 = vmulps_avx512f(auVar134,auVar176);
            auVar123 = vfmadd213ps_avx512f(ZEXT864(0) << 0x20,auVar130,auVar122);
            auVar122 = vaddps_avx512f(auVar130,auVar122);
            auVar130 = vfmadd213ps_avx512f(auVar130,auVar176,auVar134);
            auVar122 = vfmadd231ps_avx512f(auVar122,auVar121,auVar176);
            auVar130 = vfmadd231ps_avx512f(auVar130,auVar176,auVar121);
            auVar133 = vmulps_avx512f(auVar136,auVar176);
            auVar134 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar120,auVar133);
            auVar133 = vaddps_avx512f(auVar120,auVar133);
            auVar120 = vfmadd213ps_avx512f(auVar120,auVar176,auVar136);
            auVar134 = vaddps_avx512f(auVar124,auVar134);
            auVar133 = vfmadd231ps_avx512f(auVar133,auVar124,auVar176);
            auVar120 = vfmadd231ps_avx512f(auVar120,auVar176,auVar124);
            auVar124 = vmulps_avx512f(auVar83,auVar176);
            auVar135 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar129,auVar124);
            auVar124 = vaddps_avx512f(auVar129,auVar124);
            auVar83 = vfmadd213ps_avx512f(auVar129,auVar176,auVar83);
            auVar129 = vaddps_avx512f(auVar132,auVar135);
            auVar124 = vfmadd231ps_avx512f(auVar124,auVar132,auVar176);
            auVar83 = vfmadd231ps_avx512f(auVar83,auVar176,auVar132);
            auVar84 = vaddps_avx512f(auVar84,auVar176);
            auVar85 = vaddps_avx512f(auVar85,auVar176);
            auVar116 = vaddps_avx512f(auVar116,auVar176);
            auVar132 = vmulps_avx512f(auVar129,auVar176);
            auVar135 = vmulps_avx512f(auVar124,auVar176);
            auVar136 = vmulps_avx512f(auVar83,auVar176);
            auVar137 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar134,auVar132);
            auVar138 = vfmadd213ps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar133,auVar135);
            auVar139 = vfmadd213ps_avx512f(auVar176,auVar120,auVar136);
            auVar132 = vfmadd231ps_avx512f(auVar132,auVar114,auVar134);
            auVar135 = vfmadd231ps_avx512f(auVar135,auVar114,auVar133);
            auVar114 = vfmadd213ps_avx512f(auVar114,auVar120,auVar136);
            auVar136 = vmulps_avx512f(auVar117,auVar129);
            auVar140 = vmulps_avx512f(auVar117,auVar124);
            auVar117 = vmulps_avx512f(auVar117,auVar83);
            auVar136 = vfmadd231ps_avx512f(auVar136,auVar115,auVar134);
            auVar140 = vfmadd231ps_avx512f(auVar140,auVar115,auVar133);
            auVar115 = vfmadd231ps_avx512f(auVar117,auVar120,auVar115);
            auVar117 = vmulps_avx512f(auVar81,auVar129);
            auVar124 = vmulps_avx512f(auVar81,auVar124);
            auVar81 = vmulps_avx512f(auVar81,auVar83);
            auVar83 = vfmadd231ps_avx512f(auVar117,auVar119,auVar134);
            auVar117 = vfmadd231ps_avx512f(auVar124,auVar119,auVar133);
            auVar81 = vfmadd231ps_avx512f(auVar81,auVar119,auVar120);
            auVar119 = vaddps_avx512f(auVar121,auVar123);
            auVar120 = vfmadd231ps_avx512f(auVar137,auVar82,auVar119);
            auVar121 = vfmadd231ps_avx512f(auVar138,auVar82,auVar122);
            auVar82 = vfmadd231ps_avx512f(auVar139,auVar130,auVar82);
            auVar123 = vfmadd231ps_avx512f(auVar132,auVar86,auVar119);
            auVar124 = vfmadd231ps_avx512f(auVar135,auVar86,auVar122);
            auVar86 = vfmadd231ps_avx512f(auVar114,auVar130,auVar86);
            auVar114 = vfmadd231ps_avx512f(auVar136,auVar113,auVar119);
            auVar129 = vfmadd231ps_avx512f(auVar140,auVar113,auVar122);
            auVar113 = vfmadd231ps_avx512f(auVar115,auVar130,auVar113);
            auVar83 = vfmadd231ps_avx512f(auVar83,auVar118,auVar119);
            auVar115 = vaddps_avx512f(auVar84,auVar83);
            auVar83 = vfmadd231ps_avx512f(auVar117,auVar118,auVar122);
            auVar119 = vaddps_avx512f(auVar85,auVar83);
            auVar81 = vfmadd231ps_avx512f(auVar81,auVar118,auVar130);
            auVar117 = vaddps_avx512f(auVar116,auVar81);
            auVar81 = vmulps_avx512f(auVar129,auVar86);
            auVar81 = vfmsub231ps_avx512f(auVar81,auVar124,auVar113);
            auVar83 = vmulps_avx512f(auVar113,auVar123);
            auVar84 = vfmsub231ps_avx512f(auVar83,auVar86,auVar114);
            auVar83 = vmulps_avx512f(auVar114,auVar124);
            auVar116 = vfmsub231ps_avx512f(auVar83,auVar123,auVar129);
            auVar83 = vmulps_avx512f(auVar82,auVar114);
            auVar85 = vfmsub231ps_avx512f(auVar83,auVar120,auVar113);
            auVar83 = vmulps_avx512f(auVar121,auVar113);
            auVar83 = vfmsub231ps_avx512f(auVar83,auVar129,auVar82);
            auVar113 = vmulps_avx512f(auVar120,auVar129);
            auVar113 = vfmsub231ps_avx512f(auVar113,auVar121,auVar114);
            auVar114 = vmulps_avx512f(auVar124,auVar82);
            auVar114 = vfmsub231ps_avx512f(auVar114,auVar121,auVar86);
            auVar86 = vmulps_avx512f(auVar86,auVar120);
            auVar86 = vfmsub231ps_avx512f(auVar86,auVar82,auVar123);
            auVar118 = vmulps_avx512f(auVar123,auVar121);
            auVar118 = vfmsub231ps_avx512f(auVar118,auVar120,auVar124);
            auVar82 = vmulps_avx512f(auVar82,auVar116);
            auVar82 = vfmadd231ps_avx512f(auVar82,auVar84,auVar121);
            auVar120 = vfmadd231ps_avx512f(auVar82,auVar81,auVar120);
            auVar81 = vdivps_avx512f(auVar81,auVar120);
            auVar83 = vdivps_avx512f(auVar83,auVar120);
            auVar82 = vdivps_avx512f(auVar114,auVar120);
            auVar84 = vdivps_avx512f(auVar84,auVar120);
            auVar85 = vdivps_avx512f(auVar85,auVar120);
            auVar86 = vdivps_avx512f(auVar86,auVar120);
            auVar114 = vdivps_avx512f(auVar116,auVar120);
            auVar116 = vdivps_avx512f(auVar113,auVar120);
            auVar113 = vdivps_avx512f(auVar118,auVar120);
            auVar118 = vmulps_avx512f(auVar117,auVar114);
            auVar120 = vmulps_avx512f(auVar117,auVar116);
            auVar121 = vmulps_avx512f(auVar117,auVar113);
            auVar117 = vfmadd231ps_avx512f(auVar118,auVar119,auVar84);
            auVar118 = vfmadd231ps_avx512f(auVar120,auVar119,auVar85);
            auVar119 = vfmadd231ps_avx512f(auVar121,auVar86,auVar119);
          }
          auVar117 = vfmadd231ps_avx512f(auVar117,auVar115,auVar81);
          auVar118 = vfmadd231ps_avx512f(auVar118,auVar115,auVar83);
          auVar119 = vfmadd231ps_avx512f(auVar119,auVar82,auVar115);
          auVar120 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar115 = vxorps_avx512dq(auVar117,auVar120);
          auVar117 = vxorps_avx512dq(auVar118,auVar120);
          auVar118 = vxorps_avx512dq(auVar119,auVar120);
        }
        else {
          auVar81 = vbroadcastss_avx512f(ZEXT416((uint)(pGVar10->time_range).lower));
          auVar82 = vbroadcastss_avx512f(ZEXT416((uint)pGVar10->fnumTimeSegments));
          auVar83 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar81);
          auVar81 = vbroadcastss_avx512f
                              (ZEXT416((uint)((pGVar10->time_range).upper - auVar81._0_4_)));
          auVar81 = vdivps_avx512f(auVar83,auVar81);
          auVar84 = vmulps_avx512f(auVar82,auVar81);
          auVar81 = vrndscaleps_avx512f(auVar84,1);
          auVar82 = vbroadcastss_avx512f(ZEXT416((uint)(auVar82._0_4_ + -1.0)));
          auVar82 = vminps_avx512f(auVar81,auVar82);
          auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar82 = vmaxps_avx512f(auVar82,auVar81);
          auVar85 = vcvtps2dq_avx512f(auVar82);
          local_300 = vmovdqa64_avx512f(auVar85);
          auVar82 = vsubps_avx512f(auVar84,auVar82);
          uVar8 = 0;
          for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
            uVar8 = uVar8 + 1;
          }
          auVar84 = vpbroadcastd_avx512f();
          uVar29 = vpcmpd_avx512f(auVar85,auVar84,4);
          if (((ushort)uVar29 & uVar67) == 0) {
            lVar12 = *(long *)&pGVar10[1].fnumTimeSegments;
            lVar71 = (long)*(int *)(local_300 + (ulong)uVar8 * 4) * 0x38;
            plVar1 = (long *)(lVar12 + lVar71);
            iVar9 = *(int *)(lVar12 + 0x20 + lVar71);
            if (iVar9 == 0x9134) {
              lVar72 = *plVar1;
              lVar73 = plVar1[2] * uVar66;
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 0x10 + lVar73)),0x1c);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x20 + lVar73)),0x28);
              auVar84 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 4 + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 0x14 + lVar73)),0x1c);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x24 + lVar73)),0x28);
              auVar81 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 8 + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)),0x1c);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x28 + lVar73)),0x28);
              auVar83 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 0x1c + lVar73)),0x1c);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x2c + lVar73)),0x28);
              in_ZMM13 = ZEXT1664(auVar75);
            }
            else if (iVar9 == 0x9234) {
              lVar72 = *plVar1;
              lVar73 = plVar1[2] * uVar66;
              auVar180._8_8_ = 0;
              auVar180._0_8_ = *(ulong *)(lVar72 + 4 + lVar73);
              auVar187._8_8_ = 0;
              auVar187._0_8_ = *(ulong *)(lVar72 + 0x10 + lVar73);
              auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + lVar73)),_DAT_02060e80,
                                           auVar180);
              auVar84 = ZEXT1664(auVar75);
              auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),_DAT_02060e80,
                                           auVar187);
              auVar81 = ZEXT1664(auVar75);
              auVar188._8_8_ = 0;
              auVar188._0_8_ = *(ulong *)(lVar72 + 0x1c + lVar73);
              auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)),_DAT_02060e80,
                                           auVar188);
              auVar83 = ZEXT1664(auVar75);
              auVar189._8_8_ = 0;
              auVar189._0_8_ = *(ulong *)(lVar72 + 0x28 + lVar73);
              auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0x24 + lVar73)),_DAT_02060e80,
                                           auVar189);
              in_ZMM13 = ZEXT1664(auVar75);
            }
            else if (iVar9 == 0xb001) {
              lVar72 = *plVar1;
              lVar73 = plVar1[2] * uVar66;
              auVar172._8_8_ = 0;
              auVar172._0_8_ = *(ulong *)(lVar72 + 0x10 + lVar73);
              auVar75 = vinsertps_avx(auVar172,ZEXT416(*(uint *)(lVar72 + 8 + lVar73)),0x20);
              auVar173._8_8_ = 0;
              auVar173._0_8_ = *(ulong *)(lVar72 + 0x34 + lVar73);
              auVar76 = vpermt2ps_avx512vl(auVar173,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar72 + lVar73)));
              auVar193._8_8_ = 0;
              auVar193._0_8_ = *(ulong *)(lVar72 + 0x1c + lVar73);
              fVar2 = *(float *)(lVar72 + 0x24 + lVar73);
              fVar3 = *(float *)(lVar72 + 0x28 + lVar73);
              fVar4 = *(float *)(lVar72 + 0x2c + lVar73);
              auVar77 = vpermt2ps_avx512vl(auVar193,_DAT_02060e90,
                                           ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)));
              fVar5 = *(float *)(lVar72 + 0x30 + lVar73);
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                        ZEXT416((uint)fVar2));
              auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
              auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
              auVar78 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar80._0_4_));
              fVar197 = auVar78._0_4_;
              fVar197 = fVar197 * 1.5 + fVar197 * fVar197 * fVar197 * auVar80._0_4_ * -0.5;
              auVar80 = vinsertps_avx(auVar77,ZEXT416((uint)(fVar2 * fVar197)),0x30);
              in_ZMM13 = ZEXT1664(auVar80);
              auVar80 = vinsertps_avx(auVar76,ZEXT416((uint)(fVar3 * fVar197)),0x30);
              auVar84 = ZEXT1664(auVar80);
              auVar75 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar5 * fVar197)),0x30);
              auVar83 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                      ZEXT416(*(uint *)(lVar72 + 4 + lVar73)),0x10);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar72 + 0x3c + lVar73)),0x20);
              auVar75 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar4 * fVar197)),0x30);
              auVar81 = ZEXT1664(auVar75);
            }
            else if (iVar9 == 0x9244) {
              lVar72 = *plVar1;
              lVar73 = plVar1[2] * uVar66;
              auVar84 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + lVar73));
              auVar81 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + 0x10 + lVar73));
              auVar83 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + 0x20 + lVar73));
              in_ZMM13 = ZEXT1664(*(undefined1 (*) [16])(lVar72 + 0x30 + lVar73));
            }
            auVar85 = vbroadcastss_avx512f(ZEXT416(1));
            auVar86 = vbroadcastss_avx512f(ZEXT416(2));
            iVar9 = *(int *)(lVar12 + 0x58 + lVar71);
            if (iVar9 == 0x9134) {
              lVar12 = plVar1[7];
              lVar71 = uVar66 * plVar1[9];
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar71)),
                                      ZEXT416(*(uint *)(lVar12 + 0x10 + lVar71)),0x1c);
              auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar71)),0x28);
              in_ZMM15 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar71)),
                                      ZEXT416(*(uint *)(lVar12 + 0x14 + lVar71)),0x1c);
              auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar71)),0x28);
              in_ZMM16 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar71)),
                                      ZEXT416(*(uint *)(lVar12 + 0x18 + lVar71)),0x1c);
              auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar71)),0x28);
              in_ZMM27 = ZEXT1664(auVar75);
              auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar71)),
                                      ZEXT416(*(uint *)(lVar12 + 0x1c + lVar71)),0x1c);
              auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar71)),0x28);
              in_ZMM26 = ZEXT1664(auVar75);
            }
            else {
              auVar88._16_48_ = auVar86._16_48_;
              if (iVar9 == 0x9234) {
                lVar12 = plVar1[7];
                lVar71 = uVar66 * plVar1[9];
                auVar181._8_8_ = 0;
                auVar181._0_8_ = *(ulong *)(lVar12 + 4 + lVar71);
                auVar194._8_8_ = 0;
                auVar194._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar71);
                auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + lVar71)),_DAT_02060e80,
                                             auVar181);
                in_ZMM15 = ZEXT1664(auVar75);
                auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0xc + lVar71)),_DAT_02060e80
                                             ,auVar194);
                in_ZMM16 = ZEXT1664(auVar75);
                auVar182._8_8_ = 0;
                auVar182._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar71);
                auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar71)),
                                             _DAT_02060e80,auVar182);
                in_ZMM27 = ZEXT1664(auVar75);
                auVar183._8_8_ = 0;
                auVar183._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar71);
                auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar71)),
                                             _DAT_02060e80,auVar183);
                in_ZMM26 = ZEXT1664(auVar75);
              }
              else if (iVar9 == 0xb001) {
                lVar12 = plVar1[7];
                lVar71 = uVar66 * plVar1[9];
                auVar184._8_8_ = 0;
                auVar184._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar71);
                auVar75 = vinsertps_avx(auVar184,ZEXT416(*(uint *)(lVar12 + 8 + lVar71)),0x20);
                auVar190._8_8_ = 0;
                auVar190._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar71);
                auVar76 = vpermt2ps_avx512vl(auVar190,_DAT_02060e90,
                                             ZEXT416(*(uint *)(lVar12 + lVar71)));
                auVar198._8_8_ = 0;
                auVar198._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar71);
                fVar2 = *(float *)(lVar12 + 0x24 + lVar71);
                fVar3 = *(float *)(lVar12 + 0x28 + lVar71);
                fVar4 = *(float *)(lVar12 + 0x2c + lVar71);
                auVar77 = vpermt2ps_avx512vl(auVar198,_DAT_02060e90,
                                             ZEXT416(*(uint *)(lVar12 + 0x18 + lVar71)));
                fVar5 = *(float *)(lVar12 + 0x30 + lVar71);
                auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                                          ZEXT416((uint)fVar2));
                auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
                auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
                auVar88._0_16_ = ZEXT816(0) << 0x40;
                auVar87._4_60_ = auVar88._4_60_;
                auVar87._0_4_ = auVar80._0_4_;
                auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar87._0_16_);
                auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                fVar197 = auVar78._0_4_;
                auVar80 = vaddss_avx512f(auVar79,ZEXT416((uint)(fVar197 * fVar197 *
                                                               fVar197 * auVar80._0_4_ * -0.5)));
                fVar197 = auVar80._0_4_;
                auVar80 = vinsertps_avx512f(auVar77,ZEXT416((uint)(fVar2 * fVar197)),0x30);
                in_ZMM26 = ZEXT1664(auVar80);
                auVar80 = vinsertps_avx(auVar76,ZEXT416((uint)(fVar3 * fVar197)),0x30);
                in_ZMM15 = ZEXT1664(auVar80);
                auVar75 = vinsertps_avx512f(auVar75,ZEXT416((uint)(fVar5 * fVar197)),0x30);
                in_ZMM27 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar71)),
                                        ZEXT416(*(uint *)(lVar12 + 4 + lVar71)),0x10);
                auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar71)),0x20);
                auVar75 = vinsertps_avx512f(auVar75,ZEXT416((uint)(fVar4 * fVar197)),0x30);
                in_ZMM16 = ZEXT1664(auVar75);
              }
              else if (iVar9 == 0x9244) {
                lVar12 = plVar1[7];
                lVar71 = uVar66 * plVar1[9];
                in_ZMM15 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + lVar71));
                in_ZMM16 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x10 + lVar71));
                in_ZMM27 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x20 + lVar71));
                in_ZMM26 = ZEXT1664(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar71));
              }
            }
            auVar89 = vbroadcastss_avx512f(auVar84._0_16_);
            auVar90 = vpermps_avx512f(auVar85,auVar84);
            auVar91 = vpermps_avx512f(auVar86,auVar84);
            auVar92 = vbroadcastss_avx512f(auVar81._0_16_);
            auVar93 = vpermps_avx512f(auVar85,auVar81);
            auVar94 = vpermps_avx512f(auVar86,auVar81);
            auVar95 = vbroadcastss_avx512f(auVar83._0_16_);
            auVar96 = vpermps_avx512f(auVar85,auVar83);
            auVar97 = vpermps_avx512f(auVar86,auVar83);
            auVar98 = vbroadcastss_avx512f(in_ZMM13._0_16_);
            auVar99 = vpermps_avx512f(auVar85,in_ZMM13);
            auVar100 = vpermps_avx512f(auVar86,in_ZMM13);
            auVar101 = vbroadcastss_avx512f(in_ZMM15._0_16_);
            auVar102 = vpermps_avx512f(auVar85,in_ZMM15);
            auVar103 = vpermps_avx512f(auVar86,in_ZMM15);
            auVar104 = vbroadcastss_avx512f(in_ZMM16._0_16_);
            auVar105 = vpermps_avx512f(auVar85,in_ZMM16);
            auVar106 = vpermps_avx512f(auVar86,in_ZMM16);
            auVar107 = vbroadcastss_avx512f(in_ZMM27._0_16_);
            auVar108 = vpermps_avx512f(auVar85,in_ZMM27);
            auVar109 = vpermps_avx512f(auVar86,in_ZMM27);
            auVar110 = vbroadcastss_avx512f(in_ZMM26._0_16_);
            auVar111 = vpermps_avx512f(auVar85,in_ZMM26);
            auVar112 = vpermps_avx512f(auVar86,in_ZMM26);
          }
          else {
            lVar12 = *(long *)&pGVar10[1].fnumTimeSegments;
            uVar69 = uVar65;
            local_540 = in_ZMM26;
            local_500 = in_ZMM26;
            local_4c0 = in_ZMM26;
            local_440 = in_ZMM26;
            do {
              uVar70 = 0;
              uVar68 = (uint)uVar69;
              for (uVar8 = uVar68; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
                uVar70 = uVar70 + 1;
              }
              lVar71 = (long)*(int *)(local_300 + (ulong)uVar70 * 4) * 0x38;
              plVar1 = (long *)(lVar12 + lVar71);
              iVar9 = *(int *)(lVar12 + 0x20 + lVar71);
              if (iVar9 == 0x9134) {
                lVar72 = *plVar1;
                lVar73 = plVar1[2] * uVar66;
                auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar72 + lVar73)),
                                            ZEXT416(*(uint *)(lVar72 + 0x10 + lVar73)),0x1c);
                auVar80 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar72 + 0x20 + lVar73)),0x28)
                ;
                auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar72 + 4 + lVar73)),
                                            ZEXT416(*(uint *)(lVar72 + 0x14 + lVar73)),0x1c);
                auVar76 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar72 + 0x24 + lVar73)),0x28)
                ;
                auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar72 + 8 + lVar73)),
                                            ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)),0x1c);
                auVar77 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar72 + 0x28 + lVar73)),0x28)
                ;
                auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                            ZEXT416(*(uint *)(lVar72 + 0x1c + lVar73)),0x1c);
                auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar72 + 0x2c + lVar73)),0x28)
                ;
LAB_009ccf12:
                local_4c0 = ZEXT1664(auVar80);
                local_500 = ZEXT1664(auVar76);
                local_540 = ZEXT1664(auVar77);
                local_440 = ZEXT1664(auVar75);
              }
              else {
                auVar126._16_48_ = in_ZMM30._16_48_;
                if (iVar9 == 0x9234) {
                  lVar72 = *plVar1;
                  lVar73 = plVar1[2] * uVar66;
                  auVar221._8_8_ = 0;
                  auVar221._0_8_ = *(ulong *)(lVar72 + 4 + lVar73);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + lVar73)),_DAT_02060e80,
                                               auVar221);
                  local_4c0 = ZEXT1664(auVar75);
                  auVar218._8_8_ = 0;
                  auVar218._0_8_ = *(ulong *)(lVar72 + 0x10 + lVar73);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                               _DAT_02060e80,auVar218);
                  local_500 = ZEXT1664(auVar75);
                  auVar211._8_8_ = 0;
                  auVar211._0_8_ = *(ulong *)(lVar72 + 0x1c + lVar73);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)),
                                               _DAT_02060e80,auVar211);
                  local_540 = ZEXT1664(auVar75);
                  auVar212._8_8_ = 0;
                  auVar212._0_8_ = *(ulong *)(lVar72 + 0x28 + lVar73);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar72 + 0x24 + lVar73)),
                                               _DAT_02060e80,auVar212);
                  local_440 = ZEXT1664(auVar75);
                }
                else if (iVar9 == 0xb001) {
                  lVar72 = *plVar1;
                  lVar73 = plVar1[2] * uVar66;
                  auVar214._8_8_ = 0;
                  auVar214._0_8_ = *(ulong *)(lVar72 + 0x10 + lVar73);
                  auVar75 = vinsertps_avx512f(auVar214,ZEXT416(*(uint *)(lVar72 + 8 + lVar73)),0x20)
                  ;
                  auVar219._8_8_ = 0;
                  auVar219._0_8_ = *(ulong *)(lVar72 + 0x34 + lVar73);
                  auVar76 = vpermt2ps_avx512vl(auVar219,_DAT_02060e90,
                                               ZEXT416(*(uint *)(lVar72 + lVar73)));
                  auVar222._8_8_ = 0;
                  auVar222._0_8_ = *(ulong *)(lVar72 + 0x1c + lVar73);
                  auVar80 = vpermt2ps_avx512vl(auVar222,_DAT_02060e90,
                                               ZEXT416(*(uint *)(lVar72 + 0x18 + lVar73)));
                  uVar70 = *(uint *)(lVar72 + 0x24 + lVar73);
                  uVar8 = *(uint *)(lVar72 + 0x28 + lVar73);
                  local_280 = *(uint *)(lVar72 + 0x2c + lVar73);
                  local_2c0 = *(uint *)(lVar72 + 0x30 + lVar73);
                  auVar77 = vmulss_avx512f(ZEXT416(uVar8),ZEXT416(uVar8));
                  auVar77 = vfmadd231ss_avx512f(auVar77,ZEXT416(uVar70),ZEXT416(uVar70));
                  auVar77 = vfmadd231ss_avx512f(auVar77,ZEXT416(local_280),ZEXT416(local_280));
                  auVar78 = ZEXT416(local_2c0);
                  auVar77 = vfmadd231ss_avx512f(auVar77,auVar78,auVar78);
                  auVar126._0_16_ = vxorps_avx512vl(auVar78,auVar78);
                  auVar125._4_60_ = auVar126._4_60_;
                  auVar125._0_4_ = auVar77._0_4_;
                  auVar78 = vrsqrt14ss_avx512f(auVar126._0_16_,auVar125._0_16_);
                  auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                  auVar77 = vmulss_avx512f(auVar77,ZEXT416(0xbf000000));
                  auVar77 = vmulss_avx512f(auVar78,auVar77);
                  auVar78 = vmulss_avx512f(auVar78,auVar78);
                  auVar77 = vmulss_avx512f(auVar78,auVar77);
                  auVar77 = vaddss_avx512f(auVar79,auVar77);
                  auVar78 = vmulss_avx512f(ZEXT416(uVar70),auVar77);
                  auVar80 = vinsertps_avx512f(auVar80,auVar78,0x30);
                  local_440 = ZEXT1664(auVar80);
                  auVar80 = vmulss_avx512f(auVar77,ZEXT416(uVar8));
                  auVar80 = vinsertps_avx512f(auVar76,auVar80,0x30);
                  local_4c0 = ZEXT1664(auVar80);
                  auVar80 = vmulss_avx512f(auVar77,ZEXT416(local_280));
                  auVar76 = vmulss_avx512f(auVar77,ZEXT416(local_2c0));
                  auVar75 = vinsertps_avx512f(auVar75,auVar76,0x30);
                  local_540 = ZEXT1664(auVar75);
                  auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar72 + 0xc + lVar73)),
                                              ZEXT416(*(uint *)(lVar72 + 4 + lVar73)),0x10);
                  auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar72 + 0x3c + lVar73)),
                                              0x20);
                  auVar75 = vinsertps_avx512f(auVar75,auVar80,0x30);
                  local_500 = ZEXT1664(auVar75);
                }
                else if (iVar9 == 0x9244) {
                  lVar72 = *plVar1;
                  lVar73 = plVar1[2] * uVar66;
                  auVar80 = *(undefined1 (*) [16])(lVar72 + lVar73);
                  auVar76 = *(undefined1 (*) [16])(lVar72 + 0x10 + lVar73);
                  auVar77 = *(undefined1 (*) [16])(lVar72 + 0x20 + lVar73);
                  auVar75 = *(undefined1 (*) [16])(lVar72 + 0x30 + lVar73);
                  goto LAB_009ccf12;
                }
              }
              auVar86 = vpbroadcastd_avx512f();
              uVar29 = vpcmpeqd_avx512f(auVar86,auVar85);
              iVar9 = *(int *)(lVar12 + 0x58 + lVar71);
              if (iVar9 == 0x9134) {
                lVar71 = plVar1[7];
                lVar72 = plVar1[9] * uVar66;
                auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar71 + lVar72)),
                                            ZEXT416(*(uint *)(lVar71 + 0x10 + lVar72)),0x1c);
                auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar71 + 0x20 + lVar72)),0x28)
                ;
                in_ZMM29 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar71 + 4 + lVar72)),
                                            ZEXT416(*(uint *)(lVar71 + 0x14 + lVar72)),0x1c);
                auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar71 + 0x24 + lVar72)),0x28)
                ;
                in_ZMM27 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar71 + 8 + lVar72)),
                                            ZEXT416(*(uint *)(lVar71 + 0x18 + lVar72)),0x1c);
                auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar71 + 0x28 + lVar72)),0x28)
                ;
                local_480 = ZEXT1664(auVar75);
                auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar71 + 0xc + lVar72)),
                                            ZEXT416(*(uint *)(lVar71 + 0x1c + lVar72)),0x1c);
                auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar71 + 0x2c + lVar72)),0x28)
                ;
                in_ZMM30 = ZEXT1664(auVar75);
              }
              else {
                auVar128._16_48_ = auVar86._16_48_;
                if (iVar9 == 0x9234) {
                  lVar71 = plVar1[7];
                  lVar72 = plVar1[9] * uVar66;
                  auVar223._8_8_ = 0;
                  auVar223._0_8_ = *(ulong *)(lVar71 + 4 + lVar72);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar71 + lVar72)),_DAT_02060e80,
                                               auVar223);
                  in_ZMM29 = ZEXT1664(auVar75);
                  auVar215._8_8_ = 0;
                  auVar215._0_8_ = *(ulong *)(lVar71 + 0x10 + lVar72);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar71 + 0xc + lVar72)),
                                               _DAT_02060e80,auVar215);
                  in_ZMM27 = ZEXT1664(auVar75);
                  auVar216._8_8_ = 0;
                  auVar216._0_8_ = *(ulong *)(lVar71 + 0x1c + lVar72);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar71 + 0x18 + lVar72)),
                                               _DAT_02060e80,auVar216);
                  local_480 = ZEXT1664(auVar75);
                  auVar217._8_8_ = 0;
                  auVar217._0_8_ = *(ulong *)(lVar71 + 0x28 + lVar72);
                  auVar75 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar71 + 0x24 + lVar72)),
                                               _DAT_02060e80,auVar217);
                  in_ZMM30 = ZEXT1664(auVar75);
                }
                else if (iVar9 == 0xb001) {
                  lVar71 = plVar1[7];
                  lVar72 = plVar1[9] * uVar66;
                  auVar213._8_8_ = 0;
                  auVar213._0_8_ = *(ulong *)(lVar71 + 0x10 + lVar72);
                  auVar75 = vinsertps_avx512f(auVar213,ZEXT416(*(uint *)(lVar71 + 8 + lVar72)),0x20)
                  ;
                  auVar220._8_8_ = 0;
                  auVar220._0_8_ = *(ulong *)(lVar71 + 0x34 + lVar72);
                  auVar76 = vpermt2ps_avx512vl(auVar220,_DAT_02060e90,
                                               ZEXT416(*(uint *)(lVar71 + lVar72)));
                  auVar224._8_8_ = 0;
                  auVar224._0_8_ = *(ulong *)(lVar71 + 0x1c + lVar72);
                  auVar80 = vpermt2ps_avx512vl(auVar224,_DAT_02060e90,
                                               ZEXT416(*(uint *)(lVar71 + 0x18 + lVar72)));
                  uVar70 = *(uint *)(lVar71 + 0x24 + lVar72);
                  uVar8 = *(uint *)(lVar71 + 0x28 + lVar72);
                  uVar6 = *(uint *)(lVar71 + 0x2c + lVar72);
                  uVar7 = *(uint *)(lVar71 + 0x30 + lVar72);
                  auVar77 = vmulss_avx512f(ZEXT416(uVar8),ZEXT416(uVar8));
                  auVar77 = vfmadd231ss_avx512f(auVar77,ZEXT416(uVar70),ZEXT416(uVar70));
                  auVar77 = vfmadd231ss_avx512f(auVar77,ZEXT416(uVar6),ZEXT416(uVar6));
                  auVar78 = ZEXT416(uVar7);
                  auVar77 = vfmadd231ss_avx512f(auVar77,auVar78,auVar78);
                  auVar128._0_16_ = vxorps_avx512vl(auVar78,auVar78);
                  auVar127._4_60_ = auVar128._4_60_;
                  auVar127._0_4_ = auVar77._0_4_;
                  auVar78 = vrsqrt14ss_avx512f(auVar128._0_16_,auVar127._0_16_);
                  auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                  auVar77 = vmulss_avx512f(auVar77,ZEXT416(0xbf000000));
                  auVar77 = vmulss_avx512f(auVar78,auVar77);
                  auVar78 = vmulss_avx512f(auVar78,auVar78);
                  auVar77 = vmulss_avx512f(auVar78,auVar77);
                  auVar77 = vaddss_avx512f(auVar79,auVar77);
                  auVar78 = vmulss_avx512f(ZEXT416(uVar70),auVar77);
                  auVar80 = vinsertps_avx512f(auVar80,auVar78,0x30);
                  in_ZMM30 = ZEXT1664(auVar80);
                  auVar80 = vmulss_avx512f(auVar77,ZEXT416(uVar8));
                  auVar80 = vinsertps_avx512f(auVar76,auVar80,0x30);
                  in_ZMM29 = ZEXT1664(auVar80);
                  auVar80 = vmulss_avx512f(auVar77,ZEXT416(uVar6));
                  auVar76 = vmulss_avx512f(auVar77,ZEXT416(uVar7));
                  auVar75 = vinsertps_avx512f(auVar75,auVar76,0x30);
                  local_480 = ZEXT1664(auVar75);
                  auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar71 + 0xc + lVar72)),
                                              ZEXT416(*(uint *)(lVar71 + 4 + lVar72)),0x10);
                  auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(lVar71 + 0x3c + lVar72)),
                                              0x20);
                  auVar75 = vinsertps_avx512f(auVar75,auVar80,0x30);
                  in_ZMM27 = ZEXT1664(auVar75);
                }
                else {
                  local_480 = in_ZMM26;
                  if (iVar9 == 0x9244) {
                    lVar71 = plVar1[7];
                    lVar72 = plVar1[9] * uVar66;
                    in_ZMM29 = ZEXT1664(*(undefined1 (*) [16])(lVar71 + lVar72));
                    in_ZMM27 = ZEXT1664(*(undefined1 (*) [16])(lVar71 + 0x10 + lVar72));
                    auVar75 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(lVar71 + 0x20 + lVar72));
                    local_480 = vmovdqa64_avx512f(ZEXT1664(auVar75));
                    in_ZMM30 = ZEXT1664(*(undefined1 (*) [16])(lVar71 + 0x30 + lVar72));
                  }
                }
              }
              uVar70 = (uint)uVar29 & uVar68;
              uVar69 = (ulong)(~uVar70 & uVar68);
              auVar86 = vbroadcastss_avx512f(local_4c0._0_16_);
              bVar13 = (byte)uVar70;
              auVar89._0_4_ =
                   (uint)(bVar13 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM12._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar89._4_4_ = (uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * in_ZMM12._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar89._8_4_ = (uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * in_ZMM12._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar89._12_4_ = (uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * in_ZMM12._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar89._16_4_ = (uint)bVar14 * auVar86._16_4_ | (uint)!bVar14 * in_ZMM12._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar89._20_4_ = (uint)bVar14 * auVar86._20_4_ | (uint)!bVar14 * in_ZMM12._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar89._24_4_ = (uint)bVar14 * auVar86._24_4_ | (uint)!bVar14 * in_ZMM12._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar89._28_4_ = (uint)bVar14 * auVar86._28_4_ | (uint)!bVar14 * in_ZMM12._28_4_;
              bVar21 = (byte)(uVar70 >> 8);
              auVar89._32_4_ =
                   (uint)(bVar21 & 1) * auVar86._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM12._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar89._36_4_ = (uint)bVar14 * auVar86._36_4_ | (uint)!bVar14 * in_ZMM12._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar89._40_4_ = (uint)bVar14 * auVar86._40_4_ | (uint)!bVar14 * in_ZMM12._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar89._44_4_ = (uint)bVar14 * auVar86._44_4_ | (uint)!bVar14 * in_ZMM12._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar89._48_4_ = (uint)bVar14 * auVar86._48_4_ | (uint)!bVar14 * in_ZMM12._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar89._52_4_ = (uint)bVar14 * auVar86._52_4_ | (uint)!bVar14 * in_ZMM12._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar89._56_4_ = (uint)bVar14 * auVar86._56_4_ | (uint)!bVar14 * in_ZMM12._56_4_;
              auVar89._60_4_ =
                   (uVar70 >> 0xf) * auVar86._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM12._60_4_;
              auVar86 = vbroadcastss_avx512f(ZEXT416(1));
              auVar114 = vpermps_avx512f(auVar86,local_4c0);
              auVar90._0_4_ =
                   (uint)(bVar13 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM11._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar90._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * in_ZMM11._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar90._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * in_ZMM11._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar90._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * in_ZMM11._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar90._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * in_ZMM11._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar90._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * in_ZMM11._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar90._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * in_ZMM11._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar90._28_4_ = (uint)bVar14 * auVar114._28_4_ | (uint)!bVar14 * in_ZMM11._28_4_;
              auVar90._32_4_ =
                   (uint)(bVar21 & 1) * auVar114._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM11._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar90._36_4_ = (uint)bVar14 * auVar114._36_4_ | (uint)!bVar14 * in_ZMM11._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar90._40_4_ = (uint)bVar14 * auVar114._40_4_ | (uint)!bVar14 * in_ZMM11._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar90._44_4_ = (uint)bVar14 * auVar114._44_4_ | (uint)!bVar14 * in_ZMM11._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar90._48_4_ = (uint)bVar14 * auVar114._48_4_ | (uint)!bVar14 * in_ZMM11._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar90._52_4_ = (uint)bVar14 * auVar114._52_4_ | (uint)!bVar14 * in_ZMM11._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar90._56_4_ = (uint)bVar14 * auVar114._56_4_ | (uint)!bVar14 * in_ZMM11._56_4_;
              auVar90._60_4_ =
                   (uVar70 >> 0xf) * auVar114._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM11._60_4_;
              auVar114 = vbroadcastss_avx512f(ZEXT416(2));
              auVar116 = vpermps_avx512f(auVar114,local_4c0);
              auVar91._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM10._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar91._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM10._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar91._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM10._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar91._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM10._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar91._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM10._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar91._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM10._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar91._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM10._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar91._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM10._28_4_;
              auVar91._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ |
                   (uint)!(bool)(bVar21 & 1) * in_ZMM10._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar91._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM10._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar91._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM10._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar91._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM10._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar91._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM10._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar91._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM10._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar91._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM10._56_4_;
              auVar91._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM10._60_4_;
              auVar116 = vbroadcastss_avx512f(local_500._0_16_);
              auVar92._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM9._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar92._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM9._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar92._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM9._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar92._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM9._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar92._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM9._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar92._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM9._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar92._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM9._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar92._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM9._28_4_;
              auVar92._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM9._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar92._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM9._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar92._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM9._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar92._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM9._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar92._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM9._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar92._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM9._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar92._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM9._56_4_;
              auVar92._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM9._60_4_;
              auVar116 = vpermps_avx512f(auVar86,local_500);
              auVar93._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM8._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar93._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM8._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar93._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM8._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar93._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM8._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar93._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM8._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar93._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM8._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar93._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM8._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar93._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM8._28_4_;
              auVar93._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM8._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar93._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM8._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar93._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM8._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar93._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM8._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar93._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM8._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar93._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM8._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar93._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM8._56_4_;
              auVar93._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM8._60_4_;
              auVar116 = vpermps_avx512f(auVar114,local_500);
              auVar94._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM7._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar94._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM7._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar94._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM7._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar94._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM7._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar94._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM7._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar94._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM7._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar94._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM7._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar94._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM7._28_4_;
              auVar94._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM7._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar94._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM7._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar94._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM7._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar94._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM7._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar94._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM7._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar94._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM7._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar94._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM7._56_4_;
              auVar94._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM7._60_4_;
              auVar116 = vbroadcastss_avx512f(local_540._0_16_);
              auVar95._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM6._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar95._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM6._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar95._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM6._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar95._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM6._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar95._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM6._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar95._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM6._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar95._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM6._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar95._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM6._28_4_;
              auVar95._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM6._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar95._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM6._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar95._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM6._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar95._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM6._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar95._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM6._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar95._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM6._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar95._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM6._56_4_;
              auVar95._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM6._60_4_;
              auVar116 = vpermps_avx512f(auVar86,local_540);
              auVar96._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM5._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar96._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM5._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar96._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM5._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar96._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM5._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar96._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM5._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar96._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM5._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar96._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM5._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar96._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM5._28_4_;
              auVar96._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM5._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar96._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM5._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar96._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM5._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar96._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM5._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar96._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM5._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar96._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM5._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar96._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM5._56_4_;
              auVar96._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM5._60_4_;
              auVar116 = vpermps_avx512f(auVar114,local_540);
              auVar97._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM4._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar97._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * in_ZMM4._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar97._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * in_ZMM4._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar97._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * in_ZMM4._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar97._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * in_ZMM4._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar97._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * in_ZMM4._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar97._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * in_ZMM4._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar97._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * in_ZMM4._28_4_;
              auVar97._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM4._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar97._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * in_ZMM4._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar97._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * in_ZMM4._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar97._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * in_ZMM4._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar97._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * in_ZMM4._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar97._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * in_ZMM4._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar97._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * in_ZMM4._56_4_;
              auVar97._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM4._60_4_;
              auVar116 = vbroadcastss_avx512f(local_440._0_16_);
              auVar98._0_4_ =
                   (uint)(bVar13 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar83._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar98._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar83._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar98._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar83._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar98._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar83._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar98._16_4_ = (uint)bVar14 * auVar116._16_4_ | (uint)!bVar14 * auVar83._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar98._20_4_ = (uint)bVar14 * auVar116._20_4_ | (uint)!bVar14 * auVar83._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar98._24_4_ = (uint)bVar14 * auVar116._24_4_ | (uint)!bVar14 * auVar83._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar98._28_4_ = (uint)bVar14 * auVar116._28_4_ | (uint)!bVar14 * auVar83._28_4_;
              auVar98._32_4_ =
                   (uint)(bVar21 & 1) * auVar116._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar83._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar98._36_4_ = (uint)bVar14 * auVar116._36_4_ | (uint)!bVar14 * auVar83._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar98._40_4_ = (uint)bVar14 * auVar116._40_4_ | (uint)!bVar14 * auVar83._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar98._44_4_ = (uint)bVar14 * auVar116._44_4_ | (uint)!bVar14 * auVar83._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar98._48_4_ = (uint)bVar14 * auVar116._48_4_ | (uint)!bVar14 * auVar83._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar98._52_4_ = (uint)bVar14 * auVar116._52_4_ | (uint)!bVar14 * auVar83._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar98._56_4_ = (uint)bVar14 * auVar116._56_4_ | (uint)!bVar14 * auVar83._56_4_;
              auVar98._60_4_ =
                   (uVar70 >> 0xf) * auVar116._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * auVar83._60_4_;
              auVar83 = vpermps_avx512f(auVar86,local_440);
              auVar99._0_4_ =
                   (uint)(bVar13 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar81._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar99._4_4_ = (uint)bVar14 * auVar83._4_4_ | (uint)!bVar14 * auVar81._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar99._8_4_ = (uint)bVar14 * auVar83._8_4_ | (uint)!bVar14 * auVar81._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar99._12_4_ = (uint)bVar14 * auVar83._12_4_ | (uint)!bVar14 * auVar81._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar99._16_4_ = (uint)bVar14 * auVar83._16_4_ | (uint)!bVar14 * auVar81._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar99._20_4_ = (uint)bVar14 * auVar83._20_4_ | (uint)!bVar14 * auVar81._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar99._24_4_ = (uint)bVar14 * auVar83._24_4_ | (uint)!bVar14 * auVar81._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar99._28_4_ = (uint)bVar14 * auVar83._28_4_ | (uint)!bVar14 * auVar81._28_4_;
              auVar99._32_4_ =
                   (uint)(bVar21 & 1) * auVar83._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar81._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar99._36_4_ = (uint)bVar14 * auVar83._36_4_ | (uint)!bVar14 * auVar81._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar99._40_4_ = (uint)bVar14 * auVar83._40_4_ | (uint)!bVar14 * auVar81._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar99._44_4_ = (uint)bVar14 * auVar83._44_4_ | (uint)!bVar14 * auVar81._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar99._48_4_ = (uint)bVar14 * auVar83._48_4_ | (uint)!bVar14 * auVar81._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar99._52_4_ = (uint)bVar14 * auVar83._52_4_ | (uint)!bVar14 * auVar81._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar99._56_4_ = (uint)bVar14 * auVar83._56_4_ | (uint)!bVar14 * auVar81._56_4_;
              auVar99._60_4_ =
                   (uVar70 >> 0xf) * auVar83._60_4_ | (uint)!SUB41(uVar70 >> 0xf,0) * auVar81._60_4_
              ;
              auVar81 = vpermps_avx512f(auVar114,local_440);
              auVar100._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar84._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar100._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * auVar84._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar100._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * auVar84._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar100._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * auVar84._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar100._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * auVar84._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar100._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * auVar84._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar100._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * auVar84._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar100._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * auVar84._28_4_;
              auVar100._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar84._32_4_;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar100._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * auVar84._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar100._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * auVar84._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar100._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * auVar84._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar100._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * auVar84._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar100._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * auVar84._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar100._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * auVar84._56_4_;
              auVar100._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ | (uint)!SUB41(uVar70 >> 0xf,0) * auVar84._60_4_
              ;
              auVar81 = vbroadcastss_avx512f(in_ZMM29._0_16_);
              auVar101._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM24._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar101._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM24._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar101._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM24._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar101._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM24._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar101._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM24._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar101._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM24._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar101._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM24._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar101._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM24._28_4_;
              auVar101._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM24._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar101._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM24._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar101._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM24._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar101._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM24._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar101._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM24._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar101._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM24._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar101._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM24._56_4_;
              auVar101._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM24._60_4_;
              auVar81 = vpermps_avx512f(auVar86,in_ZMM29);
              auVar102._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM23._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar102._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM23._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar102._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM23._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar102._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM23._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar102._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM23._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar102._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM23._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar102._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM23._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar102._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM23._28_4_;
              auVar102._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM23._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar102._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM23._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar102._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM23._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar102._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM23._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar102._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM23._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar102._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM23._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar102._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM23._56_4_;
              auVar102._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM23._60_4_;
              auVar81 = vpermps_avx512f(auVar114,in_ZMM29);
              auVar103._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM22._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar103._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM22._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar103._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM22._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar103._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM22._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar103._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM22._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar103._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM22._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar103._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM22._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar103._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM22._28_4_;
              auVar103._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM22._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar103._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM22._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar103._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM22._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar103._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM22._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar103._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM22._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar103._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM22._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar103._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM22._56_4_;
              auVar103._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM22._60_4_;
              auVar81 = vbroadcastss_avx512f(in_ZMM27._0_16_);
              auVar104._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM21._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar104._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM21._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar104._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM21._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar104._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM21._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar104._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM21._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar104._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM21._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar104._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM21._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar104._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM21._28_4_;
              auVar104._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM21._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar104._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM21._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar104._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM21._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar104._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM21._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar104._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM21._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar104._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM21._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar104._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM21._56_4_;
              auVar104._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM21._60_4_;
              auVar81 = vpermps_avx512f(auVar86,in_ZMM27);
              auVar105._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM20._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar105._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM20._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar105._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM20._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar105._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM20._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar105._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM20._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar105._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM20._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar105._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM20._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar105._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM20._28_4_;
              auVar105._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM20._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar105._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM20._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar105._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM20._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar105._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM20._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar105._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM20._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar105._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM20._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar105._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM20._56_4_;
              auVar105._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM20._60_4_;
              auVar81 = vpermps_avx512f(auVar114,in_ZMM27);
              auVar106._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM19._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar106._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM19._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar106._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM19._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar106._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM19._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar106._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM19._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar106._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM19._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar106._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM19._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar106._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM19._28_4_;
              auVar106._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM19._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar106._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM19._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar106._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM19._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar106._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM19._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar106._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM19._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar106._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM19._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar106._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM19._56_4_;
              auVar106._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM19._60_4_;
              auVar81 = vbroadcastss_avx512f(local_480._0_16_);
              auVar107._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM18._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar107._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM18._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar107._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM18._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar107._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM18._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar107._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM18._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar107._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM18._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar107._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM18._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar107._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM18._28_4_;
              auVar107._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM18._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar107._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM18._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar107._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM18._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar107._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM18._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar107._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM18._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar107._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM18._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar107._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM18._56_4_;
              auVar107._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM18._60_4_;
              auVar81 = vpermps_avx512f(auVar86,local_480);
              auVar108._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM17._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar108._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM17._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar108._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM17._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar108._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM17._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar108._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM17._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar108._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM17._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar108._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM17._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar108._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM17._28_4_;
              auVar108._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM17._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar108._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM17._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar108._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM17._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar108._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM17._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar108._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM17._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar108._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM17._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar108._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM17._56_4_;
              auVar108._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM17._60_4_;
              auVar81 = vpermps_avx512f(auVar114,local_480);
              auVar109._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM16._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar109._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM16._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar109._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM16._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar109._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM16._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar109._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM16._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar109._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM16._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar109._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM16._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar109._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM16._28_4_;
              auVar109._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM16._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar109._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM16._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar109._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM16._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar109._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM16._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar109._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM16._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar109._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM16._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar109._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM16._56_4_;
              auVar109._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM16._60_4_;
              auVar81 = vbroadcastss_avx512f(in_ZMM30._0_16_);
              auVar110._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM15._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar110._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM15._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar110._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM15._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar110._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM15._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar110._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM15._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar110._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM15._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar110._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM15._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar110._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM15._28_4_;
              auVar110._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM15._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar110._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM15._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar110._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM15._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar110._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM15._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar110._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM15._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar110._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM15._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar110._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM15._56_4_;
              auVar110._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM15._60_4_;
              auVar81 = vpermps_avx512f(auVar86,in_ZMM30);
              auVar111._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM14._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar111._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM14._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar111._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM14._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar111._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM14._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar111._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM14._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar111._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM14._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar111._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM14._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar111._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM14._28_4_;
              auVar111._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM14._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar111._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM14._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar111._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM14._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar111._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM14._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar111._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM14._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar111._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM14._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar111._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM14._56_4_;
              auVar111._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM14._60_4_;
              auVar81 = vpermps_avx512f(auVar114,in_ZMM30);
              auVar112._0_4_ =
                   (uint)(bVar13 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar13 & 1) * in_ZMM13._0_4_;
              bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar112._4_4_ = (uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * in_ZMM13._4_4_;
              bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar112._8_4_ = (uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * in_ZMM13._8_4_;
              bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar112._12_4_ = (uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * in_ZMM13._12_4_;
              bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar112._16_4_ = (uint)bVar14 * auVar81._16_4_ | (uint)!bVar14 * in_ZMM13._16_4_;
              bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar112._20_4_ = (uint)bVar14 * auVar81._20_4_ | (uint)!bVar14 * in_ZMM13._20_4_;
              bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar112._24_4_ = (uint)bVar14 * auVar81._24_4_ | (uint)!bVar14 * in_ZMM13._24_4_;
              bVar14 = (bool)((byte)(uVar70 >> 7) & 1);
              auVar112._28_4_ = (uint)bVar14 * auVar81._28_4_ | (uint)!bVar14 * in_ZMM13._28_4_;
              auVar112._32_4_ =
                   (uint)(bVar21 & 1) * auVar81._32_4_ | (uint)!(bool)(bVar21 & 1) * in_ZMM13._32_4_
              ;
              bVar14 = (bool)((byte)(uVar70 >> 9) & 1);
              auVar112._36_4_ = (uint)bVar14 * auVar81._36_4_ | (uint)!bVar14 * in_ZMM13._36_4_;
              bVar14 = (bool)((byte)(uVar70 >> 10) & 1);
              auVar112._40_4_ = (uint)bVar14 * auVar81._40_4_ | (uint)!bVar14 * in_ZMM13._40_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xb) & 1);
              auVar112._44_4_ = (uint)bVar14 * auVar81._44_4_ | (uint)!bVar14 * in_ZMM13._44_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xc) & 1);
              auVar112._48_4_ = (uint)bVar14 * auVar81._48_4_ | (uint)!bVar14 * in_ZMM13._48_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xd) & 1);
              auVar112._52_4_ = (uint)bVar14 * auVar81._52_4_ | (uint)!bVar14 * in_ZMM13._52_4_;
              bVar14 = (bool)((byte)(uVar70 >> 0xe) & 1);
              auVar112._56_4_ = (uint)bVar14 * auVar81._56_4_ | (uint)!bVar14 * in_ZMM13._56_4_;
              auVar112._60_4_ =
                   (uVar70 >> 0xf) * auVar81._60_4_ |
                   (uint)!SUB41(uVar70 >> 0xf,0) * in_ZMM13._60_4_;
              auVar84 = auVar100;
              auVar81 = auVar99;
              auVar83 = auVar98;
              in_ZMM4 = auVar97;
              in_ZMM5 = auVar96;
              in_ZMM6 = auVar95;
              in_ZMM7 = auVar94;
              in_ZMM8 = auVar93;
              in_ZMM9 = auVar92;
              in_ZMM10 = auVar91;
              in_ZMM11 = auVar90;
              in_ZMM12 = auVar89;
              in_ZMM13 = auVar112;
              in_ZMM14 = auVar111;
              in_ZMM15 = auVar110;
              in_ZMM16 = auVar109;
              in_ZMM17 = auVar108;
              in_ZMM18 = auVar107;
              in_ZMM19 = auVar106;
              in_ZMM20 = auVar105;
              in_ZMM21 = auVar104;
              in_ZMM22 = auVar103;
              in_ZMM23 = auVar102;
              in_ZMM24 = auVar101;
              in_ZMM26 = local_480;
            } while ((short)(~uVar70 & uVar68) != 0);
          }
          auVar81 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar81 = vsubps_avx512f(auVar81,auVar82);
          auVar83 = vmulps_avx512f(auVar82,auVar101);
          auVar84 = vmulps_avx512f(auVar82,auVar102);
          auVar85 = vmulps_avx512f(auVar82,auVar103);
          auVar113 = vfmadd231ps_avx512f(auVar83,auVar81,auVar89);
          auVar83 = vfmadd231ps_avx512f(auVar84,auVar81,auVar90);
          auVar84 = vfmadd231ps_avx512f(auVar85,auVar81,auVar91);
          auVar85 = vmulps_avx512f(auVar82,auVar104);
          auVar86 = vmulps_avx512f(auVar82,auVar105);
          auVar114 = vmulps_avx512f(auVar82,auVar106);
          auVar85 = vfmadd231ps_avx512f(auVar85,auVar81,auVar92);
          auVar115 = vfmadd231ps_avx512f(auVar86,auVar81,auVar93);
          auVar86 = vfmadd231ps_avx512f(auVar114,auVar81,auVar94);
          auVar114 = vmulps_avx512f(auVar82,auVar107);
          auVar116 = vmulps_avx512f(auVar82,auVar108);
          auVar117 = vmulps_avx512f(auVar82,auVar109);
          auVar114 = vfmadd231ps_avx512f(auVar114,auVar81,auVar95);
          auVar116 = vfmadd231ps_avx512f(auVar116,auVar81,auVar96);
          auVar117 = vfmadd231ps_avx512f(auVar117,auVar81,auVar97);
          auVar118 = vmulps_avx512f(auVar82,auVar110);
          auVar119 = vmulps_avx512f(auVar82,auVar111);
          auVar82 = vmulps_avx512f(auVar82,auVar112);
          auVar118 = vfmadd231ps_avx512f(auVar118,auVar81,auVar98);
          auVar119 = vfmadd231ps_avx512f(auVar119,auVar81,auVar99);
          auVar120 = vfmadd231ps_avx512f(auVar82,auVar81,auVar100);
          auVar81 = vmulps_avx512f(auVar116,auVar86);
          auVar81 = vfmsub231ps_avx512f(auVar81,auVar115,auVar117);
          auVar82 = vmulps_avx512f(auVar117,auVar85);
          auVar121 = vfmsub231ps_avx512f(auVar82,auVar86,auVar114);
          auVar82 = vmulps_avx512f(auVar114,auVar115);
          auVar122 = vfmsub231ps_avx512f(auVar82,auVar85,auVar116);
          auVar82 = vmulps_avx512f(auVar83,auVar117);
          auVar82 = vfmsub231ps_avx512f(auVar82,auVar116,auVar84);
          auVar123 = vmulps_avx512f(auVar84,auVar114);
          auVar117 = vfmsub231ps_avx512f(auVar123,auVar113,auVar117);
          auVar116 = vmulps_avx512f(auVar113,auVar116);
          auVar116 = vfmsub231ps_avx512f(auVar116,auVar83,auVar114);
          auVar114 = vmulps_avx512f(auVar115,auVar84);
          auVar114 = vfmsub231ps_avx512f(auVar114,auVar83,auVar86);
          auVar86 = vmulps_avx512f(auVar86,auVar113);
          auVar86 = vfmsub231ps_avx512f(auVar86,auVar84,auVar85);
          auVar123 = vmulps_avx512f(auVar85,auVar83);
          auVar84 = vmulps_avx512f(auVar84,auVar122);
          auVar83 = vfmadd231ps_avx512f(auVar84,auVar121,auVar83);
          auVar124 = vfmadd231ps_avx512f(auVar83,auVar81,auVar113);
          auVar81 = vdivps_avx512f(auVar81,auVar124);
          auVar83 = vdivps_avx512f(auVar82,auVar124);
          auVar82 = vdivps_avx512f(auVar114,auVar124);
          auVar84 = vdivps_avx512f(auVar121,auVar124);
          auVar85 = vdivps_avx512f(auVar117,auVar124);
          auVar86 = vdivps_avx512f(auVar86,auVar124);
          auVar114 = vdivps_avx512f(auVar122,auVar124);
          auVar116 = vdivps_avx512f(auVar116,auVar124);
          auVar113 = vfmsub231ps_avx512f(auVar123,auVar113,auVar115);
          auVar113 = vdivps_avx512f(auVar113,auVar124);
          auVar115 = vmulps_avx512f(auVar120,auVar114);
          auVar117 = vmulps_avx512f(auVar120,auVar116);
          auVar120 = vmulps_avx512f(auVar120,auVar113);
          auVar115 = vfmadd231ps_avx512f(auVar115,auVar119,auVar84);
          auVar117 = vfmadd231ps_avx512f(auVar117,auVar119,auVar85);
          auVar119 = vfmadd231ps_avx512f(auVar120,auVar86,auVar119);
          auVar115 = vfmadd231ps_avx512f(auVar115,auVar118,auVar81);
          auVar117 = vfmadd231ps_avx512f(auVar117,auVar118,auVar83);
          auVar118 = vfmadd231ps_avx512f(auVar119,auVar82,auVar118);
          auVar119 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar115 = vxorps_avx512dq(auVar115,auVar119);
          auVar117 = vxorps_avx512dq(auVar117,auVar119);
          auVar118 = vxorps_avx512dq(auVar118,auVar119);
        }
        auVar119 = *(undefined1 (*) [64])ray;
        auVar120 = *(undefined1 (*) [64])(ray + 0x40);
        auVar121 = *(undefined1 (*) [64])(ray + 0x80);
        auVar122 = *(undefined1 (*) [64])(ray + 0x100);
        auVar123 = *(undefined1 (*) [64])(ray + 0x140);
        auVar124 = *(undefined1 (*) [64])(ray + 0x180);
        auVar115 = vfmadd231ps_avx512f(auVar115,auVar121,auVar114);
        auVar117 = vfmadd231ps_avx512f(auVar117,auVar121,auVar116);
        auVar118 = vfmadd231ps_avx512f(auVar118,auVar121,auVar113);
        auVar115 = vfmadd231ps_avx512f(auVar115,auVar120,auVar84);
        auVar117 = vfmadd231ps_avx512f(auVar117,auVar120,auVar85);
        auVar118 = vfmadd231ps_avx512f(auVar118,auVar120,auVar86);
        auVar115 = vfmadd231ps_avx512f(auVar115,auVar119,auVar81);
        auVar117 = vfmadd231ps_avx512f(auVar117,auVar119,auVar83);
        *(undefined1 (*) [64])ray = auVar115;
        auVar115 = vfmadd231ps_avx512f(auVar118,auVar119,auVar82);
        *(undefined1 (*) [64])(ray + 0x40) = auVar117;
        *(undefined1 (*) [64])(ray + 0x80) = auVar115;
        auVar114 = vmulps_avx512f(auVar114,auVar124);
        auVar116 = vmulps_avx512f(auVar116,auVar124);
        auVar113 = vmulps_avx512f(auVar113,auVar124);
        auVar84 = vfmadd231ps_avx512f(auVar114,auVar123,auVar84);
        auVar85 = vfmadd231ps_avx512f(auVar116,auVar123,auVar85);
        auVar86 = vfmadd231ps_avx512f(auVar113,auVar123,auVar86);
        auVar81 = vfmadd231ps_avx512f(auVar84,auVar122,auVar81);
        auVar83 = vfmadd231ps_avx512f(auVar85,auVar122,auVar83);
        auVar82 = vfmadd231ps_avx512f(auVar86,auVar122,auVar82);
        *(undefined1 (*) [64])(ray + 0x100) = auVar81;
        *(undefined1 (*) [64])(ray + 0x140) = auVar83;
        *(undefined1 (*) [64])(ray + 0x180) = auVar82;
        local_80 = context->args;
        auVar81 = vpmovm2d_avx512dq(uVar65);
        local_300 = vmovdqa64_avx512f(auVar81);
        local_88 = pRVar11;
        (**(code **)(local_90 + 0x130))(local_300,local_90 + 0x58,ray);
        local_500._0_8_ = auVar119._0_8_;
        local_500._8_8_ = auVar119._8_8_;
        local_500._16_8_ = auVar119._16_8_;
        local_500._24_8_ = auVar119._24_8_;
        local_500._32_8_ = auVar119._32_8_;
        local_500._40_8_ = auVar119._40_8_;
        local_500._48_8_ = auVar119._48_8_;
        local_500._56_8_ = auVar119._56_8_;
        *(undefined8 *)ray = local_500._0_8_;
        *(undefined8 *)(ray + 8) = local_500._8_8_;
        *(undefined8 *)(ray + 0x10) = local_500._16_8_;
        *(undefined8 *)(ray + 0x18) = local_500._24_8_;
        *(undefined8 *)(ray + 0x20) = local_500._32_8_;
        *(undefined8 *)(ray + 0x28) = local_500._40_8_;
        *(undefined8 *)(ray + 0x30) = local_500._48_8_;
        *(undefined8 *)(ray + 0x38) = local_500._56_8_;
        local_4c0._0_8_ = auVar120._0_8_;
        local_4c0._8_8_ = auVar120._8_8_;
        local_4c0._16_8_ = auVar120._16_8_;
        local_4c0._24_8_ = auVar120._24_8_;
        local_4c0._32_8_ = auVar120._32_8_;
        local_4c0._40_8_ = auVar120._40_8_;
        local_4c0._48_8_ = auVar120._48_8_;
        local_4c0._56_8_ = auVar120._56_8_;
        *(undefined8 *)(ray + 0x40) = local_4c0._0_8_;
        *(undefined8 *)(ray + 0x48) = local_4c0._8_8_;
        *(undefined8 *)(ray + 0x50) = local_4c0._16_8_;
        *(undefined8 *)(ray + 0x58) = local_4c0._24_8_;
        *(undefined8 *)(ray + 0x60) = local_4c0._32_8_;
        *(undefined8 *)(ray + 0x68) = local_4c0._40_8_;
        *(undefined8 *)(ray + 0x70) = local_4c0._48_8_;
        *(undefined8 *)(ray + 0x78) = local_4c0._56_8_;
        local_480._0_8_ = auVar121._0_8_;
        local_480._8_8_ = auVar121._8_8_;
        local_480._16_8_ = auVar121._16_8_;
        local_480._24_8_ = auVar121._24_8_;
        local_480._32_8_ = auVar121._32_8_;
        local_480._40_8_ = auVar121._40_8_;
        local_480._48_8_ = auVar121._48_8_;
        local_480._56_8_ = auVar121._56_8_;
        *(undefined8 *)(ray + 0x80) = local_480._0_8_;
        *(undefined8 *)(ray + 0x88) = local_480._8_8_;
        *(undefined8 *)(ray + 0x90) = local_480._16_8_;
        *(undefined8 *)(ray + 0x98) = local_480._24_8_;
        *(undefined8 *)(ray + 0xa0) = local_480._32_8_;
        *(undefined8 *)(ray + 0xa8) = local_480._40_8_;
        *(undefined8 *)(ray + 0xb0) = local_480._48_8_;
        *(undefined8 *)(ray + 0xb8) = local_480._56_8_;
        local_400._0_8_ = auVar122._0_8_;
        local_400._8_8_ = auVar122._8_8_;
        local_400._16_8_ = auVar122._16_8_;
        local_400._24_8_ = auVar122._24_8_;
        local_400._32_8_ = auVar122._32_8_;
        local_400._40_8_ = auVar122._40_8_;
        local_400._48_8_ = auVar122._48_8_;
        local_400._56_8_ = auVar122._56_8_;
        *(undefined8 *)(ray + 0x100) = local_400._0_8_;
        *(undefined8 *)(ray + 0x108) = local_400._8_8_;
        *(undefined8 *)(ray + 0x110) = local_400._16_8_;
        *(undefined8 *)(ray + 0x118) = local_400._24_8_;
        *(undefined8 *)(ray + 0x120) = local_400._32_8_;
        *(undefined8 *)(ray + 0x128) = local_400._40_8_;
        *(undefined8 *)(ray + 0x130) = local_400._48_8_;
        *(undefined8 *)(ray + 0x138) = local_400._56_8_;
        local_440._0_8_ = auVar123._0_8_;
        local_440._8_8_ = auVar123._8_8_;
        local_440._16_8_ = auVar123._16_8_;
        local_440._24_8_ = auVar123._24_8_;
        local_440._32_8_ = auVar123._32_8_;
        local_440._40_8_ = auVar123._40_8_;
        local_440._48_8_ = auVar123._48_8_;
        local_440._56_8_ = auVar123._56_8_;
        *(undefined8 *)(ray + 0x140) = local_440._0_8_;
        *(undefined8 *)(ray + 0x148) = local_440._8_8_;
        *(undefined8 *)(ray + 0x150) = local_440._16_8_;
        *(undefined8 *)(ray + 0x158) = local_440._24_8_;
        *(undefined8 *)(ray + 0x160) = local_440._32_8_;
        *(undefined8 *)(ray + 0x168) = local_440._40_8_;
        *(undefined8 *)(ray + 0x170) = local_440._48_8_;
        *(undefined8 *)(ray + 0x178) = local_440._56_8_;
        local_540._0_8_ = auVar124._0_8_;
        local_540._8_8_ = auVar124._8_8_;
        local_540._16_8_ = auVar124._16_8_;
        local_540._24_8_ = auVar124._24_8_;
        local_540._32_8_ = auVar124._32_8_;
        local_540._40_8_ = auVar124._40_8_;
        local_540._48_8_ = auVar124._48_8_;
        local_540._56_8_ = auVar124._56_8_;
        *(undefined8 *)(ray + 0x180) = local_540._0_8_;
        *(undefined8 *)(ray + 0x188) = local_540._8_8_;
        *(undefined8 *)(ray + 400) = local_540._16_8_;
        *(undefined8 *)(ray + 0x198) = local_540._24_8_;
        *(undefined8 *)(ray + 0x1a0) = local_540._32_8_;
        *(undefined8 *)(ray + 0x1a8) = local_540._40_8_;
        *(undefined8 *)(ray + 0x1b0) = local_540._48_8_;
        *(undefined8 *)(ray + 0x1b8) = local_540._56_8_;
        uVar29 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),*(undefined1 (*) [64])(ray + 0x200),0xe
                               );
        *(short *)this = (short)uVar29;
        pRVar11->instID[0] = 0xffffffff;
        pRVar11->instPrimID[0] = 0xffffffff;
      }
      goto LAB_009cca66;
    }
  }
  *(undefined2 *)this = 0;
LAB_009cca66:
  return (vbool<16>)(__mmask16)this;
}

Assistant:

vbool<K> InstanceArrayIntersectorKMB<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }